

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [32];
  Primitive PVar4;
  Geometry *pGVar5;
  RTCRayQueryContext *pRVar6;
  RTCFilterFunctionN p_Var7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  bool bVar60;
  bool bVar61;
  undefined1 auVar62 [12];
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  uint uVar83;
  ulong uVar84;
  long lVar85;
  uint uVar86;
  ulong uVar87;
  byte unaff_BL;
  uint uVar88;
  uint uVar89;
  ulong uVar90;
  long lVar91;
  float fVar92;
  float fVar126;
  float fVar127;
  vint4 bi_1;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar109 [32];
  float fVar128;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [64];
  undefined1 extraout_var [60];
  float fVar164;
  float fVar165;
  vint4 bi_2;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar166;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar167;
  float fVar186;
  float fVar187;
  vint4 ai;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar188;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar189;
  float fVar201;
  float fVar202;
  vint4 bi;
  undefined1 auVar190 [16];
  float fVar203;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [28];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar204;
  float fVar222;
  float fVar223;
  vint4 ai_2;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar224;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  float fVar225;
  float fVar240;
  float fVar242;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar241;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar248;
  float fVar250;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar247;
  float fVar249;
  float fVar251;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar252;
  float fVar253;
  float fVar263;
  float fVar267;
  undefined1 auVar254 [16];
  float fVar264;
  float fVar265;
  float fVar268;
  float fVar269;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar276;
  float fVar277;
  float fVar280;
  float fVar281;
  float fVar284;
  float fVar285;
  float fVar287;
  undefined1 auVar257 [32];
  float fVar266;
  float fVar270;
  float fVar274;
  float fVar278;
  float fVar282;
  float fVar286;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar275;
  float fVar279;
  float fVar283;
  undefined1 auVar262 [64];
  float fVar288;
  undefined1 auVar289 [32];
  float fVar295;
  float fVar297;
  float fVar299;
  float fVar301;
  float fVar303;
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  float fVar293;
  float fVar294;
  float fVar296;
  float fVar298;
  float fVar300;
  float fVar302;
  float fVar304;
  undefined1 auVar292 [64];
  float fVar305;
  float fVar318;
  float fVar320;
  vint4 ai_1;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar306;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [28];
  float fVar319;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar332 [16];
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  undefined1 auVar333 [64];
  undefined1 auVar339 [32];
  undefined1 auVar340 [64];
  float fVar341;
  float fVar345;
  float fVar346;
  undefined1 auVar342 [16];
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  undefined1 auVar343 [32];
  float fVar352;
  float fVar358;
  float fVar359;
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  float fVar364;
  float fVar372;
  float fVar374;
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  float fVar365;
  float fVar373;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  float fVar384;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  float fVar394;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  undefined1 auVar395 [28];
  undefined1 auVar396 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_c89;
  undefined1 local_c80 [8];
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  undefined1 local_b30 [8];
  float fStack_b28;
  float fStack_b24;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 auStack_ad0 [16];
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined8 *local_a48;
  undefined8 *local_a40;
  undefined1 (*local_a38) [32];
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [16];
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  Primitive *local_8d8;
  Primitive *local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  ulong local_740;
  undefined1 auStack_738 [24];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640 [4];
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_610 [16];
  RTCHitN local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [32];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  uint local_520;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  uint local_500;
  uint uStack_4fc;
  uint uStack_4f8;
  uint uStack_4f4;
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar344 [64];
  undefined1 auVar357 [64];
  
  PVar4 = prim[1];
  uVar87 = (ulong)(byte)PVar4;
  lVar91 = uVar87 * 0x19;
  fVar189 = *(float *)(prim + lVar91 + 0x12);
  auVar135 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar135 = vinsertps_avx(auVar135,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar135 = vsubps_avx(auVar135,*(undefined1 (*) [16])(prim + lVar91 + 6));
  auVar132._0_4_ = fVar189 * auVar135._0_4_;
  auVar132._4_4_ = fVar189 * auVar135._4_4_;
  auVar132._8_4_ = fVar189 * auVar135._8_4_;
  auVar132._12_4_ = fVar189 * auVar135._12_4_;
  auVar226._0_4_ = fVar189 * auVar9._0_4_;
  auVar226._4_4_ = fVar189 * auVar9._4_4_;
  auVar226._8_4_ = fVar189 * auVar9._8_4_;
  auVar226._12_4_ = fVar189 * auVar9._12_4_;
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 4 + 6)));
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 5 + 6)));
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 6 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0xb + 6)));
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar87 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar104 = vcvtdq2ps_avx(auVar104);
  uVar84 = (ulong)(uint)((int)(uVar87 * 9) * 2);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + uVar87 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar84 = (ulong)(uint)((int)(uVar87 * 5) << 2);
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + 6)));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar93 = vshufps_avx(auVar226,auVar226,0);
  auVar133 = vshufps_avx(auVar226,auVar226,0x55);
  auVar168 = vshufps_avx(auVar226,auVar226,0xaa);
  fVar189 = auVar168._0_4_;
  fVar204 = auVar168._4_4_;
  fVar225 = auVar168._8_4_;
  fVar201 = auVar168._12_4_;
  fVar242 = auVar133._0_4_;
  fVar203 = auVar133._4_4_;
  fVar224 = auVar133._8_4_;
  fVar244 = auVar133._12_4_;
  fVar222 = auVar93._0_4_;
  fVar240 = auVar93._4_4_;
  fVar202 = auVar93._8_4_;
  fVar223 = auVar93._12_4_;
  auVar353._0_4_ = fVar222 * auVar135._0_4_ + fVar242 * auVar9._0_4_ + fVar189 * auVar138._0_4_;
  auVar353._4_4_ = fVar240 * auVar135._4_4_ + fVar203 * auVar9._4_4_ + fVar204 * auVar138._4_4_;
  auVar353._8_4_ = fVar202 * auVar135._8_4_ + fVar224 * auVar9._8_4_ + fVar225 * auVar138._8_4_;
  auVar353._12_4_ = fVar223 * auVar135._12_4_ + fVar244 * auVar9._12_4_ + fVar201 * auVar138._12_4_;
  auVar366._0_4_ = fVar222 * auVar102._0_4_ + fVar242 * auVar97._0_4_ + auVar104._0_4_ * fVar189;
  auVar366._4_4_ = fVar240 * auVar102._4_4_ + fVar203 * auVar97._4_4_ + auVar104._4_4_ * fVar204;
  auVar366._8_4_ = fVar202 * auVar102._8_4_ + fVar224 * auVar97._8_4_ + auVar104._8_4_ * fVar225;
  auVar366._12_4_ = fVar223 * auVar102._12_4_ + fVar244 * auVar97._12_4_ + auVar104._12_4_ * fVar201
  ;
  auVar227._0_4_ = fVar222 * auVar96._0_4_ + fVar242 * auVar103._0_4_ + auVar134._0_4_ * fVar189;
  auVar227._4_4_ = fVar240 * auVar96._4_4_ + fVar203 * auVar103._4_4_ + auVar134._4_4_ * fVar204;
  auVar227._8_4_ = fVar202 * auVar96._8_4_ + fVar224 * auVar103._8_4_ + auVar134._8_4_ * fVar225;
  auVar227._12_4_ = fVar223 * auVar96._12_4_ + fVar244 * auVar103._12_4_ + auVar134._12_4_ * fVar201
  ;
  auVar93 = vshufps_avx(auVar132,auVar132,0);
  auVar133 = vshufps_avx(auVar132,auVar132,0x55);
  auVar168 = vshufps_avx(auVar132,auVar132,0xaa);
  fVar189 = auVar168._0_4_;
  fVar204 = auVar168._4_4_;
  fVar225 = auVar168._8_4_;
  fVar201 = auVar168._12_4_;
  fVar242 = auVar133._0_4_;
  fVar203 = auVar133._4_4_;
  fVar224 = auVar133._8_4_;
  fVar244 = auVar133._12_4_;
  fVar222 = auVar93._0_4_;
  fVar240 = auVar93._4_4_;
  fVar202 = auVar93._8_4_;
  fVar223 = auVar93._12_4_;
  auVar254._0_4_ = fVar222 * auVar135._0_4_ + fVar242 * auVar9._0_4_ + fVar189 * auVar138._0_4_;
  auVar254._4_4_ = fVar240 * auVar135._4_4_ + fVar203 * auVar9._4_4_ + fVar204 * auVar138._4_4_;
  auVar254._8_4_ = fVar202 * auVar135._8_4_ + fVar224 * auVar9._8_4_ + fVar225 * auVar138._8_4_;
  auVar254._12_4_ = fVar223 * auVar135._12_4_ + fVar244 * auVar9._12_4_ + fVar201 * auVar138._12_4_;
  auVar93._0_4_ = fVar222 * auVar102._0_4_ + auVar104._0_4_ * fVar189 + fVar242 * auVar97._0_4_;
  auVar93._4_4_ = fVar240 * auVar102._4_4_ + auVar104._4_4_ * fVar204 + fVar203 * auVar97._4_4_;
  auVar93._8_4_ = fVar202 * auVar102._8_4_ + auVar104._8_4_ * fVar225 + fVar224 * auVar97._8_4_;
  auVar93._12_4_ = fVar223 * auVar102._12_4_ + auVar104._12_4_ * fVar201 + fVar244 * auVar97._12_4_;
  auVar307._8_4_ = 0x7fffffff;
  auVar307._0_8_ = 0x7fffffff7fffffff;
  auVar307._12_4_ = 0x7fffffff;
  auVar135 = vandps_avx(auVar353,auVar307);
  auVar205._8_4_ = 0x219392ef;
  auVar205._0_8_ = 0x219392ef219392ef;
  auVar205._12_4_ = 0x219392ef;
  auVar135 = vcmpps_avx(auVar135,auVar205,1);
  auVar9 = vblendvps_avx(auVar353,auVar205,auVar135);
  auVar135 = vandps_avx(auVar366,auVar307);
  auVar135 = vcmpps_avx(auVar135,auVar205,1);
  auVar138 = vblendvps_avx(auVar366,auVar205,auVar135);
  auVar135 = vandps_avx(auVar307,auVar227);
  auVar135 = vcmpps_avx(auVar135,auVar205,1);
  auVar135 = vblendvps_avx(auVar227,auVar205,auVar135);
  auVar133._0_4_ = fVar222 * auVar96._0_4_ + fVar242 * auVar103._0_4_ + auVar134._0_4_ * fVar189;
  auVar133._4_4_ = fVar240 * auVar96._4_4_ + fVar203 * auVar103._4_4_ + auVar134._4_4_ * fVar204;
  auVar133._8_4_ = fVar202 * auVar96._8_4_ + fVar224 * auVar103._8_4_ + auVar134._8_4_ * fVar225;
  auVar133._12_4_ = fVar223 * auVar96._12_4_ + fVar244 * auVar103._12_4_ + auVar134._12_4_ * fVar201
  ;
  auVar102 = vrcpps_avx(auVar9);
  fVar189 = auVar102._0_4_;
  auVar190._0_4_ = fVar189 * auVar9._0_4_;
  fVar201 = auVar102._4_4_;
  auVar190._4_4_ = fVar201 * auVar9._4_4_;
  fVar202 = auVar102._8_4_;
  auVar190._8_4_ = fVar202 * auVar9._8_4_;
  fVar203 = auVar102._12_4_;
  auVar190._12_4_ = fVar203 * auVar9._12_4_;
  auVar308._8_4_ = 0x3f800000;
  auVar308._0_8_ = &DAT_3f8000003f800000;
  auVar308._12_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar308,auVar190);
  fVar189 = fVar189 + fVar189 * auVar9._0_4_;
  fVar201 = fVar201 + fVar201 * auVar9._4_4_;
  fVar202 = fVar202 + fVar202 * auVar9._8_4_;
  fVar203 = fVar203 + fVar203 * auVar9._12_4_;
  auVar9 = vrcpps_avx(auVar138);
  fVar204 = auVar9._0_4_;
  auVar206._0_4_ = fVar204 * auVar138._0_4_;
  fVar222 = auVar9._4_4_;
  auVar206._4_4_ = fVar222 * auVar138._4_4_;
  fVar223 = auVar9._8_4_;
  auVar206._8_4_ = fVar223 * auVar138._8_4_;
  fVar224 = auVar9._12_4_;
  auVar206._12_4_ = fVar224 * auVar138._12_4_;
  auVar9 = vsubps_avx(auVar308,auVar206);
  fVar204 = fVar204 + fVar204 * auVar9._0_4_;
  fVar222 = fVar222 + fVar222 * auVar9._4_4_;
  fVar223 = fVar223 + fVar223 * auVar9._8_4_;
  fVar224 = fVar224 + fVar224 * auVar9._12_4_;
  auVar9 = vrcpps_avx(auVar135);
  fVar225 = auVar9._0_4_;
  auVar228._0_4_ = fVar225 * auVar135._0_4_;
  fVar240 = auVar9._4_4_;
  auVar228._4_4_ = fVar240 * auVar135._4_4_;
  fVar242 = auVar9._8_4_;
  auVar228._8_4_ = fVar242 * auVar135._8_4_;
  fVar244 = auVar9._12_4_;
  auVar228._12_4_ = fVar244 * auVar135._12_4_;
  auVar9 = vsubps_avx(auVar308,auVar228);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + uVar87 * 7 + 6);
  auVar135 = vpmovsxwd_avx(auVar135);
  fVar225 = fVar225 + fVar225 * auVar9._0_4_;
  fVar240 = fVar240 + fVar240 * auVar9._4_4_;
  fVar242 = fVar242 + fVar242 * auVar9._8_4_;
  fVar244 = fVar244 + fVar244 * auVar9._12_4_;
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,auVar254);
  auVar168._0_4_ = fVar189 * auVar135._0_4_;
  auVar168._4_4_ = fVar201 * auVar135._4_4_;
  auVar168._8_4_ = fVar202 * auVar135._8_4_;
  auVar168._12_4_ = fVar203 * auVar135._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar87 * 9 + 6);
  auVar135 = vpmovsxwd_avx(auVar9);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,auVar254);
  auVar191._0_4_ = fVar189 * auVar135._0_4_;
  auVar191._4_4_ = fVar201 * auVar135._4_4_;
  auVar191._8_4_ = fVar202 * auVar135._8_4_;
  auVar191._12_4_ = fVar203 * auVar135._12_4_;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar138);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar87 * -2 + 6);
  auVar135 = vpmovsxwd_avx(auVar102);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,auVar93);
  auVar309._0_4_ = auVar135._0_4_ * fVar204;
  auVar309._4_4_ = auVar135._4_4_ * fVar222;
  auVar309._8_4_ = auVar135._8_4_ * fVar223;
  auVar309._12_4_ = auVar135._12_4_ * fVar224;
  auVar135 = vcvtdq2ps_avx(auVar9);
  auVar135 = vsubps_avx(auVar135,auVar93);
  auVar96._0_4_ = fVar204 * auVar135._0_4_;
  auVar96._4_4_ = fVar222 * auVar135._4_4_;
  auVar96._8_4_ = fVar223 * auVar135._8_4_;
  auVar96._12_4_ = fVar224 * auVar135._12_4_;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar84 + uVar87 + 6);
  auVar135 = vpmovsxwd_avx(auVar97);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,auVar133);
  auVar207._0_4_ = auVar135._0_4_ * fVar225;
  auVar207._4_4_ = auVar135._4_4_ * fVar240;
  auVar207._8_4_ = auVar135._8_4_ * fVar242;
  auVar207._12_4_ = auVar135._12_4_ * fVar244;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar87 * 0x17 + 6);
  auVar135 = vpmovsxwd_avx(auVar104);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,auVar133);
  auVar134._0_4_ = auVar135._0_4_ * fVar225;
  auVar134._4_4_ = auVar135._4_4_ * fVar240;
  auVar134._8_4_ = auVar135._8_4_ * fVar242;
  auVar134._12_4_ = auVar135._12_4_ * fVar244;
  auVar135 = vpminsd_avx(auVar168,auVar191);
  auVar9 = vpminsd_avx(auVar309,auVar96);
  auVar135 = vmaxps_avx(auVar135,auVar9);
  auVar9 = vpminsd_avx(auVar207,auVar134);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar332._4_4_ = uVar1;
  auVar332._0_4_ = uVar1;
  auVar332._8_4_ = uVar1;
  auVar332._12_4_ = uVar1;
  auVar9 = vmaxps_avx(auVar9,auVar332);
  auVar135 = vmaxps_avx(auVar135,auVar9);
  local_610._0_4_ = auVar135._0_4_ * 0.99999964;
  local_610._4_4_ = auVar135._4_4_ * 0.99999964;
  local_610._8_4_ = auVar135._8_4_ * 0.99999964;
  local_610._12_4_ = auVar135._12_4_ * 0.99999964;
  auVar135 = vpmaxsd_avx(auVar168,auVar191);
  auVar9 = vpmaxsd_avx(auVar309,auVar96);
  auVar135 = vminps_avx(auVar135,auVar9);
  auVar9 = vpmaxsd_avx(auVar207,auVar134);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar169._4_4_ = uVar1;
  auVar169._0_4_ = uVar1;
  auVar169._8_4_ = uVar1;
  auVar169._12_4_ = uVar1;
  auVar9 = vminps_avx(auVar9,auVar169);
  auVar135 = vminps_avx(auVar135,auVar9);
  auVar103._0_4_ = auVar135._0_4_ * 1.0000004;
  auVar103._4_4_ = auVar135._4_4_ * 1.0000004;
  auVar103._8_4_ = auVar135._8_4_ * 1.0000004;
  auVar103._12_4_ = auVar135._12_4_ * 1.0000004;
  auVar135 = vpshufd_avx(ZEXT116((byte)PVar4),0);
  auVar9 = vpcmpgtd_avx(auVar135,_DAT_01ff0cf0);
  auVar135 = vcmpps_avx(local_610,auVar103,2);
  auVar135 = vandps_avx(auVar135,auVar9);
  uVar86 = vmovmskps_avx(auVar135);
  local_c89 = uVar86 != 0;
  if (uVar86 == 0) {
    return local_c89;
  }
  uVar86 = uVar86 & 0xff;
  auVar114._16_16_ = mm_lookupmask_ps._240_16_;
  auVar114._0_16_ = mm_lookupmask_ps._240_16_;
  local_8d8 = prim + lVar91 + 0x16;
  local_480 = vblendps_avx(auVar114,ZEXT832(0) << 0x20,0x80);
  uVar88 = 1 << ((byte)k & 0x1f);
  local_a38 = (undefined1 (*) [32])&local_520;
  local_a40 = (undefined8 *)(mm_lookupmask_ps + ((uVar88 & 0xf) << 4));
  local_a48 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar88 >> 4) * 0x10);
  local_8d0 = prim;
LAB_00ef8318:
  local_8c8 = (ulong)uVar86;
  lVar91 = 0;
  if (local_8c8 != 0) {
    for (; (uVar86 >> lVar91 & 1) == 0; lVar91 = lVar91 + 1) {
    }
  }
  local_8c8 = local_8c8 - 1 & local_8c8;
  lVar85 = lVar91 * 0x40;
  lVar8 = 0;
  if (local_8c8 != 0) {
    for (; (local_8c8 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  uVar86 = *(uint *)(local_8d0 + 2);
  auVar135 = *(undefined1 (*) [16])(local_8d8 + lVar85);
  if (((local_8c8 != 0) && (uVar87 = local_8c8 - 1 & local_8c8, uVar87 != 0)) &&
     (lVar8 = 0, uVar87 != 0)) {
    for (; (uVar87 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  auVar9 = *(undefined1 (*) [16])(local_8d8 + lVar85 + 0x10);
  auVar138 = *(undefined1 (*) [16])(local_8d8 + lVar85 + 0x20);
  auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar104 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar189 = *(float *)(ray + k * 4 + 0x80);
  auVar342._4_4_ = fVar189;
  auVar342._0_4_ = fVar189;
  auVar342._8_4_ = fVar189;
  auVar342._12_4_ = fVar189;
  fStack_830 = fVar189;
  _local_840 = auVar342;
  fStack_82c = fVar189;
  fStack_828 = fVar189;
  fStack_824 = fVar189;
  auVar344 = ZEXT3264(_local_840);
  auVar102 = *(undefined1 (*) [16])(local_8d8 + lVar85 + 0x30);
  fVar204 = *(float *)(ray + k * 4 + 0xa0);
  auVar354._4_4_ = fVar204;
  auVar354._0_4_ = fVar204;
  auVar354._8_4_ = fVar204;
  auVar354._12_4_ = fVar204;
  fStack_af0 = fVar204;
  _local_b00 = auVar354;
  fStack_aec = fVar204;
  fStack_ae8 = fVar204;
  fStack_ae4 = fVar204;
  auVar357 = ZEXT3264(_local_b00);
  auVar97 = vunpcklps_avx(auVar342,auVar354);
  fVar225 = *(float *)(ray + k * 4 + 0xc0);
  auVar367._4_4_ = fVar225;
  auVar367._0_4_ = fVar225;
  auVar367._8_4_ = fVar225;
  auVar367._12_4_ = fVar225;
  fStack_910 = fVar225;
  _local_920 = auVar367;
  fStack_90c = fVar225;
  fStack_908 = fVar225;
  fStack_904 = fVar225;
  _local_970 = vinsertps_avx(auVar97,auVar367,0x28);
  auVar333 = ZEXT1664(_local_970);
  auVar94._0_4_ = (auVar135._0_4_ + auVar9._0_4_ + auVar138._0_4_ + auVar102._0_4_) * 0.25;
  auVar94._4_4_ = (auVar135._4_4_ + auVar9._4_4_ + auVar138._4_4_ + auVar102._4_4_) * 0.25;
  auVar94._8_4_ = (auVar135._8_4_ + auVar9._8_4_ + auVar138._8_4_ + auVar102._8_4_) * 0.25;
  auVar94._12_4_ = (auVar135._12_4_ + auVar9._12_4_ + auVar138._12_4_ + auVar102._12_4_) * 0.25;
  auVar97 = vsubps_avx(auVar94,auVar104);
  auVar97 = vdpps_avx(auVar97,_local_970,0x7f);
  local_980 = vdpps_avx(_local_970,_local_970,0x7f);
  auVar340 = ZEXT1664(local_980);
  auVar96 = vrcpss_avx(local_980,local_980);
  fVar201 = auVar97._0_4_ * auVar96._0_4_ * (2.0 - local_980._0_4_ * auVar96._0_4_);
  auVar292 = ZEXT464((uint)fVar201);
  auVar96 = vshufps_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),0);
  auVar208._0_4_ = auVar104._0_4_ + local_970._0_4_ * auVar96._0_4_;
  auVar208._4_4_ = auVar104._4_4_ + local_970._4_4_ * auVar96._4_4_;
  auVar208._8_4_ = auVar104._8_4_ + local_970._8_4_ * auVar96._8_4_;
  auVar208._12_4_ = auVar104._12_4_ + local_970._12_4_ * auVar96._12_4_;
  auVar97 = vblendps_avx(auVar208,_DAT_01feba10,8);
  _local_b10 = vsubps_avx(auVar135,auVar97);
  auVar262 = ZEXT1664(_local_b10);
  _local_b20 = vsubps_avx(auVar138,auVar97);
  _local_b30 = vsubps_avx(auVar9,auVar97);
  _local_b40 = vsubps_avx(auVar102,auVar97);
  auVar135 = vshufps_avx(_local_b10,_local_b10,0);
  register0x00001250 = auVar135;
  _local_1a0 = auVar135;
  auVar135 = vshufps_avx(_local_b10,_local_b10,0x55);
  register0x00001250 = auVar135;
  _local_1c0 = auVar135;
  auVar135 = vshufps_avx(_local_b10,_local_b10,0xaa);
  register0x00001250 = auVar135;
  _local_1e0 = auVar135;
  auVar135 = vshufps_avx(_local_b10,_local_b10,0xff);
  register0x00001290 = auVar135;
  _local_200 = auVar135;
  auVar135 = vshufps_avx(_local_b30,_local_b30,0);
  register0x00001290 = auVar135;
  _local_360 = auVar135;
  auVar135 = vshufps_avx(_local_b30,_local_b30,0x55);
  register0x00001290 = auVar135;
  _local_220 = auVar135;
  auVar135 = vshufps_avx(_local_b30,_local_b30,0xaa);
  register0x00001290 = auVar135;
  _local_240 = auVar135;
  auVar135 = vshufps_avx(_local_b30,_local_b30,0xff);
  register0x00001290 = auVar135;
  _local_260 = auVar135;
  auVar135 = vshufps_avx(_local_b20,_local_b20,0);
  register0x00001290 = auVar135;
  _local_380 = auVar135;
  auVar135 = vshufps_avx(_local_b20,_local_b20,0x55);
  register0x00001290 = auVar135;
  _local_3a0 = auVar135;
  auVar135 = vshufps_avx(_local_b20,_local_b20,0xaa);
  register0x00001290 = auVar135;
  _local_3c0 = auVar135;
  auVar135 = vshufps_avx(_local_b20,_local_b20,0xff);
  register0x00001290 = auVar135;
  _local_3e0 = auVar135;
  auVar135 = vshufps_avx(_local_b40,_local_b40,0);
  register0x00001290 = auVar135;
  _local_400 = auVar135;
  auVar135 = vshufps_avx(_local_b40,_local_b40,0x55);
  register0x00001290 = auVar135;
  _local_420 = auVar135;
  auVar135 = vshufps_avx(_local_b40,_local_b40,0xaa);
  register0x00001290 = auVar135;
  _local_440 = auVar135;
  auVar135 = vshufps_avx(_local_b40,_local_b40,0xff);
  local_460._16_16_ = auVar135;
  local_460._0_16_ = auVar135;
  auVar135 = ZEXT416((uint)(fVar189 * fVar189 + fVar204 * fVar204 + fVar225 * fVar225));
  auVar135 = vshufps_avx(auVar135,auVar135,0);
  local_280._16_16_ = auVar135;
  local_280._0_16_ = auVar135;
  fVar189 = *(float *)(ray + k * 4 + 0x60);
  local_900 = ZEXT416((uint)fVar201);
  auVar135 = vshufps_avx(ZEXT416((uint)(fVar189 - fVar201)),ZEXT416((uint)(fVar189 - fVar201)),0);
  local_2a0._16_16_ = auVar135;
  local_2a0._0_16_ = auVar135;
  auVar135 = vshufps_avx(ZEXT416(uVar86),ZEXT416(uVar86),0);
  local_4c0._16_16_ = auVar135;
  local_4c0._0_16_ = auVar135;
  auVar135 = vpshufd_avx(ZEXT416(*(uint *)(local_8d0 + lVar91 * 4 + 6)),0);
  local_4e0._16_16_ = auVar135;
  local_4e0._0_16_ = auVar135;
  register0x00001210 = auVar96;
  _local_9a0 = auVar96;
  uVar87 = 1;
  uVar84 = 0;
  uVar90 = 0;
  auVar109._8_4_ = 0x7fffffff;
  auVar109._0_8_ = 0x7fffffff7fffffff;
  auVar109._12_4_ = 0x7fffffff;
  auVar109._16_4_ = 0x7fffffff;
  auVar109._20_4_ = 0x7fffffff;
  auVar109._24_4_ = 0x7fffffff;
  auVar109._28_4_ = 0x7fffffff;
  local_4a0 = vandps_avx(local_280,auVar109);
  auVar135 = vsqrtss_avx(local_980,local_980);
  auVar9 = vsqrtss_avx(local_980,local_980);
  local_8f0 = ZEXT816(0x3f80000000000000);
  do {
    auVar138 = vmovshdup_avx(local_8f0);
    fVar242 = auVar138._0_4_ - local_8f0._0_4_;
    auVar138 = vshufps_avx(local_8f0,local_8f0,0);
    local_7c0._16_16_ = auVar138;
    local_7c0._0_16_ = auVar138;
    auVar102 = vshufps_avx(ZEXT416((uint)fVar242),ZEXT416((uint)fVar242),0);
    local_7e0._16_16_ = auVar102;
    local_7e0._0_16_ = auVar102;
    fVar304 = auVar102._0_4_;
    fVar164 = auVar102._4_4_;
    fVar165 = auVar102._8_4_;
    fVar166 = auVar102._12_4_;
    fVar167 = auVar138._0_4_;
    auVar197._0_4_ = fVar167 + fVar304 * 0.0;
    fVar186 = auVar138._4_4_;
    auVar197._4_4_ = fVar186 + fVar164 * 0.14285715;
    fVar187 = auVar138._8_4_;
    auVar197._8_4_ = fVar187 + fVar165 * 0.2857143;
    fVar188 = auVar138._12_4_;
    auVar197._12_4_ = fVar188 + fVar166 * 0.42857146;
    auVar197._16_4_ = fVar167 + fVar304 * 0.5714286;
    auVar197._20_4_ = fVar186 + fVar164 * 0.71428573;
    auVar197._24_4_ = fVar187 + fVar165 * 0.8571429;
    auVar197._28_4_ = fVar188 + fVar166;
    auVar145._8_4_ = 0x3f800000;
    auVar145._0_8_ = &DAT_3f8000003f800000;
    auVar145._12_4_ = 0x3f800000;
    auVar145._16_4_ = 0x3f800000;
    auVar145._20_4_ = 0x3f800000;
    auVar145._24_4_ = 0x3f800000;
    auVar145._28_4_ = 0x3f800000;
    auVar114 = vsubps_avx(auVar145,auVar197);
    fVar204 = auVar114._0_4_;
    fVar225 = auVar114._4_4_;
    fVar201 = auVar114._8_4_;
    fVar222 = auVar114._12_4_;
    fVar240 = auVar114._16_4_;
    fVar202 = auVar114._20_4_;
    fVar223 = auVar114._24_4_;
    fVar224 = fVar204 * fVar204 * fVar204;
    fVar263 = fVar225 * fVar225 * fVar225;
    fVar267 = fVar201 * fVar201 * fVar201;
    fVar271 = fVar222 * fVar222 * fVar222;
    fVar275 = fVar240 * fVar240 * fVar240;
    fVar279 = fVar202 * fVar202 * fVar202;
    fVar283 = fVar223 * fVar223 * fVar223;
    fVar288 = auVar197._0_4_ * auVar197._0_4_ * auVar197._0_4_;
    fVar293 = auVar197._4_4_ * auVar197._4_4_ * auVar197._4_4_;
    fVar294 = auVar197._8_4_ * auVar197._8_4_ * auVar197._8_4_;
    fVar296 = auVar197._12_4_ * auVar197._12_4_ * auVar197._12_4_;
    fVar298 = auVar197._16_4_ * auVar197._16_4_ * auVar197._16_4_;
    fVar300 = auVar197._20_4_ * auVar197._20_4_ * auVar197._20_4_;
    fVar302 = auVar197._24_4_ * auVar197._24_4_ * auVar197._24_4_;
    fVar203 = auVar197._0_4_ * fVar204;
    fVar241 = auVar197._4_4_ * fVar225;
    fVar243 = auVar197._8_4_ * fVar201;
    fVar245 = auVar197._12_4_ * fVar222;
    fVar246 = auVar197._16_4_ * fVar240;
    fVar248 = auVar197._20_4_ * fVar202;
    fVar250 = auVar197._24_4_ * fVar223;
    fVar244 = auVar340._28_4_ + auVar357._28_4_;
    fVar330 = auVar292._28_4_ + 1.0 + fVar244;
    fVar337 = fVar244 + auVar262._28_4_ + auVar344._28_4_ + auVar333._28_4_;
    fVar244 = fVar224 * 0.16666667;
    fVar264 = fVar263 * 0.16666667;
    fVar268 = fVar267 * 0.16666667;
    fVar272 = fVar271 * 0.16666667;
    fVar276 = fVar275 * 0.16666667;
    fVar280 = fVar279 * 0.16666667;
    fVar284 = fVar283 * 0.16666667;
    fVar305 = (fVar288 + fVar224 * 4.0 + fVar204 * fVar203 * 12.0 + auVar197._0_4_ * fVar203 * 6.0)
              * 0.16666667;
    fVar318 = (fVar293 + fVar263 * 4.0 + fVar225 * fVar241 * 12.0 + auVar197._4_4_ * fVar241 * 6.0)
              * 0.16666667;
    fVar320 = (fVar294 + fVar267 * 4.0 + fVar201 * fVar243 * 12.0 + auVar197._8_4_ * fVar243 * 6.0)
              * 0.16666667;
    fVar322 = (fVar296 + fVar271 * 4.0 + fVar222 * fVar245 * 12.0 + auVar197._12_4_ * fVar245 * 6.0)
              * 0.16666667;
    fVar324 = (fVar298 + fVar275 * 4.0 + fVar240 * fVar246 * 12.0 + auVar197._16_4_ * fVar246 * 6.0)
              * 0.16666667;
    fVar326 = (fVar300 + fVar279 * 4.0 + fVar202 * fVar248 * 12.0 + auVar197._20_4_ * fVar248 * 6.0)
              * 0.16666667;
    fVar328 = (fVar302 + fVar283 * 4.0 + fVar223 * fVar250 * 12.0 + auVar197._24_4_ * fVar250 * 6.0)
              * 0.16666667;
    fVar224 = (fVar288 * 4.0 + fVar224 + auVar197._0_4_ * fVar203 * 12.0 + fVar204 * fVar203 * 6.0)
              * 0.16666667;
    fVar263 = (fVar293 * 4.0 + fVar263 + auVar197._4_4_ * fVar241 * 12.0 + fVar225 * fVar241 * 6.0)
              * 0.16666667;
    fVar267 = (fVar294 * 4.0 + fVar267 + auVar197._8_4_ * fVar243 * 12.0 + fVar201 * fVar243 * 6.0)
              * 0.16666667;
    fVar271 = (fVar296 * 4.0 + fVar271 + auVar197._12_4_ * fVar245 * 12.0 + fVar222 * fVar245 * 6.0)
              * 0.16666667;
    fVar275 = (fVar298 * 4.0 + fVar275 + auVar197._16_4_ * fVar246 * 12.0 + fVar240 * fVar246 * 6.0)
              * 0.16666667;
    fVar279 = (fVar300 * 4.0 + fVar279 + auVar197._20_4_ * fVar248 * 12.0 + fVar202 * fVar248 * 6.0)
              * 0.16666667;
    fVar283 = (fVar302 * 4.0 + fVar283 + auVar197._24_4_ * fVar250 * 12.0 + fVar223 * fVar250 * 6.0)
              * 0.16666667;
    fVar288 = fVar288 * 0.16666667;
    fVar293 = fVar293 * 0.16666667;
    fVar294 = fVar294 * 0.16666667;
    fVar296 = fVar296 * 0.16666667;
    fVar298 = fVar298 * 0.16666667;
    fVar300 = fVar300 * 0.16666667;
    fVar302 = fVar302 * 0.16666667;
    fVar351 = auVar344._28_4_ + 12.0;
    fVar338 = fVar337 + 12.166667;
    fVar306 = (float)local_1a0._0_4_ * fVar244 +
              fVar305 * (float)local_360._0_4_ +
              fVar288 * (float)local_400._0_4_ + fVar224 * (float)local_380._0_4_;
    fVar319 = (float)local_1a0._4_4_ * fVar264 +
              fVar318 * (float)local_360._4_4_ +
              fVar293 * (float)local_400._4_4_ + fVar263 * (float)local_380._4_4_;
    fVar321 = fStack_198 * fVar268 +
              fVar320 * fStack_358 + fVar294 * fStack_3f8 + fVar267 * fStack_378;
    fVar323 = fStack_194 * fVar272 +
              fVar322 * fStack_354 + fVar296 * fStack_3f4 + fVar271 * fStack_374;
    fVar325 = fStack_190 * fVar276 +
              fVar324 * fStack_350 + fVar298 * fStack_3f0 + fVar275 * fStack_370;
    fVar327 = fStack_18c * fVar280 +
              fVar326 * fStack_34c + fVar300 * fStack_3ec + fVar279 * fStack_36c;
    fVar329 = fStack_188 * fVar284 +
              fVar328 * fStack_348 + fVar302 * fStack_3e8 + fVar283 * fStack_368;
    fVar331 = fVar330 + fVar338;
    local_940 = (float)local_1c0._0_4_ * fVar244 +
                (float)local_220._0_4_ * fVar305 +
                fVar288 * (float)local_420._0_4_ + fVar224 * (float)local_3a0._0_4_;
    fStack_93c = (float)local_1c0._4_4_ * fVar264 +
                 (float)local_220._4_4_ * fVar318 +
                 fVar293 * (float)local_420._4_4_ + fVar263 * (float)local_3a0._4_4_;
    fStack_938 = fStack_1b8 * fVar268 +
                 fStack_218 * fVar320 + fVar294 * fStack_418 + fVar267 * fStack_398;
    fStack_934 = fStack_1b4 * fVar272 +
                 fStack_214 * fVar322 + fVar296 * fStack_414 + fVar271 * fStack_394;
    fStack_930 = fStack_1b0 * fVar276 +
                 fStack_210 * fVar324 + fVar298 * fStack_410 + fVar275 * fStack_390;
    fStack_92c = fStack_1ac * fVar280 +
                 fStack_20c * fVar326 + fVar300 * fStack_40c + fVar279 * fStack_38c;
    fStack_928 = fStack_1a8 * fVar284 +
                 fStack_208 * fVar328 + fVar302 * fStack_408 + fVar283 * fStack_388;
    fStack_924 = fVar331 + fVar351 + 12.166667;
    fVar92 = (float)local_1e0._0_4_ * fVar244 +
             (float)local_240._0_4_ * fVar305 +
             fVar288 * (float)local_440._0_4_ + fVar224 * (float)local_3c0._0_4_;
    fVar126 = (float)local_1e0._4_4_ * fVar264 +
              (float)local_240._4_4_ * fVar318 +
              fVar293 * (float)local_440._4_4_ + fVar263 * (float)local_3c0._4_4_;
    fVar127 = fStack_1d8 * fVar268 +
              fStack_238 * fVar320 + fVar294 * fStack_438 + fVar267 * fStack_3b8;
    fVar128 = fStack_1d4 * fVar272 +
              fStack_234 * fVar322 + fVar296 * fStack_434 + fVar271 * fStack_3b4;
    fVar129 = fStack_1d0 * fVar276 +
              fStack_230 * fVar324 + fVar298 * fStack_430 + fVar275 * fStack_3b0;
    fVar130 = fStack_1cc * fVar280 +
              fStack_22c * fVar326 + fVar300 * fStack_42c + fVar279 * fStack_3ac;
    fVar131 = fStack_1c8 * fVar284 +
              fStack_228 * fVar328 + fVar302 * fStack_428 + fVar283 * fStack_3a8;
    fVar351 = fStack_924 + fVar351 + auVar357._28_4_ + 12.0;
    local_c80._0_4_ =
         (float)local_200._0_4_ * fVar244 +
         (float)local_260._0_4_ * fVar305 +
         fVar224 * (float)local_3e0._0_4_ + local_460._0_4_ * fVar288;
    local_c80._4_4_ =
         (float)local_200._4_4_ * fVar264 +
         (float)local_260._4_4_ * fVar318 +
         fVar263 * (float)local_3e0._4_4_ + local_460._4_4_ * fVar293;
    fStack_c78 = fStack_1f8 * fVar268 +
                 fStack_258 * fVar320 + fVar267 * fStack_3d8 + local_460._8_4_ * fVar294;
    fStack_c74 = fStack_1f4 * fVar272 +
                 fStack_254 * fVar322 + fVar271 * fStack_3d4 + local_460._12_4_ * fVar296;
    fStack_c70 = fStack_1f0 * fVar276 +
                 fStack_250 * fVar324 + fVar275 * fStack_3d0 + local_460._16_4_ * fVar298;
    fStack_c6c = fStack_1ec * fVar280 +
                 fStack_24c * fVar326 + fVar279 * fStack_3cc + local_460._20_4_ * fVar300;
    fStack_c68 = fStack_1e8 * fVar284 +
                 fStack_248 * fVar328 + fVar283 * fStack_3c8 + local_460._24_4_ * fVar302;
    fStack_c64 = auVar262._28_4_ + fVar330 + fVar337 + auVar292._28_4_;
    auVar12._4_4_ = auVar197._4_4_ * -auVar197._4_4_;
    auVar12._0_4_ = auVar197._0_4_ * -auVar197._0_4_;
    auVar12._8_4_ = auVar197._8_4_ * -auVar197._8_4_;
    auVar12._12_4_ = auVar197._12_4_ * -auVar197._12_4_;
    auVar12._16_4_ = auVar197._16_4_ * -auVar197._16_4_;
    auVar12._20_4_ = auVar197._20_4_ * -auVar197._20_4_;
    auVar12._24_4_ = auVar197._24_4_ * -auVar197._24_4_;
    auVar12._28_4_ = auVar197._28_4_;
    auVar147._4_4_ = fVar241 * 4.0;
    auVar147._0_4_ = fVar203 * 4.0;
    auVar147._8_4_ = fVar243 * 4.0;
    auVar147._12_4_ = fVar245 * 4.0;
    auVar147._16_4_ = fVar246 * 4.0;
    auVar147._20_4_ = fVar248 * 4.0;
    auVar147._24_4_ = fVar250 * 4.0;
    auVar147._28_4_ = 0x3f800000;
    auVar114 = vsubps_avx(auVar12,auVar147);
    fVar268 = fVar204 * -fVar204 * 0.5;
    fVar280 = fVar225 * -fVar225 * 0.5;
    fVar283 = fVar201 * -fVar201 * 0.5;
    fVar284 = fVar222 * -fVar222 * 0.5;
    fVar288 = fVar240 * -fVar240 * 0.5;
    fVar294 = fVar202 * -fVar202 * 0.5;
    fVar296 = fVar223 * -fVar223 * 0.5;
    fVar244 = auVar114._0_4_ * 0.5;
    fVar264 = auVar114._4_4_ * 0.5;
    fVar267 = auVar114._8_4_ * 0.5;
    fVar271 = auVar114._12_4_ * 0.5;
    fVar272 = auVar114._16_4_ * 0.5;
    fVar275 = auVar114._20_4_ * 0.5;
    fVar276 = auVar114._24_4_ * 0.5;
    fVar224 = (fVar204 * fVar204 + fVar203 * 4.0) * 0.5;
    fVar241 = (fVar225 * fVar225 + fVar241 * 4.0) * 0.5;
    fVar243 = (fVar201 * fVar201 + fVar243 * 4.0) * 0.5;
    fVar245 = (fVar222 * fVar222 + fVar245 * 4.0) * 0.5;
    fVar246 = (fVar240 * fVar240 + fVar246 * 4.0) * 0.5;
    fVar263 = (fVar202 * fVar202 + fVar248 * 4.0) * 0.5;
    fVar250 = (fVar223 * fVar223 + fVar250 * 4.0) * 0.5;
    fVar204 = auVar197._0_4_ * auVar197._0_4_ * 0.5;
    fVar225 = auVar197._4_4_ * auVar197._4_4_ * 0.5;
    fVar201 = auVar197._8_4_ * auVar197._8_4_ * 0.5;
    fVar222 = auVar197._12_4_ * auVar197._12_4_ * 0.5;
    fVar240 = auVar197._16_4_ * auVar197._16_4_ * 0.5;
    fVar223 = auVar197._20_4_ * auVar197._20_4_ * 0.5;
    fVar203 = auVar197._24_4_ * auVar197._24_4_ * 0.5;
    fVar287 = fStack_924 + fVar338 + fVar338 + 4.0;
    auVar138 = vpermilps_avx(ZEXT416((uint)(fVar242 * 0.04761905)),0);
    fVar202 = auVar138._0_4_;
    fVar252 = fVar202 * ((float)local_1a0._0_4_ * fVar268 +
                        fVar244 * (float)local_360._0_4_ +
                        fVar224 * (float)local_380._0_4_ + fVar204 * (float)local_400._0_4_);
    fVar248 = auVar138._4_4_;
    fVar265 = fVar248 * ((float)local_1a0._4_4_ * fVar280 +
                        fVar264 * (float)local_360._4_4_ +
                        fVar241 * (float)local_380._4_4_ + fVar225 * (float)local_400._4_4_);
    local_960._4_4_ = fVar265;
    local_960._0_4_ = fVar252;
    fVar279 = auVar138._8_4_;
    fVar269 = fVar279 * (fStack_198 * fVar283 +
                        fVar267 * fStack_358 + fVar243 * fStack_378 + fVar201 * fStack_3f8);
    local_960._8_4_ = fVar269;
    fVar302 = auVar138._12_4_;
    fVar273 = fVar302 * (fStack_194 * fVar284 +
                        fVar271 * fStack_354 + fVar245 * fStack_374 + fVar222 * fStack_3f4);
    local_960._12_4_ = fVar273;
    fVar277 = fVar202 * (fStack_190 * fVar288 +
                        fVar272 * fStack_350 + fVar246 * fStack_370 + fVar240 * fStack_3f0);
    local_960._16_4_ = fVar277;
    fVar281 = fVar248 * (fStack_18c * fVar294 +
                        fVar275 * fStack_34c + fVar263 * fStack_36c + fVar223 * fStack_3ec);
    local_960._20_4_ = fVar281;
    fVar285 = fVar279 * (fStack_188 * fVar296 +
                        fVar276 * fStack_348 + fVar250 * fStack_368 + fVar203 * fStack_3e8);
    local_960._24_4_ = fVar285;
    local_960._28_4_ = fVar287;
    fVar352 = fVar202 * ((float)local_1c0._0_4_ * fVar268 +
                        (float)local_220._0_4_ * fVar244 +
                        fVar224 * (float)local_3a0._0_4_ + fVar204 * (float)local_420._0_4_);
    fVar358 = fVar248 * ((float)local_1c0._4_4_ * fVar280 +
                        (float)local_220._4_4_ * fVar264 +
                        fVar241 * (float)local_3a0._4_4_ + fVar225 * (float)local_420._4_4_);
    auVar10._4_4_ = fVar358;
    auVar10._0_4_ = fVar352;
    fVar359 = fVar279 * (fStack_1b8 * fVar283 +
                        fStack_218 * fVar267 + fVar243 * fStack_398 + fVar201 * fStack_418);
    auVar10._8_4_ = fVar359;
    fVar360 = fVar302 * (fStack_1b4 * fVar284 +
                        fStack_214 * fVar271 + fVar245 * fStack_394 + fVar222 * fStack_414);
    auVar10._12_4_ = fVar360;
    fVar361 = fVar202 * (fStack_1b0 * fVar288 +
                        fStack_210 * fVar272 + fVar246 * fStack_390 + fVar240 * fStack_410);
    auVar10._16_4_ = fVar361;
    fVar362 = fVar248 * (fStack_1ac * fVar294 +
                        fStack_20c * fVar275 + fVar263 * fStack_38c + fVar223 * fStack_40c);
    auVar10._20_4_ = fVar362;
    fVar363 = fVar279 * (fStack_1a8 * fVar296 +
                        fStack_208 * fVar276 + fVar250 * fStack_388 + fVar203 * fStack_408);
    auVar10._24_4_ = fVar363;
    auVar10._28_4_ = fStack_184;
    fVar364 = fVar202 * ((float)local_1e0._0_4_ * fVar268 +
                        fVar204 * (float)local_440._0_4_ + fVar224 * (float)local_3c0._0_4_ +
                        (float)local_240._0_4_ * fVar244);
    fVar372 = fVar248 * ((float)local_1e0._4_4_ * fVar280 +
                        fVar225 * (float)local_440._4_4_ + fVar241 * (float)local_3c0._4_4_ +
                        (float)local_240._4_4_ * fVar264);
    auVar149._4_4_ = fVar372;
    auVar149._0_4_ = fVar364;
    fVar374 = fVar279 * (fStack_1d8 * fVar283 +
                        fVar201 * fStack_438 + fVar243 * fStack_3b8 + fStack_238 * fVar267);
    auVar149._8_4_ = fVar374;
    fVar376 = fVar302 * (fStack_1d4 * fVar284 +
                        fVar222 * fStack_434 + fVar245 * fStack_3b4 + fStack_234 * fVar271);
    auVar149._12_4_ = fVar376;
    fVar378 = fVar202 * (fStack_1d0 * fVar288 +
                        fVar240 * fStack_430 + fVar246 * fStack_3b0 + fStack_230 * fVar272);
    auVar149._16_4_ = fVar378;
    fVar380 = fVar248 * (fStack_1cc * fVar294 +
                        fVar223 * fStack_42c + fVar263 * fStack_3ac + fStack_22c * fVar275);
    auVar149._20_4_ = fVar380;
    fVar382 = fVar279 * (fStack_1c8 * fVar296 +
                        fVar203 * fStack_428 + fVar250 * fStack_3a8 + fStack_228 * fVar276);
    auVar149._24_4_ = fVar382;
    auVar149._28_4_ = uStack_1a4;
    fVar244 = fVar202 * ((float)local_200._0_4_ * fVar268 +
                        (float)local_260._0_4_ * fVar244 +
                        fVar204 * local_460._0_4_ + fVar224 * (float)local_3e0._0_4_);
    fVar268 = fVar248 * ((float)local_200._4_4_ * fVar280 +
                        (float)local_260._4_4_ * fVar264 +
                        fVar225 * local_460._4_4_ + fVar241 * (float)local_3e0._4_4_);
    auVar13._4_4_ = fVar268;
    auVar13._0_4_ = fVar244;
    fVar293 = fVar279 * (fStack_1f8 * fVar283 +
                        fStack_258 * fVar267 + fVar201 * local_460._8_4_ + fVar243 * fStack_3d8);
    auVar13._8_4_ = fVar293;
    fVar320 = fVar302 * (fStack_1f4 * fVar284 +
                        fStack_254 * fVar271 + fVar222 * local_460._12_4_ + fVar245 * fStack_3d4);
    auVar13._12_4_ = fVar320;
    fVar202 = fVar202 * (fStack_1f0 * fVar288 +
                        fStack_250 * fVar272 + fVar240 * local_460._16_4_ + fVar246 * fStack_3d0);
    auVar13._16_4_ = fVar202;
    fVar248 = fVar248 * (fStack_1ec * fVar294 +
                        fStack_24c * fVar275 + fVar223 * local_460._20_4_ + fVar263 * fStack_3cc);
    auVar13._20_4_ = fVar248;
    fVar279 = fVar279 * (fStack_1e8 * fVar296 +
                        fStack_248 * fVar276 + fVar203 * local_460._24_4_ + fVar250 * fStack_3c8);
    auVar13._24_4_ = fVar279;
    auVar13._28_4_ = fVar302;
    auVar80._4_4_ = fStack_93c;
    auVar80._0_4_ = local_940;
    auVar80._8_4_ = fStack_938;
    auVar80._12_4_ = fStack_934;
    auVar80._16_4_ = fStack_930;
    auVar80._20_4_ = fStack_92c;
    auVar80._24_4_ = fStack_928;
    auVar80._28_4_ = fStack_924;
    auVar114 = vperm2f128_avx(auVar80,auVar80,1);
    auVar114 = vshufps_avx(auVar114,auVar80,0x30);
    _local_ae0 = vshufps_avx(auVar80,auVar114,0x29);
    auVar71._4_4_ = fVar126;
    auVar71._0_4_ = fVar92;
    auVar71._8_4_ = fVar127;
    auVar71._12_4_ = fVar128;
    auVar71._16_4_ = fVar129;
    auVar71._20_4_ = fVar130;
    auVar71._24_4_ = fVar131;
    auVar71._28_4_ = fVar351;
    auVar114 = vperm2f128_avx(auVar71,auVar71,1);
    auVar114 = vshufps_avx(auVar114,auVar71,0x30);
    auVar145 = vshufps_avx(auVar71,auVar114,0x29);
    auVar109 = vsubps_avx(_local_c80,auVar13);
    auVar114 = vperm2f128_avx(auVar109,auVar109,1);
    auVar114 = vshufps_avx(auVar114,auVar109,0x30);
    _local_800 = vshufps_avx(auVar109,auVar114,0x29);
    auVar12 = vsubps_avx(_local_ae0,auVar80);
    auVar147 = vsubps_avx(auVar145,auVar71);
    fVar225 = auVar12._0_4_;
    fVar223 = auVar12._4_4_;
    auVar14._4_4_ = fVar372 * fVar223;
    auVar14._0_4_ = fVar364 * fVar225;
    fVar241 = auVar12._8_4_;
    auVar14._8_4_ = fVar374 * fVar241;
    fVar263 = auVar12._12_4_;
    auVar14._12_4_ = fVar376 * fVar263;
    fVar271 = auVar12._16_4_;
    auVar14._16_4_ = fVar378 * fVar271;
    fVar280 = auVar12._20_4_;
    auVar14._20_4_ = fVar380 * fVar280;
    fVar294 = auVar12._24_4_;
    auVar14._24_4_ = fVar382 * fVar294;
    auVar14._28_4_ = auVar109._28_4_;
    fVar201 = auVar147._0_4_;
    fVar242 = auVar147._4_4_;
    auVar370._4_4_ = fVar358 * fVar242;
    auVar370._0_4_ = fVar352 * fVar201;
    fVar243 = auVar147._8_4_;
    auVar370._8_4_ = fVar359 * fVar243;
    fVar250 = auVar147._12_4_;
    auVar370._12_4_ = fVar360 * fVar250;
    fVar272 = auVar147._16_4_;
    auVar370._16_4_ = fVar361 * fVar272;
    fVar283 = auVar147._20_4_;
    auVar370._20_4_ = fVar362 * fVar283;
    fVar296 = auVar147._24_4_;
    auVar370._24_4_ = fVar363 * fVar296;
    auVar370._28_4_ = auVar114._28_4_;
    auVar147 = vsubps_avx(auVar370,auVar14);
    auVar69._4_4_ = fVar319;
    auVar69._0_4_ = fVar306;
    auVar69._8_4_ = fVar321;
    auVar69._12_4_ = fVar323;
    auVar69._16_4_ = fVar325;
    auVar69._20_4_ = fVar327;
    auVar69._24_4_ = fVar329;
    auVar69._28_4_ = fVar331;
    auVar114 = vperm2f128_avx(auVar69,auVar69,1);
    auVar114 = vshufps_avx(auVar114,auVar69,0x30);
    local_7a0 = vshufps_avx(auVar69,auVar114,0x29);
    auVar109 = vsubps_avx(local_7a0,auVar69);
    auVar15._4_4_ = fVar242 * fVar265;
    auVar15._0_4_ = fVar201 * fVar252;
    auVar15._8_4_ = fVar243 * fVar269;
    auVar15._12_4_ = fVar250 * fVar273;
    auVar15._16_4_ = fVar272 * fVar277;
    auVar15._20_4_ = fVar283 * fVar281;
    auVar15._24_4_ = fVar296 * fVar285;
    auVar15._28_4_ = local_7a0._28_4_;
    fVar222 = auVar109._0_4_;
    fVar203 = auVar109._4_4_;
    auVar16._4_4_ = fVar372 * fVar203;
    auVar16._0_4_ = fVar364 * fVar222;
    fVar245 = auVar109._8_4_;
    auVar16._8_4_ = fVar374 * fVar245;
    fVar264 = auVar109._12_4_;
    auVar16._12_4_ = fVar376 * fVar264;
    fVar275 = auVar109._16_4_;
    auVar16._16_4_ = fVar378 * fVar275;
    fVar284 = auVar109._20_4_;
    auVar16._20_4_ = fVar380 * fVar284;
    fVar298 = auVar109._24_4_;
    auVar16._24_4_ = fVar382 * fVar298;
    auVar16._28_4_ = fVar331;
    auVar13 = vsubps_avx(auVar16,auVar15);
    auVar148._4_4_ = fVar358 * fVar203;
    auVar148._0_4_ = fVar352 * fVar222;
    auVar148._8_4_ = fVar359 * fVar245;
    auVar148._12_4_ = fVar360 * fVar264;
    auVar148._16_4_ = fVar361 * fVar275;
    auVar148._20_4_ = fVar362 * fVar284;
    auVar148._24_4_ = fVar363 * fVar298;
    auVar148._28_4_ = fVar331;
    auVar316._4_4_ = fVar265 * fVar223;
    auVar316._0_4_ = fVar252 * fVar225;
    auVar316._8_4_ = fVar269 * fVar241;
    auVar316._12_4_ = fVar273 * fVar263;
    auVar316._16_4_ = fVar277 * fVar271;
    auVar316._20_4_ = fVar281 * fVar280;
    auVar316._24_4_ = fVar285 * fVar294;
    auVar316._28_4_ = uStack_1c4;
    auVar14 = vsubps_avx(auVar316,auVar148);
    fVar204 = auVar14._28_4_;
    auVar146._0_4_ = fVar222 * fVar222 + fVar225 * fVar225 + fVar201 * fVar201;
    auVar146._4_4_ = fVar203 * fVar203 + fVar223 * fVar223 + fVar242 * fVar242;
    auVar146._8_4_ = fVar245 * fVar245 + fVar241 * fVar241 + fVar243 * fVar243;
    auVar146._12_4_ = fVar264 * fVar264 + fVar263 * fVar263 + fVar250 * fVar250;
    auVar146._16_4_ = fVar275 * fVar275 + fVar271 * fVar271 + fVar272 * fVar272;
    auVar146._20_4_ = fVar284 * fVar284 + fVar280 * fVar280 + fVar283 * fVar283;
    auVar146._24_4_ = fVar298 * fVar298 + fVar294 * fVar294 + fVar296 * fVar296;
    auVar146._28_4_ = fVar204 + fVar204 + auVar147._28_4_;
    auVar114 = vrcpps_avx(auVar146);
    fVar322 = auVar114._0_4_;
    fVar324 = auVar114._4_4_;
    auVar11._4_4_ = fVar324 * auVar146._4_4_;
    auVar11._0_4_ = fVar322 * auVar146._0_4_;
    fVar326 = auVar114._8_4_;
    auVar11._8_4_ = fVar326 * auVar146._8_4_;
    fVar328 = auVar114._12_4_;
    auVar11._12_4_ = fVar328 * auVar146._12_4_;
    fVar330 = auVar114._16_4_;
    auVar11._16_4_ = fVar330 * auVar146._16_4_;
    fVar337 = auVar114._20_4_;
    auVar11._20_4_ = fVar337 * auVar146._20_4_;
    fVar338 = auVar114._24_4_;
    auVar11._24_4_ = fVar338 * auVar146._24_4_;
    auVar11._28_4_ = uStack_1c4;
    auVar385._8_4_ = 0x3f800000;
    auVar385._0_8_ = &DAT_3f8000003f800000;
    auVar385._12_4_ = 0x3f800000;
    auVar385._16_4_ = 0x3f800000;
    auVar385._20_4_ = 0x3f800000;
    auVar385._24_4_ = 0x3f800000;
    auVar385._28_4_ = 0x3f800000;
    auVar370 = vsubps_avx(auVar385,auVar11);
    fVar322 = auVar370._0_4_ * fVar322 + fVar322;
    fVar324 = auVar370._4_4_ * fVar324 + fVar324;
    fVar326 = auVar370._8_4_ * fVar326 + fVar326;
    fVar328 = auVar370._12_4_ * fVar328 + fVar328;
    fVar330 = auVar370._16_4_ * fVar330 + fVar330;
    fVar337 = auVar370._20_4_ * fVar337 + fVar337;
    fVar338 = auVar370._24_4_ * fVar338 + fVar338;
    auVar12 = vperm2f128_avx(auVar10,auVar10,1);
    auVar12 = vshufps_avx(auVar12,auVar10,0x30);
    auVar10 = vshufps_avx(auVar10,auVar12,0x29);
    auVar12 = vperm2f128_avx(auVar149,auVar149,1);
    auVar12 = vshufps_avx(auVar12,auVar149,0x30);
    local_aa0 = vshufps_avx(auVar149,auVar12,0x29);
    fVar365 = local_aa0._0_4_;
    fVar373 = local_aa0._4_4_;
    auVar17._4_4_ = fVar373 * fVar223;
    auVar17._0_4_ = fVar365 * fVar225;
    fVar375 = local_aa0._8_4_;
    auVar17._8_4_ = fVar375 * fVar241;
    fVar377 = local_aa0._12_4_;
    auVar17._12_4_ = fVar377 * fVar263;
    fVar379 = local_aa0._16_4_;
    auVar17._16_4_ = fVar379 * fVar271;
    fVar381 = local_aa0._20_4_;
    auVar17._20_4_ = fVar381 * fVar280;
    fVar383 = local_aa0._24_4_;
    auVar17._24_4_ = fVar383 * fVar294;
    auVar17._28_4_ = auVar12._28_4_;
    fVar384 = auVar10._0_4_;
    fVar388 = auVar10._4_4_;
    auVar18._4_4_ = fVar388 * fVar242;
    auVar18._0_4_ = fVar384 * fVar201;
    fVar389 = auVar10._8_4_;
    auVar18._8_4_ = fVar389 * fVar243;
    fVar390 = auVar10._12_4_;
    auVar18._12_4_ = fVar390 * fVar250;
    fVar391 = auVar10._16_4_;
    auVar18._16_4_ = fVar391 * fVar272;
    fVar392 = auVar10._20_4_;
    auVar18._20_4_ = fVar392 * fVar283;
    fVar393 = auVar10._24_4_;
    auVar18._24_4_ = fVar393 * fVar296;
    auVar18._28_4_ = fStack_184;
    auVar149 = vsubps_avx(auVar18,auVar17);
    auVar12 = vperm2f128_avx(local_960,local_960,1);
    auVar12 = vshufps_avx(auVar12,local_960,0x30);
    local_a80 = vshufps_avx(local_960,auVar12,0x29);
    fVar240 = local_a80._0_4_;
    fVar224 = local_a80._4_4_;
    auVar19._4_4_ = fVar242 * fVar224;
    auVar19._0_4_ = fVar201 * fVar240;
    fVar246 = local_a80._8_4_;
    auVar19._8_4_ = fVar243 * fVar246;
    fVar267 = local_a80._12_4_;
    auVar19._12_4_ = fVar250 * fVar267;
    fVar276 = local_a80._16_4_;
    auVar19._16_4_ = fVar272 * fVar276;
    fVar288 = local_a80._20_4_;
    auVar19._20_4_ = fVar283 * fVar288;
    fVar300 = local_a80._24_4_;
    auVar19._24_4_ = fVar296 * fVar300;
    auVar19._28_4_ = auVar12._28_4_;
    auVar20._4_4_ = fVar373 * fVar203;
    auVar20._0_4_ = fVar365 * fVar222;
    auVar20._8_4_ = fVar375 * fVar245;
    auVar20._12_4_ = fVar377 * fVar264;
    auVar20._16_4_ = fVar379 * fVar275;
    auVar20._20_4_ = fVar381 * fVar284;
    uVar88 = local_aa0._28_4_;
    auVar20._24_4_ = fVar383 * fVar298;
    auVar20._28_4_ = uVar88;
    auVar15 = vsubps_avx(auVar20,auVar19);
    auVar21._4_4_ = fVar388 * fVar203;
    auVar21._0_4_ = fVar384 * fVar222;
    auVar21._8_4_ = fVar389 * fVar245;
    auVar21._12_4_ = fVar390 * fVar264;
    auVar21._16_4_ = fVar391 * fVar275;
    auVar21._20_4_ = fVar392 * fVar284;
    auVar21._24_4_ = fVar393 * fVar298;
    auVar21._28_4_ = uVar88;
    auVar22._4_4_ = fVar224 * fVar223;
    auVar22._0_4_ = fVar240 * fVar225;
    auVar22._8_4_ = fVar246 * fVar241;
    auVar22._12_4_ = fVar267 * fVar263;
    auVar22._16_4_ = fVar276 * fVar271;
    auVar22._20_4_ = fVar288 * fVar280;
    fVar305 = auVar10._28_4_;
    auVar22._24_4_ = fVar300 * fVar294;
    auVar22._28_4_ = fVar305;
    auVar12 = vsubps_avx(auVar22,auVar21);
    fVar318 = auVar12._28_4_;
    auVar23._4_4_ =
         (auVar147._4_4_ * auVar147._4_4_ +
         auVar13._4_4_ * auVar13._4_4_ + auVar14._4_4_ * auVar14._4_4_) * fVar324;
    auVar23._0_4_ =
         (auVar147._0_4_ * auVar147._0_4_ +
         auVar13._0_4_ * auVar13._0_4_ + auVar14._0_4_ * auVar14._0_4_) * fVar322;
    auVar23._8_4_ =
         (auVar147._8_4_ * auVar147._8_4_ +
         auVar13._8_4_ * auVar13._8_4_ + auVar14._8_4_ * auVar14._8_4_) * fVar326;
    auVar23._12_4_ =
         (auVar147._12_4_ * auVar147._12_4_ +
         auVar13._12_4_ * auVar13._12_4_ + auVar14._12_4_ * auVar14._12_4_) * fVar328;
    auVar23._16_4_ =
         (auVar147._16_4_ * auVar147._16_4_ +
         auVar13._16_4_ * auVar13._16_4_ + auVar14._16_4_ * auVar14._16_4_) * fVar330;
    auVar23._20_4_ =
         (auVar147._20_4_ * auVar147._20_4_ +
         auVar13._20_4_ * auVar13._20_4_ + auVar14._20_4_ * auVar14._20_4_) * fVar337;
    auVar23._24_4_ =
         (auVar147._24_4_ * auVar147._24_4_ +
         auVar13._24_4_ * auVar13._24_4_ + auVar14._24_4_ * auVar14._24_4_) * fVar338;
    auVar23._28_4_ = auVar147._28_4_ + auVar13._28_4_ + fVar204;
    auVar24._4_4_ =
         (auVar149._4_4_ * auVar149._4_4_ +
         auVar15._4_4_ * auVar15._4_4_ + auVar12._4_4_ * auVar12._4_4_) * fVar324;
    auVar24._0_4_ =
         (auVar149._0_4_ * auVar149._0_4_ +
         auVar15._0_4_ * auVar15._0_4_ + auVar12._0_4_ * auVar12._0_4_) * fVar322;
    auVar24._8_4_ =
         (auVar149._8_4_ * auVar149._8_4_ +
         auVar15._8_4_ * auVar15._8_4_ + auVar12._8_4_ * auVar12._8_4_) * fVar326;
    auVar24._12_4_ =
         (auVar149._12_4_ * auVar149._12_4_ +
         auVar15._12_4_ * auVar15._12_4_ + auVar12._12_4_ * auVar12._12_4_) * fVar328;
    auVar24._16_4_ =
         (auVar149._16_4_ * auVar149._16_4_ +
         auVar15._16_4_ * auVar15._16_4_ + auVar12._16_4_ * auVar12._16_4_) * fVar330;
    auVar24._20_4_ =
         (auVar149._20_4_ * auVar149._20_4_ +
         auVar15._20_4_ * auVar15._20_4_ + auVar12._20_4_ * auVar12._20_4_) * fVar337;
    auVar24._24_4_ =
         (auVar149._24_4_ * auVar149._24_4_ +
         auVar15._24_4_ * auVar15._24_4_ + auVar12._24_4_ * auVar12._24_4_) * fVar338;
    auVar24._28_4_ = auVar370._28_4_ + auVar114._28_4_;
    auVar114 = vmaxps_avx(auVar23,auVar24);
    auVar12 = vperm2f128_avx(_local_c80,_local_c80,1);
    auVar12 = vshufps_avx(auVar12,_local_c80,0x30);
    local_820 = vshufps_avx(_local_c80,auVar12,0x29);
    auVar110._0_4_ = (float)local_c80._0_4_ + fVar244;
    auVar110._4_4_ = (float)local_c80._4_4_ + fVar268;
    auVar110._8_4_ = fStack_c78 + fVar293;
    auVar110._12_4_ = fStack_c74 + fVar320;
    auVar110._16_4_ = fStack_c70 + fVar202;
    auVar110._20_4_ = fStack_c6c + fVar248;
    auVar110._24_4_ = fStack_c68 + fVar279;
    auVar110._28_4_ = fStack_c64 + fVar302;
    auVar12 = vmaxps_avx(_local_c80,auVar110);
    auVar147 = vmaxps_avx(_local_800,local_820);
    auVar12 = vmaxps_avx(auVar12,auVar147);
    auVar147 = vrsqrtps_avx(auVar146);
    fVar204 = auVar147._0_4_;
    fVar202 = auVar147._4_4_;
    fVar244 = auVar147._8_4_;
    fVar248 = auVar147._12_4_;
    fVar268 = auVar147._16_4_;
    fVar279 = auVar147._20_4_;
    fVar293 = auVar147._24_4_;
    auVar25._4_4_ = fVar202 * fVar202 * fVar202 * auVar146._4_4_ * 0.5;
    auVar25._0_4_ = fVar204 * fVar204 * fVar204 * auVar146._0_4_ * 0.5;
    auVar25._8_4_ = fVar244 * fVar244 * fVar244 * auVar146._8_4_ * 0.5;
    auVar25._12_4_ = fVar248 * fVar248 * fVar248 * auVar146._12_4_ * 0.5;
    auVar25._16_4_ = fVar268 * fVar268 * fVar268 * auVar146._16_4_ * 0.5;
    auVar25._20_4_ = fVar279 * fVar279 * fVar279 * auVar146._20_4_ * 0.5;
    auVar25._24_4_ = fVar293 * fVar293 * fVar293 * auVar146._24_4_ * 0.5;
    auVar25._28_4_ = auVar146._28_4_;
    auVar26._4_4_ = fVar202 * 1.5;
    auVar26._0_4_ = fVar204 * 1.5;
    auVar26._8_4_ = fVar244 * 1.5;
    auVar26._12_4_ = fVar248 * 1.5;
    auVar26._16_4_ = fVar268 * 1.5;
    auVar26._20_4_ = fVar279 * 1.5;
    auVar26._24_4_ = fVar293 * 1.5;
    auVar26._28_4_ = auVar147._28_4_;
    auVar13 = vsubps_avx(auVar26,auVar25);
    auVar147 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar14 = vsubps_avx(auVar147,auVar80);
    auVar370 = vsubps_avx(auVar147,auVar71);
    fVar202 = auVar370._0_4_;
    fVar244 = auVar370._4_4_;
    fVar248 = auVar370._8_4_;
    fVar268 = auVar370._12_4_;
    fVar279 = auVar370._16_4_;
    fVar293 = auVar370._20_4_;
    fVar302 = auVar370._24_4_;
    fVar341 = auVar14._0_4_;
    fVar345 = auVar14._4_4_;
    fVar346 = auVar14._8_4_;
    fVar347 = auVar14._12_4_;
    fVar348 = auVar14._16_4_;
    fVar349 = auVar14._20_4_;
    fVar350 = auVar14._24_4_;
    auVar70._4_4_ = fVar319;
    auVar70._0_4_ = fVar306;
    auVar70._8_4_ = fVar321;
    auVar70._12_4_ = fVar323;
    auVar70._16_4_ = fVar325;
    auVar70._20_4_ = fVar327;
    auVar70._24_4_ = fVar329;
    auVar70._28_4_ = fVar331;
    auVar148 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar147 = vsubps_avx(auVar148,auVar70);
    fVar394 = auVar147._0_4_;
    fVar397 = auVar147._4_4_;
    fVar398 = auVar147._8_4_;
    fVar399 = auVar147._12_4_;
    fVar400 = auVar147._16_4_;
    fVar401 = auVar147._20_4_;
    fVar402 = auVar147._24_4_;
    auVar355._0_4_ =
         fVar394 * (float)local_840._0_4_ +
         fVar341 * (float)local_b00._0_4_ + (float)local_920._0_4_ * fVar202;
    auVar355._4_4_ =
         fVar397 * (float)local_840._4_4_ +
         fVar345 * (float)local_b00._4_4_ + (float)local_920._4_4_ * fVar244;
    auVar355._8_4_ = fVar398 * fStack_838 + fVar346 * fStack_af8 + fStack_918 * fVar248;
    auVar355._12_4_ = fVar399 * fStack_834 + fVar347 * fStack_af4 + fStack_914 * fVar268;
    auVar355._16_4_ = fVar400 * fStack_830 + fVar348 * fStack_af0 + fStack_910 * fVar279;
    auVar355._20_4_ = fVar401 * fStack_82c + fVar349 * fStack_aec + fStack_90c * fVar293;
    auVar355._24_4_ = fVar402 * fStack_828 + fVar350 * fStack_ae8 + fStack_908 * fVar302;
    auVar355._28_4_ = fVar318 + fVar318 + auVar15._28_4_ + fVar318;
    auVar368._0_4_ = fVar394 * fVar394 + fVar341 * fVar341 + fVar202 * fVar202;
    auVar368._4_4_ = fVar397 * fVar397 + fVar345 * fVar345 + fVar244 * fVar244;
    auVar368._8_4_ = fVar398 * fVar398 + fVar346 * fVar346 + fVar248 * fVar248;
    auVar368._12_4_ = fVar399 * fVar399 + fVar347 * fVar347 + fVar268 * fVar268;
    auVar368._16_4_ = fVar400 * fVar400 + fVar348 * fVar348 + fVar279 * fVar279;
    auVar368._20_4_ = fVar401 * fVar401 + fVar349 * fVar349 + fVar293 * fVar293;
    auVar368._24_4_ = fVar402 * fVar402 + fVar350 * fVar350 + fVar302 * fVar302;
    auVar368._28_4_ = fVar305 + fVar305 + fVar318;
    fVar328 = auVar13._0_4_;
    fVar330 = auVar13._4_4_;
    fVar337 = auVar13._8_4_;
    fVar338 = auVar13._12_4_;
    fVar247 = auVar13._16_4_;
    fVar249 = auVar13._20_4_;
    fVar251 = auVar13._24_4_;
    local_ac0._0_4_ =
         (float)local_840._0_4_ * fVar222 * fVar328 +
         fVar328 * fVar225 * (float)local_b00._0_4_ + fVar201 * fVar328 * (float)local_920._0_4_;
    local_ac0._4_4_ =
         (float)local_840._4_4_ * fVar203 * fVar330 +
         fVar330 * fVar223 * (float)local_b00._4_4_ + fVar242 * fVar330 * (float)local_920._4_4_;
    fStack_ab8 = fStack_838 * fVar245 * fVar337 +
                 fVar337 * fVar241 * fStack_af8 + fVar243 * fVar337 * fStack_918;
    fStack_ab4 = fStack_834 * fVar264 * fVar338 +
                 fVar338 * fVar263 * fStack_af4 + fVar250 * fVar338 * fStack_914;
    fStack_ab0 = fStack_830 * fVar275 * fVar247 +
                 fVar247 * fVar271 * fStack_af0 + fVar272 * fVar247 * fStack_910;
    fStack_aac = fStack_82c * fVar284 * fVar249 +
                 fVar249 * fVar280 * fStack_aec + fVar283 * fVar249 * fStack_90c;
    fStack_aa8 = fStack_828 * fVar298 * fVar251 +
                 fVar251 * fVar294 * fStack_ae8 + fVar296 * fVar251 * fStack_908;
    fStack_aa4 = fStack_824 + fStack_ae4 + fStack_904;
    fVar204 = fStack_824 + fStack_ae4 + fStack_904;
    local_9e0._0_4_ =
         fVar394 * fVar222 * fVar328 + fVar341 * fVar328 * fVar225 + fVar201 * fVar328 * fVar202;
    local_9e0._4_4_ =
         fVar397 * fVar203 * fVar330 + fVar345 * fVar330 * fVar223 + fVar242 * fVar330 * fVar244;
    local_9e0._8_4_ =
         fVar398 * fVar245 * fVar337 + fVar346 * fVar337 * fVar241 + fVar243 * fVar337 * fVar248;
    local_9e0._12_4_ =
         fVar399 * fVar264 * fVar338 + fVar347 * fVar338 * fVar263 + fVar250 * fVar338 * fVar268;
    local_9e0._16_4_ =
         fVar400 * fVar275 * fVar247 + fVar348 * fVar247 * fVar271 + fVar272 * fVar247 * fVar279;
    local_9e0._20_4_ =
         fVar401 * fVar284 * fVar249 + fVar349 * fVar249 * fVar280 + fVar283 * fVar249 * fVar293;
    local_9e0._24_4_ =
         fVar402 * fVar298 * fVar251 + fVar350 * fVar251 * fVar294 + fVar296 * fVar251 * fVar302;
    local_9e0._28_4_ = fStack_ae4 + fVar204;
    auVar27._4_4_ = (float)local_ac0._4_4_ * local_9e0._4_4_;
    auVar27._0_4_ = (float)local_ac0._0_4_ * (float)local_9e0._0_4_;
    auVar27._8_4_ = fStack_ab8 * local_9e0._8_4_;
    auVar27._12_4_ = fStack_ab4 * local_9e0._12_4_;
    auVar27._16_4_ = fStack_ab0 * local_9e0._16_4_;
    auVar27._20_4_ = fStack_aac * local_9e0._20_4_;
    auVar27._24_4_ = fStack_aa8 * local_9e0._24_4_;
    auVar27._28_4_ = fVar204;
    auVar149 = vsubps_avx(auVar355,auVar27);
    auVar28._4_4_ = local_9e0._4_4_ * local_9e0._4_4_;
    auVar28._0_4_ = (float)local_9e0._0_4_ * (float)local_9e0._0_4_;
    auVar28._8_4_ = local_9e0._8_4_ * local_9e0._8_4_;
    auVar28._12_4_ = local_9e0._12_4_ * local_9e0._12_4_;
    auVar28._16_4_ = local_9e0._16_4_ * local_9e0._16_4_;
    auVar28._20_4_ = local_9e0._20_4_ * local_9e0._20_4_;
    auVar28._24_4_ = local_9e0._24_4_ * local_9e0._24_4_;
    auVar28._28_4_ = fStack_ae4;
    auVar15 = vsubps_avx(auVar368,auVar28);
    auVar147 = vsqrtps_avx(auVar114);
    fVar204 = (auVar147._0_4_ + auVar12._0_4_) * 1.0000002;
    fVar305 = (auVar147._4_4_ + auVar12._4_4_) * 1.0000002;
    fVar318 = (auVar147._8_4_ + auVar12._8_4_) * 1.0000002;
    fVar320 = (auVar147._12_4_ + auVar12._12_4_) * 1.0000002;
    fVar322 = (auVar147._16_4_ + auVar12._16_4_) * 1.0000002;
    fVar324 = (auVar147._20_4_ + auVar12._20_4_) * 1.0000002;
    fVar326 = (auVar147._24_4_ + auVar12._24_4_) * 1.0000002;
    auVar29._4_4_ = fVar305 * fVar305;
    auVar29._0_4_ = fVar204 * fVar204;
    auVar29._8_4_ = fVar318 * fVar318;
    auVar29._12_4_ = fVar320 * fVar320;
    auVar29._16_4_ = fVar322 * fVar322;
    auVar29._20_4_ = fVar324 * fVar324;
    auVar29._24_4_ = fVar326 * fVar326;
    auVar29._28_4_ = auVar147._28_4_ + auVar12._28_4_;
    fVar305 = auVar149._0_4_ + auVar149._0_4_;
    fVar318 = auVar149._4_4_ + auVar149._4_4_;
    local_2c0._0_8_ = CONCAT44(fVar318,fVar305);
    local_2c0._8_4_ = auVar149._8_4_ + auVar149._8_4_;
    local_2c0._12_4_ = auVar149._12_4_ + auVar149._12_4_;
    local_2c0._16_4_ = auVar149._16_4_ + auVar149._16_4_;
    local_2c0._20_4_ = auVar149._20_4_ + auVar149._20_4_;
    local_2c0._24_4_ = auVar149._24_4_ + auVar149._24_4_;
    fVar204 = auVar149._28_4_;
    local_2c0._28_4_ = fVar204 + fVar204;
    auVar149 = vsubps_avx(auVar15,auVar29);
    auVar30._4_4_ = (float)local_ac0._4_4_ * (float)local_ac0._4_4_;
    auVar30._0_4_ = (float)local_ac0._0_4_ * (float)local_ac0._0_4_;
    auVar30._8_4_ = fStack_ab8 * fStack_ab8;
    auVar30._12_4_ = fStack_ab4 * fStack_ab4;
    auVar30._16_4_ = fStack_ab0 * fStack_ab0;
    auVar30._20_4_ = fStack_aac * fStack_aac;
    auVar30._24_4_ = fStack_aa8 * fStack_aa8;
    auVar30._28_4_ = auVar368._28_4_;
    auVar340 = ZEXT3264(local_280);
    auVar16 = vsubps_avx(local_280,auVar30);
    auVar333 = ZEXT3264(auVar16);
    auVar31._4_4_ = fVar318 * fVar318;
    auVar31._0_4_ = fVar305 * fVar305;
    auVar31._8_4_ = local_2c0._8_4_ * local_2c0._8_4_;
    auVar31._12_4_ = local_2c0._12_4_ * local_2c0._12_4_;
    auVar31._16_4_ = local_2c0._16_4_ * local_2c0._16_4_;
    auVar31._20_4_ = local_2c0._20_4_ * local_2c0._20_4_;
    auVar31._24_4_ = local_2c0._24_4_ * local_2c0._24_4_;
    auVar31._28_4_ = fVar204;
    fVar320 = auVar16._0_4_;
    fVar322 = auVar16._4_4_;
    fVar324 = auVar16._8_4_;
    fVar326 = auVar16._12_4_;
    fVar334 = auVar16._16_4_;
    fVar335 = auVar16._20_4_;
    fVar336 = auVar16._24_4_;
    auVar32._4_4_ = fVar322 * 4.0 * auVar149._4_4_;
    auVar32._0_4_ = fVar320 * 4.0 * auVar149._0_4_;
    auVar32._8_4_ = fVar324 * 4.0 * auVar149._8_4_;
    auVar32._12_4_ = fVar326 * 4.0 * auVar149._12_4_;
    auVar32._16_4_ = fVar334 * 4.0 * auVar149._16_4_;
    auVar32._20_4_ = fVar335 * 4.0 * auVar149._20_4_;
    auVar32._24_4_ = fVar336 * 4.0 * auVar149._24_4_;
    auVar32._28_4_ = 0x40800000;
    auVar12 = vsubps_avx(auVar31,auVar32);
    auVar114 = vcmpps_avx(auVar12,auVar148,5);
    fVar204 = auVar16._28_4_;
    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar114 >> 0x7f,0) == '\0') &&
          (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar114 >> 0xbf,0) == '\0') &&
        (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar114[0x1f])
    {
      local_9c0._8_4_ = 0x7f800000;
      local_9c0._0_8_ = 0x7f8000007f800000;
      local_9c0._12_4_ = 0x7f800000;
      local_9c0._16_4_ = 0x7f800000;
      local_9c0._20_4_ = 0x7f800000;
      local_9c0._24_4_ = 0x7f800000;
      local_9c0._28_4_ = 0x7f800000;
      auVar386._8_4_ = 0xff800000;
      auVar386._0_8_ = 0xff800000ff800000;
      auVar386._12_4_ = 0xff800000;
      auVar386._16_4_ = 0xff800000;
      auVar386._20_4_ = 0xff800000;
      auVar386._24_4_ = 0xff800000;
      auVar386._28_4_ = 0xff800000;
      fVar305 = 0.0;
    }
    else {
      auVar11 = vsqrtps_avx(auVar12);
      auVar257._0_4_ = fVar320 + fVar320;
      auVar257._4_4_ = fVar322 + fVar322;
      auVar257._8_4_ = fVar324 + fVar324;
      auVar257._12_4_ = fVar326 + fVar326;
      auVar257._16_4_ = fVar334 + fVar334;
      auVar257._20_4_ = fVar335 + fVar335;
      auVar257._24_4_ = fVar336 + fVar336;
      auVar257._28_4_ = fVar204 + fVar204;
      auVar316 = vrcpps_avx(auVar257);
      auVar12 = vcmpps_avx(auVar12,auVar148,5);
      fVar253 = auVar316._0_4_;
      fVar266 = auVar316._4_4_;
      auVar33._4_4_ = auVar257._4_4_ * fVar266;
      auVar33._0_4_ = auVar257._0_4_ * fVar253;
      fVar270 = auVar316._8_4_;
      auVar33._8_4_ = auVar257._8_4_ * fVar270;
      fVar274 = auVar316._12_4_;
      auVar33._12_4_ = auVar257._12_4_ * fVar274;
      fVar278 = auVar316._16_4_;
      auVar33._16_4_ = auVar257._16_4_ * fVar278;
      fVar282 = auVar316._20_4_;
      auVar33._20_4_ = auVar257._20_4_ * fVar282;
      fVar286 = auVar316._24_4_;
      auVar33._24_4_ = auVar257._24_4_ * fVar286;
      auVar33._28_4_ = auVar257._28_4_;
      auVar313._8_4_ = 0x3f800000;
      auVar313._0_8_ = &DAT_3f8000003f800000;
      auVar313._12_4_ = 0x3f800000;
      auVar313._16_4_ = 0x3f800000;
      auVar313._20_4_ = 0x3f800000;
      auVar313._24_4_ = 0x3f800000;
      auVar313._28_4_ = 0x3f800000;
      auVar148 = vsubps_avx(auVar313,auVar33);
      fVar253 = fVar253 + fVar253 * auVar148._0_4_;
      fVar266 = fVar266 + fVar266 * auVar148._4_4_;
      fVar270 = fVar270 + fVar270 * auVar148._8_4_;
      fVar274 = fVar274 + fVar274 * auVar148._12_4_;
      fVar278 = fVar278 + fVar278 * auVar148._16_4_;
      fVar282 = fVar282 + fVar282 * auVar148._20_4_;
      fVar286 = fVar286 + fVar286 * auVar148._24_4_;
      auVar289._0_8_ = CONCAT44(fVar318,fVar305) ^ 0x8000000080000000;
      auVar289._8_4_ = -local_2c0._8_4_;
      auVar289._12_4_ = -local_2c0._12_4_;
      auVar289._16_4_ = -local_2c0._16_4_;
      auVar289._20_4_ = -local_2c0._20_4_;
      auVar289._24_4_ = -local_2c0._24_4_;
      auVar289._28_4_ = -local_2c0._28_4_;
      auVar17 = vsubps_avx(auVar289,auVar11);
      fVar305 = auVar17._0_4_ * fVar253;
      fVar318 = auVar17._4_4_ * fVar266;
      auVar34._4_4_ = fVar318;
      auVar34._0_4_ = fVar305;
      fVar295 = auVar17._8_4_ * fVar270;
      auVar34._8_4_ = fVar295;
      fVar297 = auVar17._12_4_ * fVar274;
      auVar34._12_4_ = fVar297;
      fVar299 = auVar17._16_4_ * fVar278;
      auVar34._16_4_ = fVar299;
      fVar301 = auVar17._20_4_ * fVar282;
      auVar34._20_4_ = fVar301;
      fVar303 = auVar17._24_4_ * fVar286;
      auVar34._24_4_ = fVar303;
      auVar34._28_4_ = auVar17._28_4_;
      auVar11 = vsubps_avx(auVar11,local_2c0);
      fVar253 = auVar11._0_4_ * fVar253;
      fVar266 = auVar11._4_4_ * fVar266;
      auVar35._4_4_ = fVar266;
      auVar35._0_4_ = fVar253;
      fVar270 = auVar11._8_4_ * fVar270;
      auVar35._8_4_ = fVar270;
      fVar274 = auVar11._12_4_ * fVar274;
      auVar35._12_4_ = fVar274;
      fVar278 = auVar11._16_4_ * fVar278;
      auVar35._16_4_ = fVar278;
      fVar282 = auVar11._20_4_ * fVar282;
      auVar35._20_4_ = fVar282;
      fVar286 = auVar11._24_4_ * fVar286;
      auVar35._24_4_ = fVar286;
      auVar35._28_4_ = auVar11._28_4_;
      fStack_624 = local_9e0._28_4_ + auVar316._28_4_ + auVar148._28_4_;
      local_640[0] = fVar328 * ((float)local_9e0._0_4_ + (float)local_ac0._0_4_ * fVar305);
      local_640[1] = fVar330 * (local_9e0._4_4_ + (float)local_ac0._4_4_ * fVar318);
      local_640[2] = fVar337 * (local_9e0._8_4_ + fStack_ab8 * fVar295);
      local_640[3] = fVar338 * (local_9e0._12_4_ + fStack_ab4 * fVar297);
      fStack_630 = fVar247 * (local_9e0._16_4_ + fStack_ab0 * fVar299);
      fStack_62c = fVar249 * (local_9e0._20_4_ + fStack_aac * fVar301);
      fStack_628 = fVar251 * (local_9e0._24_4_ + fStack_aa8 * fVar303);
      local_660[0] = fVar328 * ((float)local_9e0._0_4_ + (float)local_ac0._0_4_ * fVar253);
      local_660[1] = fVar330 * (local_9e0._4_4_ + (float)local_ac0._4_4_ * fVar266);
      local_660[2] = fVar337 * (local_9e0._8_4_ + fStack_ab8 * fVar270);
      local_660[3] = fVar338 * (local_9e0._12_4_ + fStack_ab4 * fVar274);
      fStack_650 = fVar247 * (local_9e0._16_4_ + fStack_ab0 * fVar278);
      fStack_64c = fVar249 * (local_9e0._20_4_ + fStack_aac * fVar282);
      fStack_648 = fVar251 * (local_9e0._24_4_ + fStack_aa8 * fVar286);
      fStack_644 = local_9e0._28_4_ + fStack_624;
      auVar258._8_4_ = 0x7f800000;
      auVar258._0_8_ = 0x7f8000007f800000;
      auVar258._12_4_ = 0x7f800000;
      auVar258._16_4_ = 0x7f800000;
      auVar258._20_4_ = 0x7f800000;
      auVar258._24_4_ = 0x7f800000;
      auVar258._28_4_ = 0x7f800000;
      local_9c0 = vblendvps_avx(auVar258,auVar34,auVar12);
      auVar290._8_4_ = 0x7fffffff;
      auVar290._0_8_ = 0x7fffffff7fffffff;
      auVar290._12_4_ = 0x7fffffff;
      auVar290._16_4_ = 0x7fffffff;
      auVar290._20_4_ = 0x7fffffff;
      auVar290._24_4_ = 0x7fffffff;
      auVar290._28_4_ = 0x7fffffff;
      auVar148 = vandps_avx(auVar30,auVar290);
      auVar148 = vmaxps_avx(local_4a0,auVar148);
      auVar36._4_4_ = auVar148._4_4_ * 1.9073486e-06;
      auVar36._0_4_ = auVar148._0_4_ * 1.9073486e-06;
      auVar36._8_4_ = auVar148._8_4_ * 1.9073486e-06;
      auVar36._12_4_ = auVar148._12_4_ * 1.9073486e-06;
      auVar36._16_4_ = auVar148._16_4_ * 1.9073486e-06;
      auVar36._20_4_ = auVar148._20_4_ * 1.9073486e-06;
      auVar36._24_4_ = auVar148._24_4_ * 1.9073486e-06;
      auVar36._28_4_ = auVar148._28_4_;
      auVar148 = vandps_avx(auVar16,auVar290);
      auVar148 = vcmpps_avx(auVar148,auVar36,1);
      auVar259._8_4_ = 0xff800000;
      auVar259._0_8_ = 0xff800000ff800000;
      auVar259._12_4_ = 0xff800000;
      auVar259._16_4_ = 0xff800000;
      auVar259._20_4_ = 0xff800000;
      auVar259._24_4_ = 0xff800000;
      auVar259._28_4_ = 0xff800000;
      auVar386 = vblendvps_avx(auVar259,auVar35,auVar12);
      auVar316 = auVar12 & auVar148;
      fVar305 = local_2c0._28_4_;
      if ((((((((auVar316 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar316 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar316 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar316 >> 0x7f,0) != '\0') ||
            (auVar316 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar316 >> 0xbf,0) != '\0') ||
          (auVar316 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar316[0x1f] < '\0') {
        auVar114 = vandps_avx(auVar148,auVar12);
        auVar138 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
        auVar316 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar148 = vcmpps_avx(auVar149,auVar316,2);
        auVar339._8_4_ = 0xff800000;
        auVar339._0_8_ = 0xff800000ff800000;
        auVar339._12_4_ = 0xff800000;
        auVar339._16_4_ = 0xff800000;
        auVar339._20_4_ = 0xff800000;
        auVar339._24_4_ = 0xff800000;
        auVar339._28_4_ = 0xff800000;
        auVar340 = ZEXT3264(auVar339);
        auVar371._8_4_ = 0x7f800000;
        auVar371._0_8_ = 0x7f8000007f800000;
        auVar371._12_4_ = 0x7f800000;
        auVar371._16_4_ = 0x7f800000;
        auVar371._20_4_ = 0x7f800000;
        auVar371._24_4_ = 0x7f800000;
        auVar371._28_4_ = 0x7f800000;
        auVar149 = vblendvps_avx(auVar371,auVar339,auVar148);
        auVar102 = vpmovsxwd_avx(auVar138);
        auVar138 = vpunpckhwd_avx(auVar138,auVar138);
        auVar239._16_16_ = auVar138;
        auVar239._0_16_ = auVar102;
        local_9c0 = vblendvps_avx(local_9c0,auVar149,auVar239);
        auVar149 = vblendvps_avx(auVar339,auVar371,auVar148);
        auVar386 = vblendvps_avx(auVar386,auVar149,auVar239);
        auVar149 = vcmpps_avx(auVar316,ZEXT1232(ZEXT812(0)) << 0x20,0xf);
        auVar123._0_4_ = auVar114._0_4_ ^ auVar149._0_4_;
        auVar123._4_4_ = auVar114._4_4_ ^ auVar149._4_4_;
        auVar123._8_4_ = auVar114._8_4_ ^ auVar149._8_4_;
        auVar123._12_4_ = auVar114._12_4_ ^ auVar149._12_4_;
        auVar123._16_4_ = auVar114._16_4_ ^ auVar149._16_4_;
        auVar123._20_4_ = auVar114._20_4_ ^ auVar149._20_4_;
        auVar123._24_4_ = auVar114._24_4_ ^ auVar149._24_4_;
        auVar123._28_4_ = auVar114._28_4_ ^ auVar149._28_4_;
        auVar114 = vorps_avx(auVar148,auVar123);
        auVar114 = vandps_avx(auVar12,auVar114);
      }
    }
    auVar357 = ZEXT3264(auVar12);
    auVar344 = ZEXT3264(auVar14);
    auVar292 = ZEXT3264(local_9e0);
    auVar262 = ZEXT3264(local_2c0);
    auVar12 = local_480 & auVar114;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar138 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_900._0_4_
                                           )),
                             ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_900._0_4_
                                           )),0);
      auVar217._16_16_ = auVar138;
      auVar217._0_16_ = auVar138;
      auVar149 = vminps_avx(auVar217,auVar386);
      fVar282 = auVar370._28_4_;
      auVar395 = local_920._0_28_;
      auVar178._0_4_ =
           (float)local_840._0_4_ * fVar252 +
           (float)local_b00._0_4_ * fVar352 + (float)local_920._0_4_ * fVar364;
      auVar178._4_4_ =
           (float)local_840._4_4_ * fVar265 +
           (float)local_b00._4_4_ * fVar358 + (float)local_920._4_4_ * fVar372;
      auVar178._8_4_ = fStack_838 * fVar269 + fStack_af8 * fVar359 + fStack_918 * fVar374;
      auVar178._12_4_ = fStack_834 * fVar273 + fStack_af4 * fVar360 + fStack_914 * fVar376;
      auVar178._16_4_ = fStack_830 * fVar277 + fStack_af0 * fVar361 + fStack_910 * fVar378;
      auVar178._20_4_ = fStack_82c * fVar281 + fStack_aec * fVar362 + fStack_90c * fVar380;
      auVar178._24_4_ = fStack_828 * fVar285 + fStack_ae8 * fVar363 + fStack_908 * fVar382;
      auVar178._28_4_ = fVar287 + fStack_184 + fVar282;
      auVar12 = vrcpps_avx(auVar178);
      fVar318 = auVar12._0_4_;
      fVar287 = auVar12._4_4_;
      auVar37._4_4_ = auVar178._4_4_ * fVar287;
      auVar37._0_4_ = auVar178._0_4_ * fVar318;
      fVar253 = auVar12._8_4_;
      auVar37._8_4_ = auVar178._8_4_ * fVar253;
      fVar266 = auVar12._12_4_;
      auVar37._12_4_ = auVar178._12_4_ * fVar266;
      fVar270 = auVar12._16_4_;
      auVar37._16_4_ = auVar178._16_4_ * fVar270;
      fVar274 = auVar12._20_4_;
      auVar37._20_4_ = auVar178._20_4_ * fVar274;
      fVar278 = auVar12._24_4_;
      auVar37._24_4_ = auVar178._24_4_ * fVar278;
      auVar37._28_4_ = fStack_184;
      auVar314._8_4_ = 0x3f800000;
      auVar314._0_8_ = &DAT_3f8000003f800000;
      auVar314._12_4_ = 0x3f800000;
      auVar314._16_4_ = 0x3f800000;
      auVar314._20_4_ = 0x3f800000;
      auVar314._24_4_ = 0x3f800000;
      auVar314._28_4_ = 0x3f800000;
      auVar370 = vsubps_avx(auVar314,auVar37);
      auVar291._8_4_ = 0x7fffffff;
      auVar291._0_8_ = 0x7fffffff7fffffff;
      auVar291._12_4_ = 0x7fffffff;
      auVar291._16_4_ = 0x7fffffff;
      auVar291._20_4_ = 0x7fffffff;
      auVar291._24_4_ = 0x7fffffff;
      auVar291._28_4_ = 0x7fffffff;
      auVar12 = vandps_avx(auVar178,auVar291);
      auVar369._8_4_ = 0x219392ef;
      auVar369._0_8_ = 0x219392ef219392ef;
      auVar369._12_4_ = 0x219392ef;
      auVar369._16_4_ = 0x219392ef;
      auVar369._20_4_ = 0x219392ef;
      auVar369._24_4_ = 0x219392ef;
      auVar369._28_4_ = 0x219392ef;
      auVar14 = vcmpps_avx(auVar12,auVar369,1);
      auVar333 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar38._4_4_ =
           (fVar287 + fVar287 * auVar370._4_4_) *
           -(fVar397 * fVar265 + fVar345 * fVar358 + fVar372 * fVar244);
      auVar38._0_4_ =
           (fVar318 + fVar318 * auVar370._0_4_) *
           -(fVar394 * fVar252 + fVar341 * fVar352 + fVar364 * fVar202);
      auVar38._8_4_ =
           (fVar253 + fVar253 * auVar370._8_4_) *
           -(fVar398 * fVar269 + fVar346 * fVar359 + fVar374 * fVar248);
      auVar38._12_4_ =
           (fVar266 + fVar266 * auVar370._12_4_) *
           -(fVar399 * fVar273 + fVar347 * fVar360 + fVar376 * fVar268);
      auVar38._16_4_ =
           (fVar270 + fVar270 * auVar370._16_4_) *
           -(fVar400 * fVar277 + fVar348 * fVar361 + fVar378 * fVar279);
      auVar38._20_4_ =
           (fVar274 + fVar274 * auVar370._20_4_) *
           -(fVar401 * fVar281 + fVar349 * fVar362 + fVar380 * fVar293);
      auVar38._24_4_ =
           (fVar278 + fVar278 * auVar370._24_4_) *
           -(fVar402 * fVar285 + fVar350 * fVar363 + fVar382 * fVar302);
      auVar38._28_4_ = -(fVar282 + fVar305 + fVar282);
      auVar62 = ZEXT812(0);
      auVar12 = vcmpps_avx(auVar178,ZEXT1232(auVar62) << 0x20,1);
      auVar12 = vorps_avx(auVar14,auVar12);
      auVar343._8_4_ = 0xff800000;
      auVar343._0_8_ = 0xff800000ff800000;
      auVar343._12_4_ = 0xff800000;
      auVar343._16_4_ = 0xff800000;
      auVar343._20_4_ = 0xff800000;
      auVar343._24_4_ = 0xff800000;
      auVar343._28_4_ = 0xff800000;
      auVar344 = ZEXT3264(auVar343);
      auVar12 = vblendvps_avx(auVar38,auVar343,auVar12);
      auVar370 = vcmpps_avx(auVar178,ZEXT1232(auVar62) << 0x20,6);
      auVar14 = vorps_avx(auVar14,auVar370);
      auVar356._8_4_ = 0x7f800000;
      auVar356._0_8_ = 0x7f8000007f800000;
      auVar356._12_4_ = 0x7f800000;
      auVar356._16_4_ = 0x7f800000;
      auVar356._20_4_ = 0x7f800000;
      auVar356._24_4_ = 0x7f800000;
      auVar356._28_4_ = 0x7f800000;
      auVar357 = ZEXT3264(auVar356);
      auVar14 = vblendvps_avx(auVar38,auVar356,auVar14);
      auVar370 = vmaxps_avx(local_2a0,local_9c0);
      auVar370 = vmaxps_avx(auVar370,auVar12);
      auVar14 = vminps_avx(auVar149,auVar14);
      auVar316 = ZEXT1232(auVar62) << 0x20;
      auVar12 = vsubps_avx(auVar316,_local_ae0);
      auVar145 = vsubps_avx(auVar316,auVar145);
      auVar39._4_4_ = auVar145._4_4_ * -fVar373;
      auVar39._0_4_ = auVar145._0_4_ * -fVar365;
      auVar39._8_4_ = auVar145._8_4_ * -fVar375;
      auVar39._12_4_ = auVar145._12_4_ * -fVar377;
      auVar39._16_4_ = auVar145._16_4_ * -fVar379;
      auVar39._20_4_ = auVar145._20_4_ * -fVar381;
      auVar39._24_4_ = auVar145._24_4_ * -fVar383;
      auVar39._28_4_ = auVar145._28_4_;
      auVar340 = ZEXT3264(auVar10);
      auVar40._4_4_ = fVar388 * auVar12._4_4_;
      auVar40._0_4_ = fVar384 * auVar12._0_4_;
      auVar40._8_4_ = fVar389 * auVar12._8_4_;
      auVar40._12_4_ = fVar390 * auVar12._12_4_;
      auVar40._16_4_ = fVar391 * auVar12._16_4_;
      auVar40._20_4_ = fVar392 * auVar12._20_4_;
      auVar40._24_4_ = fVar393 * auVar12._24_4_;
      auVar40._28_4_ = auVar12._28_4_;
      auVar12 = vsubps_avx(auVar39,auVar40);
      auVar145 = vsubps_avx(auVar316,local_7a0);
      auVar292 = ZEXT3264(auVar114);
      auVar41._4_4_ = fVar224 * auVar145._4_4_;
      auVar41._0_4_ = fVar240 * auVar145._0_4_;
      auVar41._8_4_ = fVar246 * auVar145._8_4_;
      auVar41._12_4_ = fVar267 * auVar145._12_4_;
      auVar41._16_4_ = fVar276 * auVar145._16_4_;
      auVar41._20_4_ = fVar288 * auVar145._20_4_;
      uVar1 = auVar145._28_4_;
      auVar41._24_4_ = fVar300 * auVar145._24_4_;
      auVar41._28_4_ = uVar1;
      auVar10 = vsubps_avx(auVar12,auVar41);
      auVar42._4_4_ = (float)local_920._4_4_ * -fVar373;
      auVar42._0_4_ = (float)local_920._0_4_ * -fVar365;
      auVar42._8_4_ = fStack_918 * -fVar375;
      auVar42._12_4_ = fStack_914 * -fVar377;
      auVar42._16_4_ = fStack_910 * -fVar379;
      auVar42._20_4_ = fStack_90c * -fVar381;
      auVar42._24_4_ = fStack_908 * -fVar383;
      auVar42._28_4_ = uVar88 ^ 0x80000000;
      auVar43._4_4_ = (float)local_b00._4_4_ * fVar388;
      auVar43._0_4_ = (float)local_b00._0_4_ * fVar384;
      auVar43._8_4_ = fStack_af8 * fVar389;
      auVar43._12_4_ = fStack_af4 * fVar390;
      auVar43._16_4_ = fStack_af0 * fVar391;
      auVar43._20_4_ = fStack_aec * fVar392;
      auVar43._24_4_ = fStack_ae8 * fVar393;
      auVar43._28_4_ = uVar1;
      auVar12 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = (float)local_840._4_4_ * fVar224;
      auVar44._0_4_ = (float)local_840._0_4_ * fVar240;
      auVar44._8_4_ = fStack_838 * fVar246;
      auVar44._12_4_ = fStack_834 * fVar267;
      auVar44._16_4_ = fStack_830 * fVar276;
      auVar44._20_4_ = fStack_82c * fVar288;
      auVar44._24_4_ = fStack_828 * fVar300;
      auVar44._28_4_ = uVar1;
      auVar149 = vsubps_avx(auVar12,auVar44);
      auVar12 = vrcpps_avx(auVar149);
      fVar240 = auVar12._0_4_;
      fVar202 = auVar12._4_4_;
      auVar45._4_4_ = auVar149._4_4_ * fVar202;
      auVar45._0_4_ = auVar149._0_4_ * fVar240;
      fVar224 = auVar12._8_4_;
      auVar45._8_4_ = auVar149._8_4_ * fVar224;
      fVar244 = auVar12._12_4_;
      auVar45._12_4_ = auVar149._12_4_ * fVar244;
      fVar246 = auVar12._16_4_;
      auVar45._16_4_ = auVar149._16_4_ * fVar246;
      fVar248 = auVar12._20_4_;
      auVar45._20_4_ = auVar149._20_4_ * fVar248;
      fVar267 = auVar12._24_4_;
      auVar45._24_4_ = auVar149._24_4_ * fVar267;
      auVar45._28_4_ = fStack_824;
      auVar148 = vsubps_avx(auVar314,auVar45);
      auVar111._8_4_ = 0x7fffffff;
      auVar111._0_8_ = 0x7fffffff7fffffff;
      auVar111._12_4_ = 0x7fffffff;
      auVar111._16_4_ = 0x7fffffff;
      auVar111._20_4_ = 0x7fffffff;
      auVar111._24_4_ = 0x7fffffff;
      auVar111._28_4_ = 0x7fffffff;
      auVar12 = vandps_avx(auVar149,auVar111);
      auVar112._8_4_ = 0x219392ef;
      auVar112._0_8_ = 0x219392ef219392ef;
      auVar112._12_4_ = 0x219392ef;
      auVar112._16_4_ = 0x219392ef;
      auVar112._20_4_ = 0x219392ef;
      auVar112._24_4_ = 0x219392ef;
      auVar112._28_4_ = 0x219392ef;
      auVar145 = vcmpps_avx(auVar12,auVar112,1);
      auVar262 = ZEXT3264(auVar145);
      auVar46._4_4_ = (fVar202 + fVar202 * auVar148._4_4_) * -auVar10._4_4_;
      auVar46._0_4_ = (fVar240 + fVar240 * auVar148._0_4_) * -auVar10._0_4_;
      auVar46._8_4_ = (fVar224 + fVar224 * auVar148._8_4_) * -auVar10._8_4_;
      auVar46._12_4_ = (fVar244 + fVar244 * auVar148._12_4_) * -auVar10._12_4_;
      auVar46._16_4_ = (fVar246 + fVar246 * auVar148._16_4_) * -auVar10._16_4_;
      auVar46._20_4_ = (fVar248 + fVar248 * auVar148._20_4_) * -auVar10._20_4_;
      auVar46._24_4_ = (fVar267 + fVar267 * auVar148._24_4_) * -auVar10._24_4_;
      auVar46._28_4_ = auVar10._28_4_ ^ 0x80000000;
      auVar12 = vcmpps_avx(auVar149,auVar316,1);
      auVar12 = vorps_avx(auVar145,auVar12);
      auVar12 = vblendvps_avx(auVar46,auVar343,auVar12);
      local_8a0 = vmaxps_avx(auVar370,auVar12);
      auVar370 = ZEXT1232(auVar62) << 0x20;
      auVar12 = vcmpps_avx(auVar149,auVar370,6);
      auVar12 = vorps_avx(auVar145,auVar12);
      auVar145 = vblendvps_avx(auVar46,auVar356,auVar12);
      auVar12 = vandps_avx(auVar114,local_480);
      local_2e0 = vminps_avx(auVar14,auVar145);
      auVar145 = vcmpps_avx(local_8a0,local_2e0,2);
      auVar10 = auVar12 & auVar145;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar10 = vminps_avx(_local_c80,auVar110);
        auVar14 = vminps_avx(_local_800,local_820);
        auVar10 = vminps_avx(auVar10,auVar14);
        auVar10 = vsubps_avx(auVar10,auVar147);
        auVar12 = vandps_avx(auVar145,auVar12);
        auVar82._4_4_ = local_640[1];
        auVar82._0_4_ = local_640[0];
        auVar82._8_4_ = local_640[2];
        auVar82._12_4_ = local_640[3];
        auVar82._16_4_ = fStack_630;
        auVar82._20_4_ = fStack_62c;
        auVar82._24_4_ = fStack_628;
        auVar82._28_4_ = fStack_624;
        auVar147 = vminps_avx(auVar82,auVar314);
        auVar147 = vmaxps_avx(auVar147,ZEXT832(0) << 0x20);
        local_640[0] = fVar167 + fVar304 * (auVar147._0_4_ + 0.0) * 0.125;
        local_640[1] = fVar186 + fVar164 * (auVar147._4_4_ + 1.0) * 0.125;
        local_640[2] = fVar187 + fVar165 * (auVar147._8_4_ + 2.0) * 0.125;
        local_640[3] = fVar188 + fVar166 * (auVar147._12_4_ + 3.0) * 0.125;
        fStack_630 = fVar167 + fVar304 * (auVar147._16_4_ + 4.0) * 0.125;
        fStack_62c = fVar186 + fVar164 * (auVar147._20_4_ + 5.0) * 0.125;
        fStack_628 = fVar187 + fVar165 * (auVar147._24_4_ + 6.0) * 0.125;
        fStack_624 = fVar188 + auVar147._28_4_ + 7.0;
        auVar81._4_4_ = local_660[1];
        auVar81._0_4_ = local_660[0];
        auVar81._8_4_ = local_660[2];
        auVar81._12_4_ = local_660[3];
        auVar81._16_4_ = fStack_650;
        auVar81._20_4_ = fStack_64c;
        auVar81._24_4_ = fStack_648;
        auVar81._28_4_ = fStack_644;
        auVar147 = vminps_avx(auVar81,auVar314);
        auVar147 = vmaxps_avx(auVar147,ZEXT832(0) << 0x20);
        local_660[0] = fVar167 + fVar304 * (auVar147._0_4_ + 0.0) * 0.125;
        local_660[1] = fVar186 + fVar164 * (auVar147._4_4_ + 1.0) * 0.125;
        local_660[2] = fVar187 + fVar165 * (auVar147._8_4_ + 2.0) * 0.125;
        local_660[3] = fVar188 + fVar166 * (auVar147._12_4_ + 3.0) * 0.125;
        fStack_650 = fVar167 + fVar304 * (auVar147._16_4_ + 4.0) * 0.125;
        fStack_64c = fVar186 + fVar164 * (auVar147._20_4_ + 5.0) * 0.125;
        fStack_648 = fVar187 + fVar165 * (auVar147._24_4_ + 6.0) * 0.125;
        fStack_644 = fVar188 + auVar147._28_4_ + 7.0;
        auVar47._4_4_ = auVar10._4_4_ * 0.99999976;
        auVar47._0_4_ = auVar10._0_4_ * 0.99999976;
        auVar47._8_4_ = auVar10._8_4_ * 0.99999976;
        auVar47._12_4_ = auVar10._12_4_ * 0.99999976;
        auVar47._16_4_ = auVar10._16_4_ * 0.99999976;
        auVar47._20_4_ = auVar10._20_4_ * 0.99999976;
        auVar47._24_4_ = auVar10._24_4_ * 0.99999976;
        auVar47._28_4_ = 0x3f7ffffc;
        auVar147 = vmaxps_avx(auVar370,auVar47);
        auVar48._4_4_ = auVar147._4_4_ * auVar147._4_4_;
        auVar48._0_4_ = auVar147._0_4_ * auVar147._0_4_;
        auVar48._8_4_ = auVar147._8_4_ * auVar147._8_4_;
        auVar48._12_4_ = auVar147._12_4_ * auVar147._12_4_;
        auVar48._16_4_ = auVar147._16_4_ * auVar147._16_4_;
        auVar48._20_4_ = auVar147._20_4_ * auVar147._20_4_;
        auVar48._24_4_ = auVar147._24_4_ * auVar147._24_4_;
        auVar48._28_4_ = auVar147._28_4_;
        auVar145 = vsubps_avx(auVar15,auVar48);
        auVar49._4_4_ = auVar145._4_4_ * fVar322 * 4.0;
        auVar49._0_4_ = auVar145._0_4_ * fVar320 * 4.0;
        auVar49._8_4_ = auVar145._8_4_ * fVar324 * 4.0;
        auVar49._12_4_ = auVar145._12_4_ * fVar326 * 4.0;
        auVar49._16_4_ = auVar145._16_4_ * fVar334 * 4.0;
        auVar49._20_4_ = auVar145._20_4_ * fVar335 * 4.0;
        auVar49._24_4_ = auVar145._24_4_ * fVar336 * 4.0;
        auVar49._28_4_ = auVar147._28_4_;
        auVar10 = vsubps_avx(auVar31,auVar49);
        _local_880 = ZEXT432(0) << 0x20;
        auVar147 = vcmpps_avx(auVar10,ZEXT832(0) << 0x20,5);
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0x7f,0) == '\0') &&
              (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0xbf,0) == '\0') &&
            (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar147[0x1f]) {
          auVar149 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_780 = ZEXT832(0) << 0x20;
          auVar196 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar312 = ZEXT828(0) << 0x20;
          auVar218._8_4_ = 0x7f800000;
          auVar218._0_8_ = 0x7f8000007f800000;
          auVar218._12_4_ = 0x7f800000;
          auVar218._16_4_ = 0x7f800000;
          auVar218._20_4_ = 0x7f800000;
          auVar218._24_4_ = 0x7f800000;
          auVar218._28_4_ = 0x7f800000;
          auVar233._8_4_ = 0xff800000;
          auVar233._0_8_ = 0xff800000ff800000;
          auVar233._12_4_ = 0xff800000;
          auVar233._16_4_ = 0xff800000;
          auVar233._20_4_ = 0xff800000;
          auVar233._24_4_ = 0xff800000;
          auVar233._28_4_ = 0xff800000;
          auVar3 = local_7e0;
          _local_760 = _local_780;
        }
        else {
          auVar149 = vsqrtps_avx(auVar10);
          auVar198._0_4_ = fVar320 + fVar320;
          auVar198._4_4_ = fVar322 + fVar322;
          auVar198._8_4_ = fVar324 + fVar324;
          auVar198._12_4_ = fVar326 + fVar326;
          auVar198._16_4_ = fVar334 + fVar334;
          auVar198._20_4_ = fVar335 + fVar335;
          auVar198._24_4_ = fVar336 + fVar336;
          auVar198._28_4_ = fVar204 + fVar204;
          auVar14 = vrcpps_avx(auVar198);
          fVar204 = auVar14._0_4_;
          fVar240 = auVar14._4_4_;
          auVar50._4_4_ = auVar198._4_4_ * fVar240;
          auVar50._0_4_ = auVar198._0_4_ * fVar204;
          fVar202 = auVar14._8_4_;
          auVar50._8_4_ = auVar198._8_4_ * fVar202;
          fVar224 = auVar14._12_4_;
          auVar50._12_4_ = auVar198._12_4_ * fVar224;
          fVar244 = auVar14._16_4_;
          auVar50._16_4_ = auVar198._16_4_ * fVar244;
          fVar246 = auVar14._20_4_;
          auVar50._20_4_ = auVar198._20_4_ * fVar246;
          fVar248 = auVar14._24_4_;
          auVar50._24_4_ = auVar198._24_4_ * fVar248;
          auVar50._28_4_ = auVar198._28_4_;
          auVar15 = vsubps_avx(auVar314,auVar50);
          fVar204 = fVar204 + fVar204 * auVar15._0_4_;
          fVar240 = fVar240 + fVar240 * auVar15._4_4_;
          fVar202 = fVar202 + fVar202 * auVar15._8_4_;
          fVar224 = fVar224 + fVar224 * auVar15._12_4_;
          fVar244 = fVar244 + fVar244 * auVar15._16_4_;
          fVar246 = fVar246 + fVar246 * auVar15._20_4_;
          fVar248 = fVar248 + fVar248 * auVar15._24_4_;
          fVar267 = auVar14._28_4_ + auVar15._28_4_;
          auVar234._0_8_ = local_2c0._0_8_ ^ 0x8000000080000000;
          auVar234._8_4_ = -local_2c0._8_4_;
          auVar234._12_4_ = -local_2c0._12_4_;
          auVar234._16_4_ = -local_2c0._16_4_;
          auVar234._20_4_ = -local_2c0._20_4_;
          auVar234._24_4_ = -local_2c0._24_4_;
          auVar234._28_4_ = -local_2c0._28_4_;
          auVar14 = vsubps_avx(auVar234,auVar149);
          fVar305 = auVar14._0_4_ * fVar204;
          fVar318 = auVar14._4_4_ * fVar240;
          auVar51._4_4_ = fVar318;
          auVar51._0_4_ = fVar305;
          fVar320 = auVar14._8_4_ * fVar202;
          auVar51._8_4_ = fVar320;
          fVar322 = auVar14._12_4_ * fVar224;
          auVar51._12_4_ = fVar322;
          fVar324 = auVar14._16_4_ * fVar244;
          auVar51._16_4_ = fVar324;
          fVar326 = auVar14._20_4_ * fVar246;
          auVar51._20_4_ = fVar326;
          fVar304 = auVar14._24_4_ * fVar248;
          auVar51._24_4_ = fVar304;
          auVar51._28_4_ = auVar114._28_4_;
          auVar292 = ZEXT3264(auVar51);
          auVar114 = vsubps_avx(auVar149,local_2c0);
          fVar204 = auVar114._0_4_ * fVar204;
          fVar240 = auVar114._4_4_ * fVar240;
          auVar52._4_4_ = fVar240;
          auVar52._0_4_ = fVar204;
          fVar202 = auVar114._8_4_ * fVar202;
          auVar52._8_4_ = fVar202;
          fVar224 = auVar114._12_4_ * fVar224;
          auVar52._12_4_ = fVar224;
          fVar244 = auVar114._16_4_ * fVar244;
          auVar52._16_4_ = fVar244;
          fVar246 = auVar114._20_4_ * fVar246;
          auVar52._20_4_ = fVar246;
          fVar248 = auVar114._24_4_ * fVar248;
          auVar52._24_4_ = fVar248;
          auVar52._28_4_ = 0x7f800000;
          auVar357 = ZEXT3264(auVar52);
          fVar268 = (fVar305 * (float)local_ac0._0_4_ + (float)local_9e0._0_4_) * fVar328;
          fVar276 = (fVar318 * (float)local_ac0._4_4_ + local_9e0._4_4_) * fVar330;
          fVar279 = (fVar320 * fStack_ab8 + local_9e0._8_4_) * fVar337;
          fVar288 = (fVar322 * fStack_ab4 + local_9e0._12_4_) * fVar338;
          fVar293 = (fVar324 * fStack_ab0 + local_9e0._16_4_) * fVar247;
          fVar300 = (fVar326 * fStack_aac + local_9e0._20_4_) * fVar249;
          fVar302 = (fVar304 * fStack_aa8 + local_9e0._24_4_) * fVar251;
          auVar150._0_4_ = fVar306 + fVar222 * fVar268;
          auVar150._4_4_ = fVar319 + fVar203 * fVar276;
          auVar150._8_4_ = fVar321 + fVar245 * fVar279;
          auVar150._12_4_ = fVar323 + fVar264 * fVar288;
          auVar150._16_4_ = fVar325 + fVar275 * fVar293;
          auVar150._20_4_ = fVar327 + fVar284 * fVar300;
          auVar150._24_4_ = fVar329 + fVar298 * fVar302;
          auVar150._28_4_ = fVar331 + auVar114._28_4_ + local_9e0._28_4_;
          auVar53._4_4_ = (float)local_840._4_4_ * fVar318;
          auVar53._0_4_ = (float)local_840._0_4_ * fVar305;
          auVar53._8_4_ = fStack_838 * fVar320;
          auVar53._12_4_ = fStack_834 * fVar322;
          auVar53._16_4_ = fStack_830 * fVar324;
          auVar53._20_4_ = fStack_82c * fVar326;
          auVar53._24_4_ = fStack_828 * fVar304;
          auVar53._28_4_ = fVar267;
          auVar149 = vsubps_avx(auVar53,auVar150);
          auVar3._4_4_ = fStack_93c;
          auVar3._0_4_ = local_940;
          auVar3._8_4_ = fStack_938;
          auVar3._12_4_ = fStack_934;
          auVar3._16_4_ = fStack_930;
          auVar3._20_4_ = fStack_92c;
          auVar3._24_4_ = fStack_928;
          auVar3._28_4_ = fStack_924;
          auVar199._0_4_ = local_940 + fVar225 * fVar268;
          auVar199._4_4_ = fStack_93c + fVar223 * fVar276;
          auVar199._8_4_ = fStack_938 + fVar241 * fVar279;
          auVar199._12_4_ = fStack_934 + fVar263 * fVar288;
          auVar199._16_4_ = fStack_930 + fVar271 * fVar293;
          auVar199._20_4_ = fStack_92c + fVar280 * fVar300;
          auVar199._24_4_ = fStack_928 + fVar294 * fVar302;
          auVar199._28_4_ = fStack_924 + fVar267;
          auVar54._4_4_ = (float)local_b00._4_4_ * fVar318;
          auVar54._0_4_ = (float)local_b00._0_4_ * fVar305;
          auVar54._8_4_ = fStack_af8 * fVar320;
          auVar54._12_4_ = fStack_af4 * fVar322;
          auVar54._16_4_ = fStack_af0 * fVar324;
          auVar54._20_4_ = fStack_aec * fVar326;
          auVar54._24_4_ = fStack_ae8 * fVar304;
          auVar54._28_4_ = fVar188;
          auVar15 = vsubps_avx(auVar54,auVar199);
          auVar235._0_4_ = fVar92 + fVar201 * fVar268;
          auVar235._4_4_ = fVar126 + fVar242 * fVar276;
          auVar235._8_4_ = fVar127 + fVar243 * fVar279;
          auVar235._12_4_ = fVar128 + fVar250 * fVar288;
          auVar235._16_4_ = fVar129 + fVar272 * fVar293;
          auVar235._20_4_ = fVar130 + fVar283 * fVar300;
          auVar235._24_4_ = fVar131 + fVar296 * fVar302;
          auVar235._28_4_ = fVar351 + auVar14._28_4_;
          auVar55._4_4_ = (float)local_920._4_4_ * fVar318;
          auVar55._0_4_ = (float)local_920._0_4_ * fVar305;
          auVar55._8_4_ = fStack_918 * fVar320;
          auVar55._12_4_ = fStack_914 * fVar322;
          auVar55._16_4_ = fStack_910 * fVar324;
          auVar55._20_4_ = fStack_90c * fVar326;
          auVar55._24_4_ = fStack_908 * fVar304;
          auVar55._28_4_ = fVar188;
          local_960 = vsubps_avx(auVar55,auVar235);
          fVar328 = (fVar204 * (float)local_ac0._0_4_ + (float)local_9e0._0_4_) * fVar328;
          fVar330 = (fVar240 * (float)local_ac0._4_4_ + local_9e0._4_4_) * fVar330;
          fVar337 = (fVar202 * fStack_ab8 + local_9e0._8_4_) * fVar337;
          fVar338 = (fVar224 * fStack_ab4 + local_9e0._12_4_) * fVar338;
          fVar247 = (fVar244 * fStack_ab0 + local_9e0._16_4_) * fVar247;
          fVar249 = (fVar246 * fStack_aac + local_9e0._20_4_) * fVar249;
          fVar251 = (fVar248 * fStack_aa8 + local_9e0._24_4_) * fVar251;
          auVar260._0_4_ = fVar306 + fVar222 * fVar328;
          auVar260._4_4_ = fVar319 + fVar203 * fVar330;
          auVar260._8_4_ = fVar321 + fVar245 * fVar337;
          auVar260._12_4_ = fVar323 + fVar264 * fVar338;
          auVar260._16_4_ = fVar325 + fVar275 * fVar247;
          auVar260._20_4_ = fVar327 + fVar284 * fVar249;
          auVar260._24_4_ = fVar329 + fVar298 * fVar251;
          auVar260._28_4_ = fVar331 + fVar188;
          auVar56._4_4_ = (float)local_840._4_4_ * fVar240;
          auVar56._0_4_ = (float)local_840._0_4_ * fVar204;
          auVar56._8_4_ = fStack_838 * fVar202;
          auVar56._12_4_ = fStack_834 * fVar224;
          auVar56._16_4_ = fStack_830 * fVar244;
          auVar56._20_4_ = fStack_82c * fVar246;
          auVar56._24_4_ = fStack_828 * fVar248;
          auVar56._28_4_ = fStack_824;
          _local_880 = vsubps_avx(auVar56,auVar260);
          auVar261._0_4_ = local_940 + fVar225 * fVar328;
          auVar261._4_4_ = fStack_93c + fVar223 * fVar330;
          auVar261._8_4_ = fStack_938 + fVar241 * fVar337;
          auVar261._12_4_ = fStack_934 + fVar263 * fVar338;
          auVar261._16_4_ = fStack_930 + fVar271 * fVar247;
          auVar261._20_4_ = fStack_92c + fVar280 * fVar249;
          auVar261._24_4_ = fStack_928 + fVar294 * fVar251;
          auVar261._28_4_ = fStack_924 + local_880._28_4_;
          auVar57._4_4_ = (float)local_b00._4_4_ * fVar240;
          auVar57._0_4_ = (float)local_b00._0_4_ * fVar204;
          auVar57._8_4_ = fStack_af8 * fVar202;
          auVar57._12_4_ = fStack_af4 * fVar224;
          auVar57._16_4_ = fStack_af0 * fVar244;
          auVar57._20_4_ = fStack_aec * fVar246;
          auVar57._24_4_ = fStack_ae8 * fVar248;
          auVar57._28_4_ = fStack_824;
          _local_760 = vsubps_avx(auVar57,auVar261);
          auVar236._0_4_ = fVar92 + fVar201 * fVar328;
          auVar236._4_4_ = fVar126 + fVar242 * fVar330;
          auVar236._8_4_ = fVar127 + fVar243 * fVar337;
          auVar236._12_4_ = fVar128 + fVar250 * fVar338;
          auVar236._16_4_ = fVar129 + fVar272 * fVar247;
          auVar236._20_4_ = fVar130 + fVar283 * fVar249;
          auVar236._24_4_ = fVar131 + fVar296 * fVar251;
          auVar236._28_4_ = fVar351 + local_960._28_4_ + local_9e0._28_4_;
          auVar58._4_4_ = (float)local_920._4_4_ * fVar240;
          auVar58._0_4_ = (float)local_920._0_4_ * fVar204;
          auVar58._8_4_ = fStack_918 * fVar202;
          auVar58._12_4_ = fStack_914 * fVar224;
          auVar58._16_4_ = fStack_910 * fVar244;
          auVar58._20_4_ = fStack_90c * fVar246;
          auVar58._24_4_ = fStack_908 * fVar248;
          auVar58._28_4_ = local_760._28_4_;
          _local_780 = vsubps_avx(auVar58,auVar236);
          auVar10 = vcmpps_avx(auVar10,auVar370,5);
          auVar219._8_4_ = 0x7f800000;
          auVar219._0_8_ = 0x7f8000007f800000;
          auVar219._12_4_ = 0x7f800000;
          auVar219._16_4_ = 0x7f800000;
          auVar219._20_4_ = 0x7f800000;
          auVar219._24_4_ = 0x7f800000;
          auVar219._28_4_ = 0x7f800000;
          auVar218 = vblendvps_avx(auVar219,auVar51,auVar10);
          auVar315._8_4_ = 0x7fffffff;
          auVar315._0_8_ = 0x7fffffff7fffffff;
          auVar315._12_4_ = 0x7fffffff;
          auVar315._16_4_ = 0x7fffffff;
          auVar315._20_4_ = 0x7fffffff;
          auVar315._24_4_ = 0x7fffffff;
          auVar315._28_4_ = 0x7fffffff;
          auVar114 = vandps_avx(auVar315,auVar30);
          auVar114 = vmaxps_avx(local_4a0,auVar114);
          auVar59._4_4_ = auVar114._4_4_ * 1.9073486e-06;
          auVar59._0_4_ = auVar114._0_4_ * 1.9073486e-06;
          auVar59._8_4_ = auVar114._8_4_ * 1.9073486e-06;
          auVar59._12_4_ = auVar114._12_4_ * 1.9073486e-06;
          auVar59._16_4_ = auVar114._16_4_ * 1.9073486e-06;
          auVar59._20_4_ = auVar114._20_4_ * 1.9073486e-06;
          auVar59._24_4_ = auVar114._24_4_ * 1.9073486e-06;
          auVar59._28_4_ = auVar114._28_4_;
          auVar114 = vandps_avx(auVar315,auVar16);
          auVar114 = vcmpps_avx(auVar114,auVar59,1);
          auVar237._8_4_ = 0xff800000;
          auVar237._0_8_ = 0xff800000ff800000;
          auVar237._12_4_ = 0xff800000;
          auVar237._16_4_ = 0xff800000;
          auVar237._20_4_ = 0xff800000;
          auVar237._24_4_ = 0xff800000;
          auVar237._28_4_ = 0xff800000;
          auVar233 = vblendvps_avx(auVar237,auVar52,auVar10);
          auVar14 = auVar10 & auVar114;
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0x7f,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0xbf,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar14[0x1f] < '\0') {
            auVar114 = vandps_avx(auVar114,auVar10);
            auVar138 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
            auVar147 = vcmpps_avx(auVar145,auVar370,2);
            auVar387._8_4_ = 0xff800000;
            auVar387._0_8_ = 0xff800000ff800000;
            auVar387._12_4_ = 0xff800000;
            auVar387._16_4_ = 0xff800000;
            auVar387._20_4_ = 0xff800000;
            auVar387._24_4_ = 0xff800000;
            auVar387._28_4_ = 0xff800000;
            auVar396._8_4_ = 0x7f800000;
            auVar396._0_8_ = 0x7f8000007f800000;
            auVar396._12_4_ = 0x7f800000;
            auVar396._16_4_ = 0x7f800000;
            auVar396._20_4_ = 0x7f800000;
            auVar396._24_4_ = 0x7f800000;
            auVar396._28_4_ = 0x7f800000;
            auVar109 = vblendvps_avx(auVar396,auVar387,auVar147);
            auVar102 = vpmovsxwd_avx(auVar138);
            auVar357 = ZEXT1664(auVar102);
            auVar138 = vpunpckhwd_avx(auVar138,auVar138);
            auVar317._16_16_ = auVar138;
            auVar317._0_16_ = auVar102;
            auVar218 = vblendvps_avx(auVar218,auVar109,auVar317);
            auVar109 = vblendvps_avx(auVar387,auVar396,auVar147);
            auVar233 = vblendvps_avx(auVar233,auVar109,auVar317);
            auVar145 = vcmpps_avx(auVar370,auVar370,0xf);
            auVar124._0_4_ = auVar145._0_4_ ^ auVar114._0_4_;
            auVar124._4_4_ = auVar145._4_4_ ^ auVar114._4_4_;
            auVar124._8_4_ = auVar145._8_4_ ^ auVar114._8_4_;
            auVar124._12_4_ = auVar145._12_4_ ^ auVar114._12_4_;
            auVar124._16_4_ = auVar145._16_4_ ^ auVar114._16_4_;
            auVar124._20_4_ = auVar145._20_4_ ^ auVar114._20_4_;
            auVar124._24_4_ = auVar145._24_4_ ^ auVar114._24_4_;
            auVar124._28_4_ = auVar145._28_4_ ^ auVar114._28_4_;
            auVar114 = vorps_avx(auVar147,auVar124);
            auVar147 = vandps_avx(auVar10,auVar114);
          }
          auVar344 = ZEXT3264(auVar109);
          auVar196 = auVar15._0_28_;
          auVar312 = local_960._0_28_;
          _local_ae0 = auVar149;
        }
        auVar340 = ZEXT3264(auVar12);
        auVar333 = ZEXT3264(auVar3);
        _local_340 = local_8a0;
        local_320 = vminps_avx(local_2e0,auVar218);
        auVar109 = vmaxps_avx(local_8a0,auVar233);
        _local_300 = auVar109;
        auVar114 = vcmpps_avx(local_8a0,local_320,2);
        local_680 = vandps_avx(auVar12,auVar114);
        auVar114 = vcmpps_avx(auVar109,local_2e0,2);
        local_720 = vandps_avx(auVar12,auVar114);
        auVar262 = ZEXT3264(local_720);
        auVar114 = vorps_avx(local_720,local_680);
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0x7f,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar114 >> 0xbf,0) != '\0') ||
            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar114[0x1f] < '\0') {
          local_a00 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_6e0._0_4_ = auVar147._0_4_ ^ local_a00._0_4_;
          local_6e0._4_4_ = auVar147._4_4_ ^ local_a00._4_4_;
          local_6e0._8_4_ = auVar147._8_4_ ^ local_a00._8_4_;
          local_6e0._12_4_ = auVar147._12_4_ ^ local_a00._12_4_;
          local_6e0._16_4_ = auVar147._16_4_ ^ local_a00._16_4_;
          local_6e0._20_4_ = auVar147._20_4_ ^ local_a00._20_4_;
          local_6e0._24_4_ = auVar147._24_4_ ^ local_a00._24_4_;
          local_6e0._28_4_ = (uint)auVar147._28_4_ ^ local_a00._28_4_;
          auVar292 = ZEXT3264(local_6e0);
          auVar113._0_4_ =
               auVar149._0_4_ * (float)local_840._0_4_ +
               (float)local_b00._0_4_ * auVar196._0_4_ + (float)local_920._0_4_ * auVar312._0_4_;
          auVar113._4_4_ =
               auVar149._4_4_ * (float)local_840._4_4_ +
               (float)local_b00._4_4_ * auVar196._4_4_ + (float)local_920._4_4_ * auVar312._4_4_;
          auVar113._8_4_ =
               auVar149._8_4_ * fStack_838 +
               fStack_af8 * auVar196._8_4_ + fStack_918 * auVar312._8_4_;
          auVar113._12_4_ =
               auVar149._12_4_ * fStack_834 +
               fStack_af4 * auVar196._12_4_ + fStack_914 * auVar312._12_4_;
          auVar113._16_4_ =
               auVar149._16_4_ * fStack_830 +
               fStack_af0 * auVar196._16_4_ + fStack_910 * auVar312._16_4_;
          auVar113._20_4_ =
               auVar149._20_4_ * fStack_82c +
               fStack_aec * auVar196._20_4_ + fStack_90c * auVar312._20_4_;
          auVar113._24_4_ =
               auVar149._24_4_ * fStack_828 +
               fStack_ae8 * auVar196._24_4_ + fStack_908 * auVar312._24_4_;
          auVar113._28_4_ = auVar147._28_4_ + auVar149._28_4_ + fStack_ae4;
          auVar151._8_4_ = 0x7fffffff;
          auVar151._0_8_ = 0x7fffffff7fffffff;
          auVar151._12_4_ = 0x7fffffff;
          auVar151._16_4_ = 0x7fffffff;
          auVar151._20_4_ = 0x7fffffff;
          auVar151._24_4_ = 0x7fffffff;
          auVar151._28_4_ = 0x7fffffff;
          auVar114 = vandps_avx(auVar113,auVar151);
          auVar152._8_4_ = 0x3e99999a;
          auVar152._0_8_ = 0x3e99999a3e99999a;
          auVar152._12_4_ = 0x3e99999a;
          auVar152._16_4_ = 0x3e99999a;
          auVar152._20_4_ = 0x3e99999a;
          auVar152._24_4_ = 0x3e99999a;
          auVar152._28_4_ = 0x3e99999a;
          auVar114 = vcmpps_avx(auVar114,auVar152,1);
          auVar114 = vorps_avx(auVar114,local_6e0);
          auVar153._8_4_ = 3;
          auVar153._0_8_ = 0x300000003;
          auVar153._12_4_ = 3;
          auVar153._16_4_ = 3;
          auVar153._20_4_ = 3;
          auVar153._24_4_ = 3;
          auVar153._28_4_ = 3;
          auVar179._8_4_ = 2;
          auVar179._0_8_ = 0x200000002;
          auVar179._12_4_ = 2;
          auVar179._16_4_ = 2;
          auVar179._20_4_ = 2;
          auVar179._24_4_ = 2;
          auVar179._28_4_ = 2;
          auVar114 = vblendvps_avx(auVar179,auVar153,auVar114);
          local_6c0 = ZEXT432((uint)uVar87);
          local_8c0 = vpshufd_avx(ZEXT416((uint)uVar87),0);
          auVar138 = vpcmpgtd_avx(auVar114._16_16_,local_8c0);
          auStack_8b0 = auVar13._16_16_;
          auVar102 = vpcmpgtd_avx(auVar114._0_16_,local_8c0);
          auVar154._16_16_ = auVar138;
          auVar154._0_16_ = auVar102;
          auVar114 = vblendps_avx(ZEXT1632(auVar102),auVar154,0xf0);
          local_700 = vandnps_avx(auVar114,local_680);
          auVar125 = ZEXT3264(local_700);
          auVar12 = local_680 & ~auVar114;
          auVar221 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auStack_738 = auVar110._8_24_;
          local_740 = uVar87;
          fVar204 = (float)local_b00._0_4_;
          fVar225 = (float)local_b00._4_4_;
          fVar201 = fStack_af8;
          fVar222 = fStack_af4;
          fVar240 = fStack_af0;
          fVar202 = fStack_aec;
          fVar223 = fStack_ae8;
          local_6a0 = auVar114;
          if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0x7f,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0xbf,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar12[0x1f] < '\0') {
            local_860._4_4_ = local_8a0._4_4_ + (float)local_9a0._4_4_;
            local_860._0_4_ = local_8a0._0_4_ + (float)local_9a0._0_4_;
            fStack_858 = local_8a0._8_4_ + fStack_998;
            fStack_854 = local_8a0._12_4_ + fStack_994;
            fStack_850 = local_8a0._16_4_ + fStack_990;
            fStack_84c = local_8a0._20_4_ + fStack_98c;
            fStack_848 = local_8a0._24_4_ + fStack_988;
            fStack_844 = local_8a0._28_4_ + fStack_984;
            local_a80 = local_720;
            do {
              auVar209 = auVar221._0_16_;
              auVar155._8_4_ = 0x7f800000;
              auVar155._0_8_ = 0x7f8000007f800000;
              auVar155._12_4_ = 0x7f800000;
              auVar155._16_4_ = 0x7f800000;
              auVar155._20_4_ = 0x7f800000;
              auVar155._24_4_ = 0x7f800000;
              auVar155._28_4_ = 0x7f800000;
              auVar114 = auVar125._0_32_;
              auVar12 = vblendvps_avx(auVar155,local_8a0,auVar114);
              auVar147 = vshufps_avx(auVar12,auVar12,0xb1);
              auVar147 = vminps_avx(auVar12,auVar147);
              auVar145 = vshufpd_avx(auVar147,auVar147,5);
              auVar147 = vminps_avx(auVar147,auVar145);
              auVar145 = vperm2f128_avx(auVar147,auVar147,1);
              auVar147 = vminps_avx(auVar147,auVar145);
              auVar12 = vcmpps_avx(auVar12,auVar147,0);
              auVar147 = auVar114 & auVar12;
              if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar147 >> 0x7f,0) != '\0') ||
                    (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar147 >> 0xbf,0) != '\0') ||
                  (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar147[0x1f] < '\0') {
                auVar114 = vandps_avx(auVar12,auVar114);
              }
              local_820._0_8_ = uVar90;
              uVar83 = vmovmskps_avx(auVar114);
              uVar88 = 0;
              if (uVar83 != 0) {
                for (; (uVar83 >> uVar88 & 1) == 0; uVar88 = uVar88 + 1) {
                }
              }
              uVar87 = (ulong)uVar88;
              *(undefined4 *)(local_700 + uVar87 * 4) = 0;
              fVar204 = local_640[uVar87];
              uVar88 = *(uint *)(local_340 + uVar87 * 4);
              fVar225 = auVar135._0_4_;
              if ((float)local_980._0_4_ < 0.0) {
                fVar225 = sqrtf((float)local_980._0_4_);
                auVar209._8_4_ = 0x7fffffff;
                auVar209._0_8_ = 0x7fffffff7fffffff;
                auVar209._12_4_ = 0x7fffffff;
              }
              auVar344 = ZEXT464(uVar88);
              auVar333 = ZEXT464((uint)fVar204);
              auVar102 = vminps_avx(_local_b10,_local_b30);
              auVar138 = vmaxps_avx(_local_b10,_local_b30);
              auVar97 = vminps_avx(_local_b20,_local_b40);
              auVar104 = vminps_avx(auVar102,auVar97);
              auVar102 = vmaxps_avx(_local_b20,_local_b40);
              auVar97 = vmaxps_avx(auVar138,auVar102);
              auVar138 = vandps_avx(auVar104,auVar209);
              auVar102 = vandps_avx(auVar97,auVar209);
              auVar138 = vmaxps_avx(auVar138,auVar102);
              auVar102 = vmovshdup_avx(auVar138);
              auVar102 = vmaxss_avx(auVar102,auVar138);
              auVar138 = vshufpd_avx(auVar138,auVar138,1);
              auVar138 = vmaxss_avx(auVar138,auVar102);
              local_940 = auVar138._0_4_ * 1.9073486e-06;
              local_7a0._0_4_ = fVar225 * 1.9073486e-06;
              _local_800 = vshufps_avx(auVar97,auVar97,0xff);
              lVar91 = 5;
              do {
                fVar242 = auVar333._0_4_;
                fVar222 = 1.0 - fVar242;
                fVar204 = fVar222 * fVar222 * fVar222;
                fVar225 = fVar242 * fVar242 * fVar242;
                fVar201 = fVar242 * fVar222;
                auVar138 = vshufps_avx(ZEXT416((uint)(fVar225 * 0.16666667)),
                                       ZEXT416((uint)(fVar225 * 0.16666667)),0);
                auVar102 = ZEXT416((uint)((fVar225 * 4.0 + fVar204 +
                                          fVar242 * fVar201 * 12.0 + fVar222 * fVar201 * 6.0) *
                                         0.16666667));
                auVar102 = vshufps_avx(auVar102,auVar102,0);
                auVar97 = ZEXT416((uint)((fVar204 * 4.0 + fVar225 +
                                         fVar222 * fVar201 * 12.0 + fVar242 * fVar201 * 6.0) *
                                        0.16666667));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar104 = vshufps_avx(auVar344._0_16_,auVar344._0_16_,0);
                auVar170._0_4_ = auVar104._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar170._4_4_ = auVar104._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar170._8_4_ = auVar104._8_4_ * fStack_968 + 0.0;
                auVar170._12_4_ = auVar104._12_4_ * fStack_964 + 0.0;
                auVar104 = vshufps_avx(ZEXT416((uint)(fVar204 * 0.16666667)),
                                       ZEXT416((uint)(fVar204 * 0.16666667)),0);
                auVar95._0_4_ =
                     auVar104._0_4_ * (float)local_b10._0_4_ +
                     auVar97._0_4_ * (float)local_b30._0_4_ +
                     auVar138._0_4_ * (float)local_b40._0_4_ +
                     auVar102._0_4_ * (float)local_b20._0_4_;
                auVar95._4_4_ =
                     auVar104._4_4_ * (float)local_b10._4_4_ +
                     auVar97._4_4_ * (float)local_b30._4_4_ +
                     auVar138._4_4_ * (float)local_b40._4_4_ +
                     auVar102._4_4_ * (float)local_b20._4_4_;
                auVar95._8_4_ =
                     auVar104._8_4_ * fStack_b08 +
                     auVar97._8_4_ * fStack_b28 +
                     auVar138._8_4_ * fStack_b38 + auVar102._8_4_ * fStack_b18;
                auVar95._12_4_ =
                     auVar104._12_4_ * fStack_b04 +
                     auVar97._12_4_ * fStack_b24 +
                     auVar138._12_4_ * fStack_b34 + auVar102._12_4_ * fStack_b14;
                local_960._0_16_ = auVar95;
                auVar138 = vsubps_avx(auVar170,auVar95);
                _local_ae0 = auVar138;
                auVar138 = vdpps_avx(auVar138,auVar138,0x7f);
                fVar203 = auVar138._0_4_;
                if (fVar203 < 0.0) {
                  local_aa0._0_4_ = fVar201;
                  fVar204 = sqrtf(fVar203);
                  fVar201 = (float)local_aa0._0_4_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar138,auVar138);
                  fVar204 = auVar102._0_4_;
                }
                auVar102 = ZEXT416((uint)(fVar242 * fVar242 * 0.5));
                auVar102 = vshufps_avx(auVar102,auVar102,0);
                auVar97 = ZEXT416((uint)((fVar222 * fVar222 + fVar201 * 4.0) * 0.5));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar104 = ZEXT416((uint)((fVar242 * -fVar242 - fVar201 * 4.0) * 0.5));
                auVar104 = vshufps_avx(auVar104,auVar104,0);
                auVar96 = ZEXT416((uint)(fVar222 * -fVar222 * 0.5));
                auVar96 = vshufps_avx(auVar96,auVar96,0);
                auVar310._0_4_ =
                     (float)local_b10._0_4_ * auVar96._0_4_ +
                     (float)local_b30._0_4_ * auVar104._0_4_ +
                     (float)local_b40._0_4_ * auVar102._0_4_ +
                     (float)local_b20._0_4_ * auVar97._0_4_;
                auVar310._4_4_ =
                     (float)local_b10._4_4_ * auVar96._4_4_ +
                     (float)local_b30._4_4_ * auVar104._4_4_ +
                     (float)local_b40._4_4_ * auVar102._4_4_ +
                     (float)local_b20._4_4_ * auVar97._4_4_;
                auVar310._8_4_ =
                     fStack_b08 * auVar96._8_4_ +
                     fStack_b28 * auVar104._8_4_ +
                     fStack_b38 * auVar102._8_4_ + fStack_b18 * auVar97._8_4_;
                auVar310._12_4_ =
                     fStack_b04 * auVar96._12_4_ +
                     fStack_b24 * auVar104._12_4_ +
                     fStack_b34 * auVar102._12_4_ + fStack_b14 * auVar97._12_4_;
                auVar102 = vshufps_avx(auVar333._0_16_,auVar333._0_16_,0);
                auVar97 = ZEXT416((uint)(fVar222 - (fVar242 + fVar242)));
                auVar104 = vshufps_avx(auVar97,auVar97,0);
                auVar97 = ZEXT416((uint)(fVar242 - (fVar222 + fVar222)));
                auVar96 = vshufps_avx(auVar97,auVar97,0);
                auVar103 = vshufps_avx(ZEXT416((uint)fVar222),ZEXT416((uint)fVar222),0);
                auVar97 = vdpps_avx(auVar310,auVar310,0x7f);
                auVar136._0_4_ =
                     (float)local_b10._0_4_ * auVar103._0_4_ +
                     (float)local_b30._0_4_ * auVar96._0_4_ +
                     (float)local_b40._0_4_ * auVar102._0_4_ +
                     (float)local_b20._0_4_ * auVar104._0_4_;
                auVar136._4_4_ =
                     (float)local_b10._4_4_ * auVar103._4_4_ +
                     (float)local_b30._4_4_ * auVar96._4_4_ +
                     (float)local_b40._4_4_ * auVar102._4_4_ +
                     (float)local_b20._4_4_ * auVar104._4_4_;
                auVar136._8_4_ =
                     fStack_b08 * auVar103._8_4_ +
                     fStack_b28 * auVar96._8_4_ +
                     fStack_b38 * auVar102._8_4_ + fStack_b18 * auVar104._8_4_;
                auVar136._12_4_ =
                     fStack_b04 * auVar103._12_4_ +
                     fStack_b24 * auVar96._12_4_ +
                     fStack_b34 * auVar102._12_4_ + fStack_b14 * auVar104._12_4_;
                auVar102 = vblendps_avx(auVar97,_DAT_01feba10,0xe);
                auVar104 = vrsqrtss_avx(auVar102,auVar102);
                fVar201 = auVar104._0_4_;
                fVar225 = auVar97._0_4_;
                auVar104 = vdpps_avx(auVar310,auVar136,0x7f);
                auVar96 = vshufps_avx(auVar97,auVar97,0);
                auVar137._0_4_ = auVar136._0_4_ * auVar96._0_4_;
                auVar137._4_4_ = auVar136._4_4_ * auVar96._4_4_;
                auVar137._8_4_ = auVar136._8_4_ * auVar96._8_4_;
                auVar137._12_4_ = auVar136._12_4_ * auVar96._12_4_;
                auVar104 = vshufps_avx(auVar104,auVar104,0);
                auVar210._0_4_ = auVar310._0_4_ * auVar104._0_4_;
                auVar210._4_4_ = auVar310._4_4_ * auVar104._4_4_;
                auVar210._8_4_ = auVar310._8_4_ * auVar104._8_4_;
                auVar210._12_4_ = auVar310._12_4_ * auVar104._12_4_;
                auVar103 = vsubps_avx(auVar137,auVar210);
                auVar104 = vrcpss_avx(auVar102,auVar102);
                auVar102 = vmaxss_avx(ZEXT416((uint)local_940),
                                      ZEXT416((uint)(auVar344._0_4_ * (float)local_7a0._0_4_)));
                auVar357 = ZEXT1664(auVar102);
                auVar104 = ZEXT416((uint)(auVar104._0_4_ * (2.0 - fVar225 * auVar104._0_4_)));
                auVar104 = vshufps_avx(auVar104,auVar104,0);
                uVar87 = CONCAT44(auVar310._4_4_,auVar310._0_4_);
                auVar229._0_8_ = uVar87 ^ 0x8000000080000000;
                auVar229._8_4_ = -auVar310._8_4_;
                auVar229._12_4_ = -auVar310._12_4_;
                auVar96 = ZEXT416((uint)(fVar201 * 1.5 +
                                        fVar225 * -0.5 * fVar201 * fVar201 * fVar201));
                auVar96 = vshufps_avx(auVar96,auVar96,0);
                auVar192._0_4_ = auVar96._0_4_ * auVar103._0_4_ * auVar104._0_4_;
                auVar192._4_4_ = auVar96._4_4_ * auVar103._4_4_ * auVar104._4_4_;
                auVar192._8_4_ = auVar96._8_4_ * auVar103._8_4_ * auVar104._8_4_;
                auVar192._12_4_ = auVar96._12_4_ * auVar103._12_4_ * auVar104._12_4_;
                auVar255._0_4_ = auVar310._0_4_ * auVar96._0_4_;
                auVar255._4_4_ = auVar310._4_4_ * auVar96._4_4_;
                auVar255._8_4_ = auVar310._8_4_ * auVar96._8_4_;
                auVar255._12_4_ = auVar310._12_4_ * auVar96._12_4_;
                if (fVar225 < 0.0) {
                  local_aa0._0_16_ = auVar229;
                  local_9c0._0_16_ = auVar255;
                  _local_ac0 = auVar192;
                  fVar225 = sqrtf(fVar225);
                  auVar357 = ZEXT464(auVar102._0_4_);
                  auVar192 = _local_ac0;
                  auVar229 = local_aa0._0_16_;
                  auVar255 = local_9c0._0_16_;
                }
                else {
                  auVar97 = vsqrtss_avx(auVar97,auVar97);
                  fVar225 = auVar97._0_4_;
                }
                auVar97 = vdpps_avx(_local_ae0,auVar255,0x7f);
                fVar224 = (local_940 / fVar225) * (fVar204 + 1.0) +
                          auVar357._0_4_ + fVar204 * local_940;
                auVar104 = vdpps_avx(auVar229,auVar255,0x7f);
                auVar96 = vdpps_avx(_local_ae0,auVar192,0x7f);
                auVar103 = vdpps_avx(_local_970,auVar255,0x7f);
                auVar134 = vdpps_avx(_local_ae0,auVar229,0x7f);
                fVar204 = auVar104._0_4_ + auVar96._0_4_;
                fVar225 = auVar97._0_4_;
                auVar98._0_4_ = fVar225 * fVar225;
                auVar98._4_4_ = auVar97._4_4_ * auVar97._4_4_;
                auVar98._8_4_ = auVar97._8_4_ * auVar97._8_4_;
                auVar98._12_4_ = auVar97._12_4_ * auVar97._12_4_;
                auVar96 = vsubps_avx(auVar138,auVar98);
                auVar104 = vdpps_avx(_local_ae0,_local_970,0x7f);
                fVar201 = auVar134._0_4_ - fVar225 * fVar204;
                fVar222 = auVar104._0_4_ - fVar225 * auVar103._0_4_;
                auVar104 = vrsqrtss_avx(auVar96,auVar96);
                fVar240 = auVar96._0_4_;
                fVar225 = auVar104._0_4_;
                fVar225 = fVar225 * 1.5 + fVar240 * -0.5 * fVar225 * fVar225 * fVar225;
                if (fVar240 < 0.0) {
                  local_aa0._0_16_ = auVar97;
                  local_9c0._0_4_ = fVar224;
                  local_9e0._0_4_ = fVar201;
                  local_7c0._0_4_ = fVar222;
                  local_7e0._0_4_ = fVar225;
                  _local_ac0 = auVar103;
                  fVar240 = sqrtf(fVar240);
                  auVar357 = ZEXT464(auVar102._0_4_);
                  fVar225 = (float)local_7e0._0_4_;
                  fVar201 = (float)local_9e0._0_4_;
                  fVar222 = (float)local_7c0._0_4_;
                  auVar103 = _local_ac0;
                  auVar97 = local_aa0._0_16_;
                  fVar224 = (float)local_9c0._0_4_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar96,auVar96);
                  fVar240 = auVar102._0_4_;
                }
                auVar292 = ZEXT1664(auVar138);
                auVar340 = ZEXT3264(_local_920);
                auVar96 = vpermilps_avx(local_960._0_16_,0xff);
                auVar134 = vshufps_avx(auVar310,auVar310,0xff);
                fVar201 = fVar201 * fVar225 - auVar134._0_4_;
                auVar211._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
                auVar211._8_4_ = auVar103._8_4_ ^ 0x80000000;
                auVar211._12_4_ = auVar103._12_4_ ^ 0x80000000;
                auVar230._0_4_ = -fVar201;
                auVar230._4_4_ = 0x80000000;
                auVar230._8_4_ = 0x80000000;
                auVar230._12_4_ = 0x80000000;
                auVar102 = vinsertps_avx(ZEXT416((uint)(fVar222 * fVar225)),auVar211,0x10);
                auVar104 = vmovsldup_avx(ZEXT416((uint)(fVar204 * fVar222 * fVar225 -
                                                       auVar103._0_4_ * fVar201)));
                auVar102 = vdivps_avx(auVar102,auVar104);
                auVar103 = ZEXT416((uint)(fVar240 - auVar96._0_4_));
                auVar96 = vinsertps_avx(auVar97,auVar103,0x10);
                auVar193._0_4_ = auVar96._0_4_ * auVar102._0_4_;
                auVar193._4_4_ = auVar96._4_4_ * auVar102._4_4_;
                auVar193._8_4_ = auVar96._8_4_ * auVar102._8_4_;
                auVar193._12_4_ = auVar96._12_4_ * auVar102._12_4_;
                auVar102 = vinsertps_avx(auVar230,ZEXT416((uint)fVar204),0x1c);
                auVar102 = vdivps_avx(auVar102,auVar104);
                auVar104 = vhaddps_avx(auVar193,auVar193);
                auVar171._0_4_ = auVar96._0_4_ * auVar102._0_4_;
                auVar171._4_4_ = auVar96._4_4_ * auVar102._4_4_;
                auVar171._8_4_ = auVar96._8_4_ * auVar102._8_4_;
                auVar171._12_4_ = auVar96._12_4_ * auVar102._12_4_;
                auVar102 = vhaddps_avx(auVar171,auVar171);
                fVar242 = fVar242 - auVar104._0_4_;
                fVar244 = auVar344._0_4_ - auVar102._0_4_;
                auVar212._8_4_ = 0x7fffffff;
                auVar212._0_8_ = 0x7fffffff7fffffff;
                auVar212._12_4_ = 0x7fffffff;
                auVar221 = ZEXT1664(auVar212);
                auVar102 = vandps_avx(auVar97,auVar212);
                bVar60 = true;
                auVar395 = local_920._0_28_;
                fVar204 = (float)local_b00._0_4_;
                fVar225 = (float)local_b00._4_4_;
                fVar201 = fStack_af8;
                fVar222 = fStack_af4;
                fVar240 = fStack_af0;
                fVar202 = fStack_aec;
                fVar223 = fStack_ae8;
                if (fVar224 <= auVar102._0_4_) {
LAB_00ef9cbb:
                  auVar262 = ZEXT3264(local_a80);
                  auVar344 = ZEXT464((uint)fVar244);
                }
                else {
                  auVar102 = vandps_avx(auVar103,auVar212);
                  auVar262 = ZEXT3264(local_a80);
                  if ((float)local_800._0_4_ * 1.9073486e-06 + auVar357._0_4_ + fVar224 <=
                      auVar102._0_4_) goto LAB_00ef9cbb;
                  fVar244 = fVar244 + (float)local_900._0_4_;
                  if (fVar244 < fVar189) {
                    bVar60 = false;
                    unaff_BL = 0;
                    goto LAB_00ef9cbb;
                  }
                  fVar224 = *(float *)(ray + k * 4 + 0x100);
                  auVar357 = ZEXT464((uint)fVar224);
                  auVar102 = ZEXT416((uint)fVar244);
                  bVar60 = false;
                  if (fVar244 <= fVar224) {
                    auVar344 = ZEXT1664(auVar102);
                    if ((fVar242 < 0.0) || (1.0 < fVar242)) {
                      unaff_BL = 0;
                    }
                    else {
                      auVar138 = vrsqrtss_avx(auVar138,auVar138);
                      fVar241 = auVar138._0_4_;
                      pGVar5 = (context->scene->geometries).items[uVar86].ptr;
                      if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        unaff_BL = 0;
                      }
                      else {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar138 = ZEXT416((uint)(fVar241 * 1.5 +
                                                   fVar203 * -0.5 * fVar241 * fVar241 * fVar241));
                          auVar138 = vshufps_avx(auVar138,auVar138,0);
                          auVar139._0_4_ = auVar138._0_4_ * (float)local_ae0._0_4_;
                          auVar139._4_4_ = auVar138._4_4_ * (float)local_ae0._4_4_;
                          auVar139._8_4_ = auVar138._8_4_ * fStack_ad8;
                          auVar139._12_4_ = auVar138._12_4_ * fStack_ad4;
                          auVar292 = ZEXT1664(auVar310);
                          auVar99._0_4_ = auVar310._0_4_ + auVar134._0_4_ * auVar139._0_4_;
                          auVar99._4_4_ = auVar310._4_4_ + auVar134._4_4_ * auVar139._4_4_;
                          auVar99._8_4_ = auVar310._8_4_ + auVar134._8_4_ * auVar139._8_4_;
                          auVar99._12_4_ = auVar310._12_4_ + auVar134._12_4_ * auVar139._12_4_;
                          auVar138 = vshufps_avx(auVar139,auVar139,0xc9);
                          auVar97 = vshufps_avx(auVar310,auVar310,0xc9);
                          auVar140._0_4_ = auVar97._0_4_ * auVar139._0_4_;
                          auVar140._4_4_ = auVar97._4_4_ * auVar139._4_4_;
                          auVar140._8_4_ = auVar97._8_4_ * auVar139._8_4_;
                          auVar140._12_4_ = auVar97._12_4_ * auVar139._12_4_;
                          auVar172._0_4_ = auVar310._0_4_ * auVar138._0_4_;
                          auVar172._4_4_ = auVar310._4_4_ * auVar138._4_4_;
                          auVar172._8_4_ = auVar310._8_4_ * auVar138._8_4_;
                          auVar172._12_4_ = auVar310._12_4_ * auVar138._12_4_;
                          auVar104 = vsubps_avx(auVar172,auVar140);
                          auVar138 = vshufps_avx(auVar104,auVar104,0xc9);
                          auVar97 = vshufps_avx(auVar99,auVar99,0xc9);
                          auVar173._0_4_ = auVar97._0_4_ * auVar138._0_4_;
                          auVar173._4_4_ = auVar97._4_4_ * auVar138._4_4_;
                          auVar173._8_4_ = auVar97._8_4_ * auVar138._8_4_;
                          auVar173._12_4_ = auVar97._12_4_ * auVar138._12_4_;
                          auVar138 = vshufps_avx(auVar104,auVar104,0xd2);
                          auVar100._0_4_ = auVar99._0_4_ * auVar138._0_4_;
                          auVar100._4_4_ = auVar99._4_4_ * auVar138._4_4_;
                          auVar100._8_4_ = auVar99._8_4_ * auVar138._8_4_;
                          auVar100._12_4_ = auVar99._12_4_ * auVar138._12_4_;
                          auVar138 = vsubps_avx(auVar173,auVar100);
                          pRVar6 = context->user;
                          local_590 = vshufps_avx(ZEXT416((uint)fVar242),ZEXT416((uint)fVar242),0);
                          auStack_5f0 = vshufps_avx(auVar138,auVar138,0x55);
                          local_5d0 = vshufps_avx(auVar138,auVar138,0xaa);
                          local_5b0 = vshufps_avx(auVar138,auVar138,0);
                          local_600 = (RTCHitN  [16])auStack_5f0;
                          local_5e0 = local_5d0;
                          local_5c0 = local_5b0;
                          local_5a0 = local_590;
                          local_580 = ZEXT832(0) << 0x20;
                          local_560 = local_4e0._0_8_;
                          uStack_558 = local_4e0._8_8_;
                          uStack_550 = local_4e0._16_8_;
                          uStack_548 = local_4e0._24_8_;
                          local_540 = local_4c0._0_8_;
                          uStack_538 = local_4c0._8_8_;
                          uStack_530 = local_4c0._16_8_;
                          uStack_528 = local_4c0._24_8_;
                          local_a38[1] = local_a00;
                          *local_a38 = local_a00;
                          local_520 = pRVar6->instID[0];
                          uStack_51c = local_520;
                          uStack_518 = local_520;
                          uStack_514 = local_520;
                          uStack_510 = local_520;
                          uStack_50c = local_520;
                          uStack_508 = local_520;
                          uStack_504 = local_520;
                          local_500 = pRVar6->instPrimID[0];
                          uStack_4fc = local_500;
                          uStack_4f8 = local_500;
                          uStack_4f4 = local_500;
                          uStack_4f0 = local_500;
                          uStack_4ec = local_500;
                          uStack_4e8 = local_500;
                          uStack_4e4 = local_500;
                          *(float *)(ray + k * 4 + 0x100) = fVar244;
                          local_b60 = *local_a40;
                          uStack_b58 = local_a40[1];
                          local_b50 = *local_a48;
                          uStack_b48 = local_a48[1];
                          local_a30.valid = (int *)&local_b60;
                          local_a30.geometryUserPtr = pGVar5->userPtr;
                          local_a30.context = context->user;
                          local_a30.hit = local_600;
                          local_a30.N = 8;
                          local_a30.ray = (RTCRayN *)ray;
                          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar292 = ZEXT1664(auVar310);
                            auVar340 = ZEXT1664(local_920._0_16_);
                            (*pGVar5->occlusionFilterN)(&local_a30);
                            auVar262 = ZEXT3264(local_a80);
                            auVar395 = local_920._0_28_;
                            auVar221 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar72._8_8_ = uStack_b58;
                          auVar72._0_8_ = local_b60;
                          auVar138 = vpcmpeqd_avx((undefined1  [16])0x0,auVar72);
                          auVar76._8_8_ = uStack_b48;
                          auVar76._0_8_ = local_b50;
                          auVar97 = vpcmpeqd_avx((undefined1  [16])0x0,auVar76);
                          auVar115._16_16_ = auVar97;
                          auVar115._0_16_ = auVar138;
                          auVar114 = local_a00 & ~auVar115;
                          fVar204 = (float)local_b00._0_4_;
                          fVar225 = (float)local_b00._4_4_;
                          fVar201 = fStack_af8;
                          fVar222 = fStack_af4;
                          fVar240 = fStack_af0;
                          fVar202 = fStack_aec;
                          fVar223 = fStack_ae8;
                          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar114 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar114 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar114 >> 0x7f,0) == '\0') &&
                                (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar114 >> 0xbf,0) == '\0') &&
                              (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar114[0x1f]) {
                            auVar116._0_4_ = auVar138._0_4_ ^ local_a00._0_4_;
                            auVar116._4_4_ = auVar138._4_4_ ^ local_a00._4_4_;
                            auVar116._8_4_ = auVar138._8_4_ ^ local_a00._8_4_;
                            auVar116._12_4_ = auVar138._12_4_ ^ local_a00._12_4_;
                            auVar116._16_4_ = auVar97._0_4_ ^ local_a00._16_4_;
                            auVar116._20_4_ = auVar97._4_4_ ^ local_a00._20_4_;
                            auVar116._24_4_ = auVar97._8_4_ ^ local_a00._24_4_;
                            auVar116._28_4_ = auVar97._12_4_ ^ local_a00._28_4_;
                          }
                          else {
                            p_Var7 = context->args->filter;
                            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar292 = ZEXT1664(auVar292._0_16_);
                              auVar340 = ZEXT1664(auVar340._0_16_);
                              (*p_Var7)(&local_a30);
                              auVar262 = ZEXT3264(local_a80);
                              auVar395 = local_920._0_28_;
                              auVar221 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                              fVar204 = (float)local_b00._0_4_;
                              fVar225 = (float)local_b00._4_4_;
                              fVar201 = fStack_af8;
                              fVar222 = fStack_af4;
                              fVar240 = fStack_af0;
                              fVar202 = fStack_aec;
                              fVar223 = fStack_ae8;
                            }
                            auVar73._8_8_ = uStack_b58;
                            auVar73._0_8_ = local_b60;
                            auVar138 = vpcmpeqd_avx((undefined1  [16])0x0,auVar73);
                            auVar77._8_8_ = uStack_b48;
                            auVar77._0_8_ = local_b50;
                            auVar97 = vpcmpeqd_avx((undefined1  [16])0x0,auVar77);
                            auVar156._16_16_ = auVar97;
                            auVar156._0_16_ = auVar138;
                            auVar116._0_4_ = auVar138._0_4_ ^ local_a00._0_4_;
                            auVar116._4_4_ = auVar138._4_4_ ^ local_a00._4_4_;
                            auVar116._8_4_ = auVar138._8_4_ ^ local_a00._8_4_;
                            auVar116._12_4_ = auVar138._12_4_ ^ local_a00._12_4_;
                            auVar116._16_4_ = auVar97._0_4_ ^ local_a00._16_4_;
                            auVar116._20_4_ = auVar97._4_4_ ^ local_a00._20_4_;
                            auVar116._24_4_ = auVar97._8_4_ ^ local_a00._24_4_;
                            auVar116._28_4_ = auVar97._12_4_ ^ local_a00._28_4_;
                            auVar180._8_4_ = 0xff800000;
                            auVar180._0_8_ = 0xff800000ff800000;
                            auVar180._12_4_ = 0xff800000;
                            auVar180._16_4_ = 0xff800000;
                            auVar180._20_4_ = 0xff800000;
                            auVar180._24_4_ = 0xff800000;
                            auVar180._28_4_ = 0xff800000;
                            auVar114 = vblendvps_avx(auVar180,*(undefined1 (*) [32])
                                                               (local_a30.ray + 0x100),auVar156);
                            *(undefined1 (*) [32])(local_a30.ray + 0x100) = auVar114;
                          }
                          auVar344 = ZEXT1664(auVar102);
                          auVar357 = ZEXT464((uint)fVar224);
                          bVar67 = (auVar116 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar68 = (auVar116 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar66 = (auVar116 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar65 = SUB321(auVar116 >> 0x7f,0) != '\0';
                          bVar64 = (auVar116 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar63 = SUB321(auVar116 >> 0xbf,0) != '\0';
                          bVar61 = (auVar116 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar60 = auVar116[0x1f] < '\0';
                          unaff_BL = ((((((bVar67 || bVar68) || bVar66) || bVar65) || bVar64) ||
                                      bVar63) || bVar61) || bVar60;
                          if (((((((!bVar67 && !bVar68) && !bVar66) && !bVar65) && !bVar64) &&
                               !bVar63) && !bVar61) && !bVar60) {
                            *(float *)(ray + k * 4 + 0x100) = fVar224;
                          }
                          bVar60 = false;
                          goto LAB_00ef9cc0;
                        }
                        unaff_BL = 1;
                      }
                      bVar60 = false;
                    }
                  }
                  else {
                    unaff_BL = 0;
                    auVar344 = ZEXT1664(auVar102);
                  }
                }
LAB_00ef9cc0:
                auVar333 = ZEXT464((uint)fVar242);
                if (!bVar60) goto LAB_00efa0d3;
                lVar91 = lVar91 + -1;
              } while (lVar91 != 0);
              unaff_BL = 0;
              auVar262 = ZEXT3264(local_a80);
              fVar204 = (float)local_b00._0_4_;
              fVar225 = (float)local_b00._4_4_;
              fVar201 = fStack_af8;
              fVar222 = fStack_af4;
              fVar240 = fStack_af0;
              fVar202 = fStack_aec;
              fVar223 = fStack_ae8;
LAB_00efa0d3:
              unaff_BL = unaff_BL & 1;
              uVar90 = CONCAT71(local_820._1_7_,local_820[0] | unaff_BL);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar117._4_4_ = uVar1;
              auVar117._0_4_ = uVar1;
              auVar117._8_4_ = uVar1;
              auVar117._12_4_ = uVar1;
              auVar117._16_4_ = uVar1;
              auVar117._20_4_ = uVar1;
              auVar117._24_4_ = uVar1;
              auVar117._28_4_ = uVar1;
              auVar114 = vcmpps_avx(_local_860,auVar117,2);
              auVar12 = vandps_avx(auVar114,local_700);
              auVar125 = ZEXT3264(auVar12);
              auVar147 = local_700 & auVar114;
              uVar87 = local_740;
              local_700 = auVar12;
            } while ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar147 >> 0x7f,0) != '\0') ||
                       (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar147 >> 0xbf,0) != '\0') ||
                     (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar147[0x1f] < '\0');
          }
          auVar118._0_4_ =
               (float)local_880._0_4_ * (float)local_840._0_4_ +
               fVar204 * (float)local_760._0_4_ + auVar395._0_4_ * (float)local_780._0_4_;
          auVar118._4_4_ =
               (float)local_880._4_4_ * (float)local_840._4_4_ +
               fVar225 * (float)local_760._4_4_ + auVar395._4_4_ * (float)local_780._4_4_;
          auVar118._8_4_ =
               fStack_878 * fStack_838 + fVar201 * fStack_758 + auVar395._8_4_ * fStack_778;
          auVar118._12_4_ =
               fStack_874 * fStack_834 + fVar222 * fStack_754 + auVar395._12_4_ * fStack_774;
          auVar118._16_4_ =
               fStack_870 * fStack_830 + fVar240 * fStack_750 + auVar395._16_4_ * fStack_770;
          auVar118._20_4_ =
               fStack_86c * fStack_82c + fVar202 * fStack_74c + auVar395._20_4_ * fStack_76c;
          auVar118._24_4_ =
               fStack_868 * fStack_828 + fVar223 * fStack_748 + auVar395._24_4_ * fStack_768;
          auVar118._28_4_ = fStack_864 + auVar114._28_4_ + auVar125._28_4_;
          auVar157._8_4_ = 0x7fffffff;
          auVar157._0_8_ = 0x7fffffff7fffffff;
          auVar157._12_4_ = 0x7fffffff;
          auVar157._16_4_ = 0x7fffffff;
          auVar157._20_4_ = 0x7fffffff;
          auVar157._24_4_ = 0x7fffffff;
          auVar157._28_4_ = 0x7fffffff;
          auVar114 = vandps_avx(auVar118,auVar157);
          auVar158._8_4_ = 0x3e99999a;
          auVar158._0_8_ = 0x3e99999a3e99999a;
          auVar158._12_4_ = 0x3e99999a;
          auVar158._16_4_ = 0x3e99999a;
          auVar158._20_4_ = 0x3e99999a;
          auVar158._24_4_ = 0x3e99999a;
          auVar158._28_4_ = 0x3e99999a;
          auVar114 = vcmpps_avx(auVar114,auVar158,1);
          auVar12 = vorps_avx(auVar114,local_6e0);
          auVar159._0_4_ = (float)local_9a0._0_4_ + auVar109._0_4_;
          auVar159._4_4_ = (float)local_9a0._4_4_ + auVar109._4_4_;
          auVar159._8_4_ = fStack_998 + auVar109._8_4_;
          auVar159._12_4_ = fStack_994 + auVar109._12_4_;
          auVar159._16_4_ = fStack_990 + auVar109._16_4_;
          auVar159._20_4_ = fStack_98c + auVar109._20_4_;
          auVar159._24_4_ = fStack_988 + auVar109._24_4_;
          auVar159._28_4_ = fStack_984 + auVar109._28_4_;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar181._4_4_ = uVar1;
          auVar181._0_4_ = uVar1;
          auVar181._8_4_ = uVar1;
          auVar181._12_4_ = uVar1;
          auVar181._16_4_ = uVar1;
          auVar181._20_4_ = uVar1;
          auVar181._24_4_ = uVar1;
          auVar181._28_4_ = uVar1;
          auVar114 = vcmpps_avx(auVar159,auVar181,2);
          _local_860 = vandps_avx(auVar114,auVar262._0_32_);
          auVar160._8_4_ = 3;
          auVar160._0_8_ = 0x300000003;
          auVar160._12_4_ = 3;
          auVar160._16_4_ = 3;
          auVar160._20_4_ = 3;
          auVar160._24_4_ = 3;
          auVar160._28_4_ = 3;
          auVar182._8_4_ = 2;
          auVar182._0_8_ = 0x200000002;
          auVar182._12_4_ = 2;
          auVar182._16_4_ = 2;
          auVar182._20_4_ = 2;
          auVar182._24_4_ = 2;
          auVar182._28_4_ = 2;
          auVar114 = vblendvps_avx(auVar182,auVar160,auVar12);
          auVar138 = vpcmpgtd_avx(auVar114._16_16_,local_8c0);
          auVar102 = vpshufd_avx(local_6c0._0_16_,0);
          auVar102 = vpcmpgtd_avx(auVar114._0_16_,auVar102);
          auVar161._16_16_ = auVar138;
          auVar161._0_16_ = auVar102;
          _local_880 = vblendps_avx(ZEXT1632(auVar102),auVar161,0xf0);
          auVar114 = vandnps_avx(_local_880,_local_860);
          auVar109 = _local_860 & ~_local_880;
          if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar109 >> 0x7f,0) != '\0') ||
                (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar109 >> 0xbf,0) != '\0') ||
              (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar109[0x1f] < '\0') {
            local_7e0 = _local_300;
            local_800._4_4_ = (float)local_9a0._4_4_ + (float)local_300._4_4_;
            local_800._0_4_ = (float)local_9a0._0_4_ + (float)local_300._0_4_;
            fStack_7f8 = fStack_998 + fStack_2f8;
            fStack_7f4 = fStack_994 + fStack_2f4;
            fStack_7f0 = fStack_990 + fStack_2f0;
            fStack_7ec = fStack_98c + fStack_2ec;
            fStack_7e8 = fStack_988 + fStack_2e8;
            fStack_7e4 = fStack_984 + fStack_2e4;
            do {
              auVar213 = auVar221._0_16_;
              auVar162._8_4_ = 0x7f800000;
              auVar162._0_8_ = 0x7f8000007f800000;
              auVar162._12_4_ = 0x7f800000;
              auVar162._16_4_ = 0x7f800000;
              auVar162._20_4_ = 0x7f800000;
              auVar162._24_4_ = 0x7f800000;
              auVar162._28_4_ = 0x7f800000;
              auVar109 = vblendvps_avx(auVar162,local_7e0,auVar114);
              auVar12 = vshufps_avx(auVar109,auVar109,0xb1);
              auVar12 = vminps_avx(auVar109,auVar12);
              auVar147 = vshufpd_avx(auVar12,auVar12,5);
              auVar12 = vminps_avx(auVar12,auVar147);
              auVar147 = vperm2f128_avx(auVar12,auVar12,1);
              auVar12 = vminps_avx(auVar12,auVar147);
              auVar12 = vcmpps_avx(auVar109,auVar12,0);
              auVar147 = auVar114 & auVar12;
              auVar109 = auVar114;
              if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar147 >> 0x7f,0) != '\0') ||
                    (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar147 >> 0xbf,0) != '\0') ||
                  (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar147[0x1f] < '\0') {
                auVar109 = vandps_avx(auVar12,auVar114);
              }
              local_820._0_8_ = uVar90;
              uVar83 = vmovmskps_avx(auVar109);
              uVar88 = 0;
              if (uVar83 != 0) {
                for (; (uVar83 >> uVar88 & 1) == 0; uVar88 = uVar88 + 1) {
                }
              }
              uVar87 = (ulong)uVar88;
              local_720 = auVar114;
              *(undefined4 *)(local_720 + uVar87 * 4) = 0;
              fVar204 = local_660[uVar87];
              uVar88 = *(uint *)(local_2e0 + uVar87 * 4);
              fVar225 = auVar9._0_4_;
              if ((float)local_980._0_4_ < 0.0) {
                fVar225 = sqrtf((float)local_980._0_4_);
                auVar213._8_4_ = 0x7fffffff;
                auVar213._0_8_ = 0x7fffffff7fffffff;
                auVar213._12_4_ = 0x7fffffff;
              }
              auVar344 = ZEXT464(uVar88);
              auVar333 = ZEXT464((uint)fVar204);
              auVar102 = vminps_avx(_local_b10,_local_b30);
              auVar138 = vmaxps_avx(_local_b10,_local_b30);
              auVar97 = vminps_avx(_local_b20,_local_b40);
              auVar104 = vminps_avx(auVar102,auVar97);
              auVar102 = vmaxps_avx(_local_b20,_local_b40);
              auVar97 = vmaxps_avx(auVar138,auVar102);
              auVar138 = vandps_avx(auVar104,auVar213);
              auVar102 = vandps_avx(auVar97,auVar213);
              auVar138 = vmaxps_avx(auVar138,auVar102);
              auVar102 = vmovshdup_avx(auVar138);
              auVar102 = vmaxss_avx(auVar102,auVar138);
              auVar138 = vshufpd_avx(auVar138,auVar138,1);
              auVar138 = vmaxss_avx(auVar138,auVar102);
              local_940 = auVar138._0_4_ * 1.9073486e-06;
              local_7a0._0_4_ = fVar225 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar97,auVar97,0xff);
              lVar91 = 5;
              do {
                fVar240 = auVar333._0_4_;
                fVar222 = 1.0 - fVar240;
                fVar204 = fVar222 * fVar222 * fVar222;
                fVar225 = fVar240 * fVar240 * fVar240;
                fVar201 = fVar240 * fVar222;
                auVar138 = vshufps_avx(ZEXT416((uint)(fVar225 * 0.16666667)),
                                       ZEXT416((uint)(fVar225 * 0.16666667)),0);
                auVar102 = ZEXT416((uint)((fVar225 * 4.0 + fVar204 +
                                          fVar240 * fVar201 * 12.0 + fVar222 * fVar201 * 6.0) *
                                         0.16666667));
                auVar102 = vshufps_avx(auVar102,auVar102,0);
                auVar97 = ZEXT416((uint)((fVar204 * 4.0 + fVar225 +
                                         fVar222 * fVar201 * 12.0 + fVar240 * fVar201 * 6.0) *
                                        0.16666667));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar104 = vshufps_avx(auVar344._0_16_,auVar344._0_16_,0);
                auVar174._0_4_ = auVar104._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar174._4_4_ = auVar104._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar174._8_4_ = auVar104._8_4_ * fStack_968 + 0.0;
                auVar174._12_4_ = auVar104._12_4_ * fStack_964 + 0.0;
                auVar104 = vshufps_avx(ZEXT416((uint)(fVar204 * 0.16666667)),
                                       ZEXT416((uint)(fVar204 * 0.16666667)),0);
                auVar101._0_4_ =
                     auVar104._0_4_ * (float)local_b10._0_4_ +
                     auVar97._0_4_ * (float)local_b30._0_4_ +
                     auVar138._0_4_ * (float)local_b40._0_4_ +
                     auVar102._0_4_ * (float)local_b20._0_4_;
                auVar101._4_4_ =
                     auVar104._4_4_ * (float)local_b10._4_4_ +
                     auVar97._4_4_ * (float)local_b30._4_4_ +
                     auVar138._4_4_ * (float)local_b40._4_4_ +
                     auVar102._4_4_ * (float)local_b20._4_4_;
                auVar101._8_4_ =
                     auVar104._8_4_ * fStack_b08 +
                     auVar97._8_4_ * fStack_b28 +
                     auVar138._8_4_ * fStack_b38 + auVar102._8_4_ * fStack_b18;
                auVar101._12_4_ =
                     auVar104._12_4_ * fStack_b04 +
                     auVar97._12_4_ * fStack_b24 +
                     auVar138._12_4_ * fStack_b34 + auVar102._12_4_ * fStack_b14;
                local_960._0_16_ = auVar101;
                auVar138 = vsubps_avx(auVar174,auVar101);
                _local_ae0 = auVar138;
                auVar138 = vdpps_avx(auVar138,auVar138,0x7f);
                fVar204 = auVar138._0_4_;
                if (fVar204 < 0.0) {
                  auVar262._0_4_ = sqrtf(fVar204);
                  auVar262._4_60_ = extraout_var;
                  auVar102 = auVar262._0_16_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar138,auVar138);
                }
                auVar340 = ZEXT1664(auVar102);
                auVar97 = ZEXT416((uint)(fVar240 * fVar240 * 0.5));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar104 = ZEXT416((uint)((fVar222 * fVar222 + fVar201 * 4.0) * 0.5));
                auVar104 = vshufps_avx(auVar104,auVar104,0);
                auVar96 = ZEXT416((uint)((fVar240 * -fVar240 - fVar201 * 4.0) * 0.5));
                auVar96 = vshufps_avx(auVar96,auVar96,0);
                auVar103 = ZEXT416((uint)(fVar222 * -fVar222 * 0.5));
                auVar103 = vshufps_avx(auVar103,auVar103,0);
                auVar311._0_4_ =
                     (float)local_b10._0_4_ * auVar103._0_4_ +
                     (float)local_b30._0_4_ * auVar96._0_4_ +
                     (float)local_b40._0_4_ * auVar97._0_4_ +
                     (float)local_b20._0_4_ * auVar104._0_4_;
                auVar311._4_4_ =
                     (float)local_b10._4_4_ * auVar103._4_4_ +
                     (float)local_b30._4_4_ * auVar96._4_4_ +
                     (float)local_b40._4_4_ * auVar97._4_4_ +
                     (float)local_b20._4_4_ * auVar104._4_4_;
                auVar311._8_4_ =
                     fStack_b08 * auVar103._8_4_ +
                     fStack_b28 * auVar96._8_4_ +
                     fStack_b38 * auVar97._8_4_ + fStack_b18 * auVar104._8_4_;
                auVar311._12_4_ =
                     fStack_b04 * auVar103._12_4_ +
                     fStack_b24 * auVar96._12_4_ +
                     fStack_b34 * auVar97._12_4_ + fStack_b14 * auVar104._12_4_;
                auVar97 = vshufps_avx(auVar333._0_16_,auVar333._0_16_,0);
                auVar104 = ZEXT416((uint)(fVar222 - (fVar240 + fVar240)));
                auVar96 = vshufps_avx(auVar104,auVar104,0);
                auVar104 = ZEXT416((uint)(fVar240 - (fVar222 + fVar222)));
                auVar103 = vshufps_avx(auVar104,auVar104,0);
                auVar134 = vshufps_avx(ZEXT416((uint)fVar222),ZEXT416((uint)fVar222),0);
                auVar104 = vdpps_avx(auVar311,auVar311,0x7f);
                auVar141._0_4_ =
                     (float)local_b10._0_4_ * auVar134._0_4_ +
                     (float)local_b30._0_4_ * auVar103._0_4_ +
                     (float)local_b40._0_4_ * auVar97._0_4_ + (float)local_b20._0_4_ * auVar96._0_4_
                ;
                auVar141._4_4_ =
                     (float)local_b10._4_4_ * auVar134._4_4_ +
                     (float)local_b30._4_4_ * auVar103._4_4_ +
                     (float)local_b40._4_4_ * auVar97._4_4_ + (float)local_b20._4_4_ * auVar96._4_4_
                ;
                auVar141._8_4_ =
                     fStack_b08 * auVar134._8_4_ +
                     fStack_b28 * auVar103._8_4_ +
                     fStack_b38 * auVar97._8_4_ + fStack_b18 * auVar96._8_4_;
                auVar141._12_4_ =
                     fStack_b04 * auVar134._12_4_ +
                     fStack_b24 * auVar103._12_4_ +
                     fStack_b34 * auVar97._12_4_ + fStack_b14 * auVar96._12_4_;
                auVar97 = vblendps_avx(auVar104,_DAT_01feba10,0xe);
                auVar96 = vrsqrtss_avx(auVar97,auVar97);
                fVar201 = auVar96._0_4_;
                fVar225 = auVar104._0_4_;
                auVar96 = vdpps_avx(auVar311,auVar141,0x7f);
                auVar103 = vshufps_avx(auVar104,auVar104,0);
                auVar142._0_4_ = auVar141._0_4_ * auVar103._0_4_;
                auVar142._4_4_ = auVar141._4_4_ * auVar103._4_4_;
                auVar142._8_4_ = auVar141._8_4_ * auVar103._8_4_;
                auVar142._12_4_ = auVar141._12_4_ * auVar103._12_4_;
                auVar96 = vshufps_avx(auVar96,auVar96,0);
                auVar214._0_4_ = auVar311._0_4_ * auVar96._0_4_;
                auVar214._4_4_ = auVar311._4_4_ * auVar96._4_4_;
                auVar214._8_4_ = auVar311._8_4_ * auVar96._8_4_;
                auVar214._12_4_ = auVar311._12_4_ * auVar96._12_4_;
                auVar134 = vsubps_avx(auVar142,auVar214);
                auVar96 = vrcpss_avx(auVar97,auVar97);
                auVar97 = vmaxss_avx(ZEXT416((uint)local_940),
                                     ZEXT416((uint)(auVar344._0_4_ * (float)local_7a0._0_4_)));
                auVar357 = ZEXT1664(auVar97);
                auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar225 * auVar96._0_4_)));
                auVar96 = vshufps_avx(auVar96,auVar96,0);
                uVar87 = CONCAT44(auVar311._4_4_,auVar311._0_4_);
                auVar231._0_8_ = uVar87 ^ 0x8000000080000000;
                auVar231._8_4_ = -auVar311._8_4_;
                auVar231._12_4_ = -auVar311._12_4_;
                auVar103 = ZEXT416((uint)(fVar201 * 1.5 +
                                         fVar225 * -0.5 * fVar201 * fVar201 * fVar201));
                auVar103 = vshufps_avx(auVar103,auVar103,0);
                auVar194._0_4_ = auVar103._0_4_ * auVar134._0_4_ * auVar96._0_4_;
                auVar194._4_4_ = auVar103._4_4_ * auVar134._4_4_ * auVar96._4_4_;
                auVar194._8_4_ = auVar103._8_4_ * auVar134._8_4_ * auVar96._8_4_;
                auVar194._12_4_ = auVar103._12_4_ * auVar134._12_4_ * auVar96._12_4_;
                auVar256._0_4_ = auVar311._0_4_ * auVar103._0_4_;
                auVar256._4_4_ = auVar311._4_4_ * auVar103._4_4_;
                auVar256._8_4_ = auVar311._8_4_ * auVar103._8_4_;
                auVar256._12_4_ = auVar311._12_4_ * auVar103._12_4_;
                if (fVar225 < 0.0) {
                  local_a80._0_16_ = auVar256;
                  local_aa0._0_16_ = auVar194;
                  fVar225 = sqrtf(fVar225);
                  auVar340 = ZEXT464(auVar102._0_4_);
                  auVar357 = ZEXT464(auVar97._0_4_);
                  auVar194 = local_aa0._0_16_;
                  auVar256 = local_a80._0_16_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar104,auVar104);
                  fVar225 = auVar102._0_4_;
                }
                auVar102 = vdpps_avx(_local_ae0,auVar256,0x7f);
                fVar225 = (local_940 / fVar225) * (auVar340._0_4_ + 1.0) +
                          auVar357._0_4_ + auVar340._0_4_ * local_940;
                auVar104 = vdpps_avx(auVar231,auVar256,0x7f);
                auVar96 = vdpps_avx(_local_ae0,auVar194,0x7f);
                auVar103 = vdpps_avx(_local_970,auVar256,0x7f);
                auVar134 = vdpps_avx(_local_ae0,auVar231,0x7f);
                fVar201 = auVar104._0_4_ + auVar96._0_4_;
                fVar222 = auVar102._0_4_;
                auVar105._0_4_ = fVar222 * fVar222;
                auVar105._4_4_ = auVar102._4_4_ * auVar102._4_4_;
                auVar105._8_4_ = auVar102._8_4_ * auVar102._8_4_;
                auVar105._12_4_ = auVar102._12_4_ * auVar102._12_4_;
                auVar96 = vsubps_avx(auVar138,auVar105);
                auVar104 = vdpps_avx(_local_ae0,_local_970,0x7f);
                fVar202 = auVar134._0_4_ - fVar222 * fVar201;
                fVar223 = auVar104._0_4_ - fVar222 * auVar103._0_4_;
                auVar104 = vrsqrtss_avx(auVar96,auVar96);
                fVar242 = auVar96._0_4_;
                fVar222 = auVar104._0_4_;
                fVar222 = fVar222 * 1.5 + fVar242 * -0.5 * fVar222 * fVar222 * fVar222;
                if (fVar242 < 0.0) {
                  local_a80._0_4_ = fVar225;
                  local_aa0._0_16_ = auVar103;
                  local_9c0._0_4_ = fVar202;
                  local_ac0._0_4_ = fVar223;
                  local_9e0._0_4_ = fVar222;
                  auVar340 = ZEXT1664(auVar340._0_16_);
                  fVar242 = sqrtf(fVar242);
                  auVar357 = ZEXT464(auVar97._0_4_);
                  fVar222 = (float)local_9e0._0_4_;
                  fVar202 = (float)local_9c0._0_4_;
                  fVar223 = (float)local_ac0._0_4_;
                  auVar103 = local_aa0._0_16_;
                  fVar225 = (float)local_a80._0_4_;
                }
                else {
                  auVar97 = vsqrtss_avx(auVar96,auVar96);
                  fVar242 = auVar97._0_4_;
                }
                auVar292 = ZEXT1664(auVar138);
                auVar96 = vpermilps_avx(local_960._0_16_,0xff);
                auVar134 = vshufps_avx(auVar311,auVar311,0xff);
                fVar203 = fVar202 * fVar222 - auVar134._0_4_;
                auVar215._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
                auVar215._8_4_ = auVar103._8_4_ ^ 0x80000000;
                auVar215._12_4_ = auVar103._12_4_ ^ 0x80000000;
                auVar232._0_4_ = -fVar203;
                auVar232._4_4_ = 0x80000000;
                auVar232._8_4_ = 0x80000000;
                auVar232._12_4_ = 0x80000000;
                fVar202 = fVar201 * fVar223 * fVar222;
                auVar262 = ZEXT464((uint)fVar202);
                auVar97 = vinsertps_avx(ZEXT416((uint)(fVar223 * fVar222)),auVar215,0x10);
                auVar104 = vmovsldup_avx(ZEXT416((uint)(fVar202 - auVar103._0_4_ * fVar203)));
                auVar97 = vdivps_avx(auVar97,auVar104);
                auVar103 = ZEXT416((uint)(fVar242 - auVar96._0_4_));
                auVar96 = vinsertps_avx(auVar102,auVar103,0x10);
                auVar195._0_4_ = auVar96._0_4_ * auVar97._0_4_;
                auVar195._4_4_ = auVar96._4_4_ * auVar97._4_4_;
                auVar195._8_4_ = auVar96._8_4_ * auVar97._8_4_;
                auVar195._12_4_ = auVar96._12_4_ * auVar97._12_4_;
                auVar97 = vinsertps_avx(auVar232,ZEXT416((uint)fVar201),0x1c);
                auVar97 = vdivps_avx(auVar97,auVar104);
                auVar104 = vhaddps_avx(auVar195,auVar195);
                auVar175._0_4_ = auVar96._0_4_ * auVar97._0_4_;
                auVar175._4_4_ = auVar96._4_4_ * auVar97._4_4_;
                auVar175._8_4_ = auVar96._8_4_ * auVar97._8_4_;
                auVar175._12_4_ = auVar96._12_4_ * auVar97._12_4_;
                auVar97 = vhaddps_avx(auVar175,auVar175);
                fVar240 = fVar240 - auVar104._0_4_;
                fVar201 = auVar344._0_4_ - auVar97._0_4_;
                auVar344 = ZEXT464((uint)fVar201);
                auVar216._8_4_ = 0x7fffffff;
                auVar216._0_8_ = 0x7fffffff7fffffff;
                auVar216._12_4_ = 0x7fffffff;
                auVar221 = ZEXT1664(auVar216);
                auVar102 = vandps_avx(auVar102,auVar216);
                bVar60 = true;
                if (auVar102._0_4_ < fVar225) {
                  auVar102 = vandps_avx(auVar103,auVar216);
                  if (auVar102._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 + auVar357._0_4_ + fVar225) {
                    fVar201 = fVar201 + (float)local_900._0_4_;
                    auVar344 = ZEXT464((uint)fVar201);
                    if ((((fVar189 <= fVar201) &&
                         (fVar225 = *(float *)(ray + k * 4 + 0x100), fVar201 <= fVar225)) &&
                        (0.0 <= fVar240)) && (fVar240 <= 1.0)) {
                      auVar102 = vrsqrtss_avx(auVar138,auVar138);
                      fVar222 = auVar102._0_4_;
                      pGVar5 = (context->scene->geometries).items[uVar86].ptr;
                      if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_BL = true;
                        }
                        else {
                          auVar102 = ZEXT416((uint)(fVar222 * 1.5 +
                                                   fVar204 * -0.5 * fVar222 * fVar222 * fVar222));
                          auVar102 = vshufps_avx(auVar102,auVar102,0);
                          auVar143._0_4_ = auVar102._0_4_ * (float)local_ae0._0_4_;
                          auVar143._4_4_ = auVar102._4_4_ * (float)local_ae0._4_4_;
                          auVar143._8_4_ = auVar102._8_4_ * fStack_ad8;
                          auVar143._12_4_ = auVar102._12_4_ * fStack_ad4;
                          auVar106._0_4_ = auVar311._0_4_ + auVar134._0_4_ * auVar143._0_4_;
                          auVar106._4_4_ = auVar311._4_4_ + auVar134._4_4_ * auVar143._4_4_;
                          auVar106._8_4_ = auVar311._8_4_ + auVar134._8_4_ * auVar143._8_4_;
                          auVar106._12_4_ = auVar311._12_4_ + auVar134._12_4_ * auVar143._12_4_;
                          auVar102 = vshufps_avx(auVar143,auVar143,0xc9);
                          auVar97 = vshufps_avx(auVar311,auVar311,0xc9);
                          auVar144._0_4_ = auVar97._0_4_ * auVar143._0_4_;
                          auVar144._4_4_ = auVar97._4_4_ * auVar143._4_4_;
                          auVar144._8_4_ = auVar97._8_4_ * auVar143._8_4_;
                          auVar144._12_4_ = auVar97._12_4_ * auVar143._12_4_;
                          auVar176._0_4_ = auVar311._0_4_ * auVar102._0_4_;
                          auVar176._4_4_ = auVar311._4_4_ * auVar102._4_4_;
                          auVar176._8_4_ = auVar311._8_4_ * auVar102._8_4_;
                          auVar176._12_4_ = auVar311._12_4_ * auVar102._12_4_;
                          auVar104 = vsubps_avx(auVar176,auVar144);
                          auVar102 = vshufps_avx(auVar104,auVar104,0xc9);
                          auVar97 = vshufps_avx(auVar106,auVar106,0xc9);
                          auVar177._0_4_ = auVar97._0_4_ * auVar102._0_4_;
                          auVar177._4_4_ = auVar97._4_4_ * auVar102._4_4_;
                          auVar177._8_4_ = auVar97._8_4_ * auVar102._8_4_;
                          auVar177._12_4_ = auVar97._12_4_ * auVar102._12_4_;
                          auVar102 = vshufps_avx(auVar104,auVar104,0xd2);
                          auVar107._0_4_ = auVar106._0_4_ * auVar102._0_4_;
                          auVar107._4_4_ = auVar106._4_4_ * auVar102._4_4_;
                          auVar107._8_4_ = auVar106._8_4_ * auVar102._8_4_;
                          auVar107._12_4_ = auVar106._12_4_ * auVar102._12_4_;
                          auVar102 = vsubps_avx(auVar177,auVar107);
                          pRVar6 = context->user;
                          local_590 = vshufps_avx(ZEXT416((uint)fVar240),ZEXT416((uint)fVar240),0);
                          auStack_5f0 = vshufps_avx(auVar102,auVar102,0x55);
                          local_5d0 = vshufps_avx(auVar102,auVar102,0xaa);
                          local_5b0 = vshufps_avx(auVar102,auVar102,0);
                          local_600 = (RTCHitN  [16])auStack_5f0;
                          local_5e0 = local_5d0;
                          local_5c0 = local_5b0;
                          local_5a0 = local_590;
                          local_580 = ZEXT832(0) << 0x20;
                          local_560 = local_4e0._0_8_;
                          uStack_558 = local_4e0._8_8_;
                          uStack_550 = local_4e0._16_8_;
                          uStack_548 = local_4e0._24_8_;
                          local_540 = local_4c0._0_8_;
                          uStack_538 = local_4c0._8_8_;
                          uStack_530 = local_4c0._16_8_;
                          uStack_528 = local_4c0._24_8_;
                          local_a38[1] = local_a00;
                          *local_a38 = local_a00;
                          local_520 = pRVar6->instID[0];
                          uStack_51c = local_520;
                          uStack_518 = local_520;
                          uStack_514 = local_520;
                          uStack_510 = local_520;
                          uStack_50c = local_520;
                          uStack_508 = local_520;
                          uStack_504 = local_520;
                          local_500 = pRVar6->instPrimID[0];
                          uStack_4fc = local_500;
                          uStack_4f8 = local_500;
                          uStack_4f4 = local_500;
                          uStack_4f0 = local_500;
                          uStack_4ec = local_500;
                          uStack_4e8 = local_500;
                          uStack_4e4 = local_500;
                          *(float *)(ray + k * 4 + 0x100) = fVar201;
                          local_b60 = *local_a40;
                          uStack_b58 = local_a40[1];
                          local_b50 = *local_a48;
                          uStack_b48 = local_a48[1];
                          local_a30.valid = (int *)&local_b60;
                          local_a30.geometryUserPtr = pGVar5->userPtr;
                          local_a30.context = context->user;
                          local_a30.hit = local_600;
                          local_a30.N = 8;
                          local_a30.ray = (RTCRayN *)ray;
                          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar262 = ZEXT464((uint)fVar202);
                            auVar292 = ZEXT1664(auVar138);
                            auVar340 = ZEXT1664(auVar340._0_16_);
                            auVar357 = ZEXT1664(auVar357._0_16_);
                            (*pGVar5->occlusionFilterN)(&local_a30);
                            auVar221 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar74._8_8_ = uStack_b58;
                          auVar74._0_8_ = local_b60;
                          auVar138 = vpcmpeqd_avx((undefined1  [16])0x0,auVar74);
                          auVar78._8_8_ = uStack_b48;
                          auVar78._0_8_ = local_b50;
                          auVar102 = vpcmpeqd_avx((undefined1  [16])0x0,auVar78);
                          auVar119._16_16_ = auVar102;
                          auVar119._0_16_ = auVar138;
                          auVar114 = local_a00 & ~auVar119;
                          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar114 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar114 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar114 >> 0x7f,0) == '\0') &&
                                (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar114 >> 0xbf,0) == '\0') &&
                              (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar114[0x1f]) {
                            auVar120._0_4_ = auVar138._0_4_ ^ local_a00._0_4_;
                            auVar120._4_4_ = auVar138._4_4_ ^ local_a00._4_4_;
                            auVar120._8_4_ = auVar138._8_4_ ^ local_a00._8_4_;
                            auVar120._12_4_ = auVar138._12_4_ ^ local_a00._12_4_;
                            auVar120._16_4_ = auVar102._0_4_ ^ local_a00._16_4_;
                            auVar120._20_4_ = auVar102._4_4_ ^ local_a00._20_4_;
                            auVar120._24_4_ = auVar102._8_4_ ^ local_a00._24_4_;
                            auVar120._28_4_ = auVar102._12_4_ ^ local_a00._28_4_;
                          }
                          else {
                            p_Var7 = context->args->filter;
                            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar262 = ZEXT1664(auVar262._0_16_);
                              auVar292 = ZEXT1664(auVar292._0_16_);
                              auVar340 = ZEXT1664(auVar340._0_16_);
                              auVar357 = ZEXT1664(auVar357._0_16_);
                              (*p_Var7)(&local_a30);
                              auVar221 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                            }
                            auVar75._8_8_ = uStack_b58;
                            auVar75._0_8_ = local_b60;
                            auVar138 = vpcmpeqd_avx((undefined1  [16])0x0,auVar75);
                            auVar79._8_8_ = uStack_b48;
                            auVar79._0_8_ = local_b50;
                            auVar102 = vpcmpeqd_avx((undefined1  [16])0x0,auVar79);
                            auVar163._16_16_ = auVar102;
                            auVar163._0_16_ = auVar138;
                            auVar120._0_4_ = auVar138._0_4_ ^ local_a00._0_4_;
                            auVar120._4_4_ = auVar138._4_4_ ^ local_a00._4_4_;
                            auVar120._8_4_ = auVar138._8_4_ ^ local_a00._8_4_;
                            auVar120._12_4_ = auVar138._12_4_ ^ local_a00._12_4_;
                            auVar120._16_4_ = auVar102._0_4_ ^ local_a00._16_4_;
                            auVar120._20_4_ = auVar102._4_4_ ^ local_a00._20_4_;
                            auVar120._24_4_ = auVar102._8_4_ ^ local_a00._24_4_;
                            auVar120._28_4_ = auVar102._12_4_ ^ local_a00._28_4_;
                            auVar183._8_4_ = 0xff800000;
                            auVar183._0_8_ = 0xff800000ff800000;
                            auVar183._12_4_ = 0xff800000;
                            auVar183._16_4_ = 0xff800000;
                            auVar183._20_4_ = 0xff800000;
                            auVar183._24_4_ = 0xff800000;
                            auVar183._28_4_ = 0xff800000;
                            auVar114 = vblendvps_avx(auVar183,*(undefined1 (*) [32])
                                                               (local_a30.ray + 0x100),auVar163);
                            *(undefined1 (*) [32])(local_a30.ray + 0x100) = auVar114;
                          }
                          bVar67 = (auVar120 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar68 = (auVar120 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar66 = (auVar120 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar65 = SUB321(auVar120 >> 0x7f,0) != '\0';
                          bVar64 = (auVar120 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar63 = SUB321(auVar120 >> 0xbf,0) != '\0';
                          bVar61 = (auVar120 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar60 = auVar120[0x1f] < '\0';
                          unaff_BL = ((((((bVar67 || bVar68) || bVar66) || bVar65) || bVar64) ||
                                      bVar63) || bVar61) || bVar60;
                          if (((((((!bVar67 && !bVar68) && !bVar66) && !bVar65) && !bVar64) &&
                               !bVar63) && !bVar61) && !bVar60) {
                            *(float *)(ray + k * 4 + 0x100) = fVar225;
                          }
                        }
                        auVar344 = ZEXT464((uint)fVar201);
                        bVar60 = false;
                        goto LAB_00efa920;
                      }
                    }
                    bVar60 = false;
                    unaff_BL = 0;
                  }
                }
LAB_00efa920:
                auVar333 = ZEXT464((uint)fVar240);
                if (!bVar60) goto LAB_00efac93;
                lVar91 = lVar91 + -1;
              } while (lVar91 != 0);
              unaff_BL = 0;
LAB_00efac93:
              unaff_BL = unaff_BL & 1;
              uVar90 = CONCAT71(local_820._1_7_,local_820[0] | unaff_BL);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar121._4_4_ = uVar1;
              auVar121._0_4_ = uVar1;
              auVar121._8_4_ = uVar1;
              auVar121._12_4_ = uVar1;
              auVar121._16_4_ = uVar1;
              auVar121._20_4_ = uVar1;
              auVar121._24_4_ = uVar1;
              auVar121._28_4_ = uVar1;
              auVar109 = vcmpps_avx(_local_800,auVar121,2);
              auVar114 = vandps_avx(auVar109,local_720);
              local_720 = local_720 & auVar109;
              uVar87 = local_740;
            } while ((((((((local_720 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_720 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_720 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_720 >> 0x7f,0) != '\0') ||
                       (local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_720 >> 0xbf,0) != '\0') ||
                     (local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_720[0x1f] < '\0');
          }
          auVar114 = vandps_avx(local_6a0,local_680);
          auVar109 = vandps_avx(_local_880,_local_860);
          auVar184._0_4_ = (float)local_9a0._0_4_ + local_340._0_4_;
          auVar184._4_4_ = (float)local_9a0._4_4_ + local_340._4_4_;
          auVar184._8_4_ = fStack_998 + local_340._8_4_;
          auVar184._12_4_ = fStack_994 + local_340._12_4_;
          auVar184._16_4_ = fStack_990 + local_340._16_4_;
          auVar184._20_4_ = fStack_98c + local_340._20_4_;
          auVar184._24_4_ = fStack_988 + local_340._24_4_;
          auVar184._28_4_ = fStack_984 + local_340._28_4_;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar220._4_4_ = uVar1;
          auVar220._0_4_ = uVar1;
          auVar220._8_4_ = uVar1;
          auVar220._12_4_ = uVar1;
          auVar220._16_4_ = uVar1;
          auVar220._20_4_ = uVar1;
          auVar220._24_4_ = uVar1;
          auVar220._28_4_ = uVar1;
          auVar12 = vcmpps_avx(auVar184,auVar220,2);
          auVar114 = vandps_avx(auVar12,auVar114);
          auVar238._0_4_ = (float)local_9a0._0_4_ + local_300._0_4_;
          auVar238._4_4_ = (float)local_9a0._4_4_ + local_300._4_4_;
          auVar238._8_4_ = fStack_998 + local_300._8_4_;
          auVar238._12_4_ = fStack_994 + local_300._12_4_;
          auVar238._16_4_ = fStack_990 + local_300._16_4_;
          auVar238._20_4_ = fStack_98c + local_300._20_4_;
          auVar238._24_4_ = fStack_988 + local_300._24_4_;
          auVar238._28_4_ = fStack_984 + local_300._28_4_;
          auVar12 = vcmpps_avx(auVar238,auVar220,2);
          auVar109 = vandps_avx(auVar12,auVar109);
          auVar109 = vorps_avx(auVar114,auVar109);
          if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar109 >> 0x7f,0) != '\0') ||
                (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar109 >> 0xbf,0) != '\0') ||
              (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar109[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar84 * 0x60) = auVar109;
            auVar114 = vblendvps_avx(_local_300,_local_340,auVar114);
            *(undefined1 (*) [32])(auStack_160 + uVar84 * 0x60) = auVar114;
            uVar2 = vmovlps_avx(local_8f0);
            *(undefined8 *)(afStack_140 + uVar84 * 0x18) = uVar2;
            auStack_138[uVar84 * 0x18] = (int)uVar87 + 1;
            uVar84 = (ulong)((int)uVar84 + 1);
          }
        }
      }
    }
    do {
      uVar88 = (uint)uVar84;
      if (uVar88 == 0) {
        if ((uVar90 & 1) != 0) {
          return local_c89;
        }
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar108._4_4_ = uVar1;
        auVar108._0_4_ = uVar1;
        auVar108._8_4_ = uVar1;
        auVar108._12_4_ = uVar1;
        auVar135 = vcmpps_avx(local_610,auVar108,2);
        uVar86 = vmovmskps_avx(auVar135);
        uVar86 = (uint)local_8c8 & uVar86;
        local_c89 = uVar86 != 0;
        if (!local_c89) {
          return local_c89;
        }
        goto LAB_00ef8318;
      }
      uVar84 = (ulong)(uVar88 - 1);
      lVar91 = uVar84 * 0x60;
      auVar114 = *(undefined1 (*) [32])(auStack_160 + lVar91);
      auVar122._0_4_ = (float)local_9a0._0_4_ + auVar114._0_4_;
      auVar122._4_4_ = (float)local_9a0._4_4_ + auVar114._4_4_;
      auVar122._8_4_ = fStack_998 + auVar114._8_4_;
      auVar122._12_4_ = fStack_994 + auVar114._12_4_;
      auVar122._16_4_ = fStack_990 + auVar114._16_4_;
      auVar122._20_4_ = fStack_98c + auVar114._20_4_;
      auVar122._24_4_ = fStack_988 + auVar114._24_4_;
      auVar122._28_4_ = fStack_984 + auVar114._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar200._4_4_ = uVar1;
      auVar200._0_4_ = uVar1;
      auVar200._8_4_ = uVar1;
      auVar200._12_4_ = uVar1;
      auVar200._16_4_ = uVar1;
      auVar200._20_4_ = uVar1;
      auVar200._24_4_ = uVar1;
      auVar200._28_4_ = uVar1;
      auVar12 = vcmpps_avx(auVar122,auVar200,2);
      auVar109 = vandps_avx(auVar12,*(undefined1 (*) [32])(auStack_180 + lVar91));
      _local_600 = auVar109;
      auVar12 = *(undefined1 (*) [32])(auStack_180 + lVar91) & auVar12;
      bVar67 = (auVar12 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar68 = (auVar12 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar66 = (auVar12 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar65 = SUB321(auVar12 >> 0x7f,0) == '\0';
      bVar64 = (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar63 = SUB321(auVar12 >> 0xbf,0) == '\0';
      bVar61 = (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar60 = -1 < auVar12[0x1f];
      if (((((((!bVar67 || !bVar68) || !bVar66) || !bVar65) || !bVar64) || !bVar63) || !bVar61) ||
          !bVar60) {
        auVar185._8_4_ = 0x7f800000;
        auVar185._0_8_ = 0x7f8000007f800000;
        auVar185._12_4_ = 0x7f800000;
        auVar185._16_4_ = 0x7f800000;
        auVar185._20_4_ = 0x7f800000;
        auVar185._24_4_ = 0x7f800000;
        auVar185._28_4_ = 0x7f800000;
        auVar114 = vblendvps_avx(auVar185,auVar114,auVar109);
        auVar12 = vshufps_avx(auVar114,auVar114,0xb1);
        auVar12 = vminps_avx(auVar114,auVar12);
        auVar147 = vshufpd_avx(auVar12,auVar12,5);
        auVar12 = vminps_avx(auVar12,auVar147);
        auVar147 = vperm2f128_avx(auVar12,auVar12,1);
        auVar12 = vminps_avx(auVar12,auVar147);
        auVar114 = vcmpps_avx(auVar114,auVar12,0);
        auVar12 = auVar109 & auVar114;
        if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0x7f,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0xbf,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar12[0x1f] < '\0') {
          auVar109 = vandps_avx(auVar114,auVar109);
        }
        fVar204 = afStack_140[uVar84 * 0x18 + 1];
        uVar87 = (ulong)auStack_138[uVar84 * 0x18];
        uVar89 = vmovmskps_avx(auVar109);
        uVar83 = 0;
        if (uVar89 != 0) {
          for (; (uVar89 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
          }
        }
        fVar225 = afStack_140[uVar84 * 0x18];
        *(undefined4 *)(local_600 + (ulong)uVar83 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar91) = _local_600;
        uVar89 = uVar88 - 1;
        if ((((((((_local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_600 >> 0x7f,0) != '\0') ||
              (_local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_600 >> 0xbf,0) != '\0') ||
            (_local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_600[0x1f] < '\0') {
          uVar89 = uVar88;
        }
        auVar138 = vshufps_avx(ZEXT416((uint)(fVar204 - fVar225)),ZEXT416((uint)(fVar204 - fVar225))
                               ,0);
        local_340._4_4_ = fVar225 + auVar138._4_4_ * 0.14285715;
        local_340._0_4_ = fVar225 + auVar138._0_4_ * 0.0;
        fStack_338 = fVar225 + auVar138._8_4_ * 0.2857143;
        fStack_334 = fVar225 + auVar138._12_4_ * 0.42857146;
        fStack_330 = fVar225 + auVar138._0_4_ * 0.5714286;
        fStack_32c = fVar225 + auVar138._4_4_ * 0.71428573;
        fStack_328 = fVar225 + auVar138._8_4_ * 0.8571429;
        fStack_324 = fVar225 + auVar138._12_4_;
        local_8f0._8_8_ = 0;
        local_8f0._0_8_ = *(ulong *)(local_340 + (ulong)uVar83 * 4);
        uVar84 = (ulong)uVar89;
      }
    } while (((((((bVar67 && bVar68) && bVar66) && bVar65) && bVar64) && bVar63) && bVar61) &&
             bVar60);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }